

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::UnaryOp_x86_fma::forward_inplace(UnaryOp_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  int iVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  float *pfVar21;
  long lVar22;
  undefined1 (*pauVar23) [32];
  uint uVar24;
  ulong uVar25;
  int iVar26;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar27;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar40 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar46 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar49 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar51 [32];
  undefined1 auVar53 [32];
  __m256 afVar54;
  undefined1 auVar113 [56];
  undefined1 auVar77 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar55 [32];
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar58 [32];
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd_01;
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd_02;
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dd_03;
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd_04;
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar67 [32];
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dd_05;
  undefined1 extraout_var_17 [60];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dd_06;
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar70 [32];
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dd_07;
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Dc_08;
  undefined4 extraout_XMM0_Dd_08;
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar73 [32];
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Dc_09;
  undefined4 extraout_XMM0_Dd_09;
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Dc_10;
  undefined4 extraout_XMM0_Dd_10;
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar114 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar153 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar156 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  float fVar177;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  float fVar206;
  undefined1 auVar194 [32];
  undefined1 auVar180 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  float fVar203;
  float fVar205;
  float fVar207;
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  float fVar202;
  float fVar204;
  float fVar208;
  float fVar209;
  float fVar210;
  undefined1 in_ZMM3 [64];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [32];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [32];
  undefined1 auVar272 [32];
  undefined1 in_ZMM5 [64];
  undefined1 auVar273 [64];
  undefined1 auVar258 [16];
  undefined1 auVar274 [64];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar264 [16];
  undefined1 auVar275 [64];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar302 [64];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 in_ZMM8 [64];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  undefined1 auVar389 [16];
  undefined1 auVar400 [32];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar401 [32];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar402 [32];
  undefined1 auVar397 [16];
  undefined1 auVar403 [32];
  undefined1 auVar404 [32];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar405 [32];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [32];
  undefined1 auVar423 [32];
  undefined1 auVar424 [32];
  undefined1 auVar425 [32];
  undefined1 auVar426 [32];
  undefined1 in_ZMM11 [64];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [32];
  undefined1 auVar436 [32];
  undefined1 auVar437 [32];
  undefined1 auVar438 [32];
  undefined1 auVar439 [32];
  undefined1 auVar440 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [32];
  undefined1 auVar451 [32];
  undefined1 auVar452 [32];
  undefined1 auVar441 [16];
  undefined1 auVar453 [32];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar454 [32];
  undefined1 auVar455 [32];
  undefined1 auVar456 [32];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [32];
  undefined1 auVar462 [16];
  undefined1 auVar467 [32];
  undefined1 auVar468 [32];
  undefined1 in_ZMM14 [64];
  undefined1 auVar469 [64];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [32];
  undefined1 auVar484 [32];
  undefined1 auVar485 [32];
  undefined1 auVar486 [32];
  undefined1 auVar487 [32];
  __m128 afVar488;
  unary_op_tan op;
  unary_op_tan local_161;
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  long local_138;
  undefined8 local_130;
  Mat *local_128;
  undefined1 local_120 [32];
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  undefined1 local_d0 [16];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  long local_60;
  undefined1 auVar50 [32];
  undefined1 auVar52 [32];
  undefined1 auVar61 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  undefined1 extraout_var_05 [60];
  undefined1 extraout_var_06 [60];
  undefined1 extraout_var_07 [60];
  undefined1 extraout_var_08 [60];
  undefined1 extraout_var_09 [60];
  undefined1 extraout_var_10 [60];
  undefined1 extraout_var_11 [60];
  undefined1 extraout_var_12 [60];
  undefined1 extraout_var_13 [60];
  undefined1 extraout_var_14 [60];
  undefined1 extraout_var_15 [60];
  undefined1 extraout_var_16 [60];
  undefined1 extraout_var_18 [60];
  undefined1 extraout_var_19 [60];
  undefined1 extraout_var_20 [60];
  undefined1 extraout_var_21 [60];
  undefined1 extraout_var_22 [60];
  undefined1 extraout_var_23 [60];
  undefined1 extraout_var_24 [60];
  undefined1 extraout_var_25 [60];
  undefined1 extraout_var_26 [60];
  undefined1 extraout_var_27 [60];
  undefined1 extraout_var_28 [60];
  undefined1 extraout_var_29 [60];
  undefined1 extraout_var_30 [60];
  undefined1 extraout_var_31 [60];
  undefined1 extraout_var_32 [60];
  undefined1 extraout_var_33 [60];
  undefined1 extraout_var_34 [60];
  
  auVar51 = _DAT_005550e0;
  auVar140 = _DAT_005550c0;
  auVar29 = in_ZMM3._0_16_;
  auVar153 = in_ZMM5._0_16_;
  local_128 = bottom_top_blob;
  switch(*(undefined4 *)(&this->field_0xd0 + (long)this->_vptr_UnaryOp_x86_fma[-3])) {
  case 0:
    iVar26 = bottom_top_blob->c;
    if (0 < (long)iVar26) {
      uVar24 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar22 = 0;
      auVar49._8_4_ = 0x7fffffff;
      auVar49._0_8_ = 0x7fffffff7fffffff;
      auVar49._12_4_ = 0x7fffffff;
      auVar49._16_4_ = 0x7fffffff;
      auVar49._20_4_ = 0x7fffffff;
      auVar49._24_4_ = 0x7fffffff;
      auVar49._28_4_ = 0x7fffffff;
      auVar114._8_4_ = 0x7fffffff;
      auVar114._0_8_ = 0x7fffffff7fffffff;
      auVar114._12_4_ = 0x7fffffff;
      auVar211._8_8_ = 0x8000000000000000;
      auVar211._0_8_ = 0x8000000000000000;
      auVar29 = vpcmpeqd_avx(auVar153,auVar153);
      do {
        pauVar23 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar22 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar24 < 8) {
          uVar19 = 0;
        }
        else {
          iVar16 = 7;
          do {
            auVar197 = vandps_avx(auVar49,*pauVar23);
            *pauVar23 = auVar197;
            pauVar23 = pauVar23 + 1;
            iVar16 = iVar16 + 8;
            uVar19 = uVar24 & 0xfffffff8;
          } while (iVar16 < (int)uVar24);
        }
        uVar18 = uVar19 | 3;
        while ((int)uVar18 < (int)uVar24) {
          auVar153 = vandps_avx(auVar114,*(undefined1 (*) [16])*pauVar23);
          *(undefined1 (*) [16])*pauVar23 = auVar153;
          pauVar23 = (undefined1 (*) [32])(*pauVar23 + 0x10);
          uVar18 = uVar19 + 7;
          uVar19 = uVar19 + 4;
        }
        if ((int)uVar19 < (int)uVar24) {
          uVar17 = CONCAT44(0,~uVar19 + uVar24);
          auVar276._8_8_ = 0;
          auVar276._0_8_ = uVar17;
          auVar258 = vpshufd_avx(auVar276,0x44);
          auVar153 = vorps_avx(auVar258,auVar211);
          auVar128 = vorps_avx(auVar258,auVar211);
          auVar258 = vorps_avx(auVar258,auVar211);
          uVar25 = 0;
          do {
            auVar352._8_8_ = 0;
            auVar352._0_8_ = uVar25;
            auVar343 = vpshufd_avx(auVar352,0x44);
            auVar375._16_16_ = auVar343;
            auVar375._0_16_ = auVar343;
            auVar197 = vorps_avx(auVar375,auVar140);
            auVar271 = vorps_avx(auVar375,auVar51);
            auVar406._0_8_ = auVar271._16_8_ ^ 0x8000000000000000;
            auVar406._8_4_ = auVar271._24_4_;
            auVar406._12_4_ = auVar271._28_4_ ^ 0x80000000;
            auVar343 = vpcmpgtq_avx(auVar406,auVar153);
            auVar353._0_8_ = auVar271._0_8_ ^ 0x8000000000000000;
            auVar353._8_4_ = auVar271._8_4_;
            auVar353._12_4_ = auVar271._12_4_ ^ 0x80000000;
            auVar369 = vpcmpgtq_avx(auVar353,auVar128);
            auVar343 = vpackssdw_avx(auVar369,auVar343);
            auVar407._0_8_ = auVar197._16_8_ ^ 0x8000000000000000;
            auVar407._8_4_ = auVar197._24_4_;
            auVar407._12_4_ = auVar197._28_4_ ^ 0x80000000;
            auVar369 = vpcmpgtq_avx(auVar407,auVar153);
            auVar389._0_8_ = auVar197._0_8_ ^ 0x8000000000000000;
            auVar389._8_4_ = auVar197._8_4_;
            auVar389._12_4_ = auVar197._12_4_ ^ 0x80000000;
            auVar417 = vpcmpgtq_avx(auVar389,auVar258);
            auVar369 = vpackssdw_avx(auVar417,auVar369);
            auVar343 = vpackssdw_avx(auVar369 ^ auVar29,auVar343 ^ auVar29);
            auVar369 = vpmovsxwd_avx(auVar343);
            auVar343 = vpunpckhwd_avx(auVar343,auVar343);
            auVar376._16_16_ = auVar343;
            auVar376._0_16_ = auVar369;
            auVar197 = vmaskmovps_avx(auVar376,*(undefined1 (*) [32])(*pauVar23 + uVar25 * 4));
            auVar197 = vandps_avx(auVar197,auVar49);
            auVar197 = vmaskmovps_avx(auVar376,auVar197);
            *(undefined1 (*) [32])(*pauVar23 + uVar25 * 4) = auVar197;
            uVar25 = uVar25 + 8;
          } while ((uVar17 + 8 & 0x1fffffff8) != uVar25);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != iVar26);
    }
    break;
  case 1:
    iVar26 = bottom_top_blob->c;
    if (0 < (long)iVar26) {
      uVar24 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar22 = 0;
      auVar225._8_8_ = 0x8000000000000000;
      auVar225._0_8_ = 0x8000000000000000;
      auVar29 = vpcmpeqd_avx(auVar153,auVar153);
      do {
        pauVar23 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar22 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar24 < 8) {
          uVar19 = 0;
        }
        else {
          iVar16 = 7;
          do {
            auVar197 = *pauVar23;
            auVar299._0_8_ = auVar197._0_8_ ^ 0x8000000080000000;
            auVar299._8_4_ = auVar197._8_4_ ^ 0x80000000;
            auVar299._12_4_ = auVar197._12_4_ ^ 0x80000000;
            auVar299._16_4_ = auVar197._16_4_ ^ 0x80000000;
            auVar299._20_4_ = auVar197._20_4_ ^ 0x80000000;
            auVar299._24_4_ = auVar197._24_4_ ^ 0x80000000;
            auVar299._28_4_ = auVar197._28_4_ ^ 0x80000000;
            *pauVar23 = auVar299;
            pauVar23 = pauVar23 + 1;
            iVar16 = iVar16 + 8;
            uVar19 = uVar24 & 0xfffffff8;
          } while (iVar16 < (int)uVar24);
        }
        uVar18 = uVar19 | 3;
        while ((int)uVar18 < (int)uVar24) {
          auVar153 = *(undefined1 (*) [16])*pauVar23;
          auVar284._0_8_ = auVar153._0_8_ ^ 0x8000000080000000;
          auVar284._8_4_ = auVar153._8_4_ ^ 0x80000000;
          auVar284._12_4_ = auVar153._12_4_ ^ 0x80000000;
          *(undefined1 (*) [16])*pauVar23 = auVar284;
          pauVar23 = (undefined1 (*) [32])(*pauVar23 + 0x10);
          uVar18 = uVar19 + 7;
          uVar19 = uVar19 + 4;
        }
        if ((int)uVar19 < (int)uVar24) {
          uVar17 = CONCAT44(0,~uVar19 + uVar24);
          auVar285._8_8_ = 0;
          auVar285._0_8_ = uVar17;
          auVar258 = vpshufd_avx(auVar285,0x44);
          auVar153 = vorps_avx(auVar258,auVar225);
          auVar128 = vorps_avx(auVar258,auVar225);
          auVar258 = vorps_avx(auVar258,auVar225);
          uVar25 = 0;
          do {
            auVar367._8_8_ = 0;
            auVar367._0_8_ = uVar25;
            auVar343 = vpshufd_avx(auVar367,0x44);
            auVar383._16_16_ = auVar343;
            auVar383._0_16_ = auVar343;
            auVar197 = vorps_avx(auVar383,auVar140);
            auVar271 = vorps_avx(auVar383,auVar51);
            auVar415._0_8_ = auVar271._16_8_ ^ 0x8000000000000000;
            auVar415._8_4_ = auVar271._24_4_;
            auVar415._12_4_ = auVar271._28_4_ ^ 0x80000000;
            auVar343 = vpcmpgtq_avx(auVar415,auVar153);
            auVar368._0_8_ = auVar271._0_8_ ^ 0x8000000000000000;
            auVar368._8_4_ = auVar271._8_4_;
            auVar368._12_4_ = auVar271._12_4_ ^ 0x80000000;
            auVar369 = vpcmpgtq_avx(auVar368,auVar128);
            auVar343 = vpackssdw_avx(auVar369,auVar343);
            auVar416._0_8_ = auVar197._16_8_ ^ 0x8000000000000000;
            auVar416._8_4_ = auVar197._24_4_;
            auVar416._12_4_ = auVar197._28_4_ ^ 0x80000000;
            auVar369 = vpcmpgtq_avx(auVar416,auVar153);
            auVar396._0_8_ = auVar197._0_8_ ^ 0x8000000000000000;
            auVar396._8_4_ = auVar197._8_4_;
            auVar396._12_4_ = auVar197._12_4_ ^ 0x80000000;
            auVar417 = vpcmpgtq_avx(auVar396,auVar258);
            auVar369 = vpackssdw_avx(auVar417,auVar369);
            auVar343 = vpackssdw_avx(auVar369 ^ auVar29,auVar343 ^ auVar29);
            auVar369 = vpmovsxwd_avx(auVar343);
            auVar343 = vpunpckhwd_avx(auVar343,auVar343);
            auVar384._16_16_ = auVar343;
            auVar384._0_16_ = auVar369;
            auVar197 = vmaskmovps_avx(auVar384,*(undefined1 (*) [32])(*pauVar23 + uVar25 * 4));
            auVar402._0_8_ = auVar197._0_8_ ^ 0x8000000080000000;
            auVar402._8_4_ = auVar197._8_4_ ^ 0x80000000;
            auVar402._12_4_ = auVar197._12_4_ ^ 0x80000000;
            auVar402._16_4_ = auVar197._16_4_ ^ 0x80000000;
            auVar402._20_4_ = auVar197._20_4_ ^ 0x80000000;
            auVar402._24_4_ = auVar197._24_4_ ^ 0x80000000;
            auVar402._28_4_ = auVar197._28_4_ ^ 0x80000000;
            auVar197 = vmaskmovps_avx(auVar384,auVar402);
            *(undefined1 (*) [32])(*pauVar23 + uVar25 * 4) = auVar197;
            uVar25 = uVar25 + 8;
          } while ((uVar17 + 8 & 0x1fffffff8) != uVar25);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != iVar26);
    }
    break;
  case 2:
    iVar26 = bottom_top_blob->c;
    if (0 < (long)iVar26) {
      uVar24 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar22 = 0;
      auVar149._8_8_ = 0x8000000000000000;
      auVar149._0_8_ = 0x8000000000000000;
      auVar29 = vpcmpeqd_avx(auVar29,auVar29);
      do {
        pauVar23 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar22 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar24 < 8) {
          uVar19 = 0;
        }
        else {
          iVar16 = 7;
          do {
            auVar197 = vroundps_avx(*pauVar23,1);
            *pauVar23 = auVar197;
            pauVar23 = pauVar23 + 1;
            iVar16 = iVar16 + 8;
            uVar19 = uVar24 & 0xfffffff8;
          } while (iVar16 < (int)uVar24);
        }
        uVar18 = uVar19 | 3;
        while ((int)uVar18 < (int)uVar24) {
          auVar153 = vroundps_avx(*(undefined1 (*) [16])*pauVar23,1);
          *(undefined1 (*) [16])*pauVar23 = auVar153;
          pauVar23 = (undefined1 (*) [32])(*pauVar23 + 0x10);
          uVar18 = uVar19 + 7;
          uVar19 = uVar19 + 4;
        }
        if ((int)uVar19 < (int)uVar24) {
          uVar17 = CONCAT44(0,~uVar19 + uVar24);
          auVar220._8_8_ = 0;
          auVar220._0_8_ = uVar17;
          auVar258 = vpshufd_avx(auVar220,0x44);
          auVar153 = vorps_avx(auVar258,auVar149);
          auVar128 = vorps_avx(auVar258,auVar149);
          auVar258 = vorps_avx(auVar258,auVar149);
          uVar25 = 0;
          do {
            auVar310._8_8_ = 0;
            auVar310._0_8_ = uVar25;
            auVar343 = vpshufd_avx(auVar310,0x44);
            auVar326._16_16_ = auVar343;
            auVar326._0_16_ = auVar343;
            auVar197 = vorps_avx(auVar326,auVar140);
            auVar271 = vorps_avx(auVar326,auVar51);
            auVar360._0_8_ = auVar271._16_8_ ^ 0x8000000000000000;
            auVar360._8_4_ = auVar271._24_4_;
            auVar360._12_4_ = auVar271._28_4_ ^ 0x80000000;
            auVar343 = vpcmpgtq_avx(auVar360,auVar153);
            auVar311._0_8_ = auVar271._0_8_ ^ 0x8000000000000000;
            auVar311._8_4_ = auVar271._8_4_;
            auVar311._12_4_ = auVar271._12_4_ ^ 0x80000000;
            auVar369 = vpcmpgtq_avx(auVar311,auVar128);
            auVar343 = vpackssdw_avx(auVar369,auVar343);
            auVar361._0_8_ = auVar197._16_8_ ^ 0x8000000000000000;
            auVar361._8_4_ = auVar197._24_4_;
            auVar361._12_4_ = auVar197._28_4_ ^ 0x80000000;
            auVar369 = vpcmpgtq_avx(auVar361,auVar153);
            auVar340._0_8_ = auVar197._0_8_ ^ 0x8000000000000000;
            auVar340._8_4_ = auVar197._8_4_;
            auVar340._12_4_ = auVar197._12_4_ ^ 0x80000000;
            auVar417 = vpcmpgtq_avx(auVar340,auVar258);
            auVar369 = vpackssdw_avx(auVar417,auVar369);
            auVar343 = vpackssdw_avx(auVar369 ^ auVar29,auVar343 ^ auVar29);
            auVar369 = vpmovsxwd_avx(auVar343);
            auVar343 = vpunpckhwd_avx(auVar343,auVar343);
            auVar327._16_16_ = auVar343;
            auVar327._0_16_ = auVar369;
            auVar197 = vmaskmovps_avx(auVar327,*(undefined1 (*) [32])(*pauVar23 + uVar25 * 4));
            auVar197 = vroundps_avx(auVar197,9);
            auVar197 = vmaskmovps_avx(auVar327,auVar197);
            *(undefined1 (*) [32])(*pauVar23 + uVar25 * 4) = auVar197;
            uVar25 = uVar25 + 8;
          } while ((uVar17 + 8 & 0x1fffffff8) != uVar25);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != iVar26);
    }
    break;
  case 3:
    iVar26 = bottom_top_blob->c;
    if (0 < (long)iVar26) {
      uVar24 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar22 = 0;
      auVar150._8_8_ = 0x8000000000000000;
      auVar150._0_8_ = 0x8000000000000000;
      auVar29 = vpcmpeqd_avx(auVar29,auVar29);
      do {
        pauVar23 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar22 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar24 < 8) {
          uVar19 = 0;
        }
        else {
          iVar16 = 7;
          do {
            auVar197 = vroundps_avx(*pauVar23,2);
            *pauVar23 = auVar197;
            pauVar23 = pauVar23 + 1;
            iVar16 = iVar16 + 8;
            uVar19 = uVar24 & 0xfffffff8;
          } while (iVar16 < (int)uVar24);
        }
        uVar18 = uVar19 | 3;
        while ((int)uVar18 < (int)uVar24) {
          auVar153 = vroundps_avx(*(undefined1 (*) [16])*pauVar23,2);
          *(undefined1 (*) [16])*pauVar23 = auVar153;
          pauVar23 = (undefined1 (*) [32])(*pauVar23 + 0x10);
          uVar18 = uVar19 + 7;
          uVar19 = uVar19 + 4;
        }
        if ((int)uVar19 < (int)uVar24) {
          uVar17 = CONCAT44(0,~uVar19 + uVar24);
          auVar222._8_8_ = 0;
          auVar222._0_8_ = uVar17;
          auVar258 = vpshufd_avx(auVar222,0x44);
          auVar153 = vorps_avx(auVar258,auVar150);
          auVar128 = vorps_avx(auVar258,auVar150);
          auVar258 = vorps_avx(auVar258,auVar150);
          uVar25 = 0;
          do {
            auVar312._8_8_ = 0;
            auVar312._0_8_ = uVar25;
            auVar343 = vpshufd_avx(auVar312,0x44);
            auVar328._16_16_ = auVar343;
            auVar328._0_16_ = auVar343;
            auVar197 = vorps_avx(auVar328,auVar140);
            auVar271 = vorps_avx(auVar328,auVar51);
            auVar364._0_8_ = auVar271._16_8_ ^ 0x8000000000000000;
            auVar364._8_4_ = auVar271._24_4_;
            auVar364._12_4_ = auVar271._28_4_ ^ 0x80000000;
            auVar343 = vpcmpgtq_avx(auVar364,auVar153);
            auVar313._0_8_ = auVar271._0_8_ ^ 0x8000000000000000;
            auVar313._8_4_ = auVar271._8_4_;
            auVar313._12_4_ = auVar271._12_4_ ^ 0x80000000;
            auVar369 = vpcmpgtq_avx(auVar313,auVar128);
            auVar343 = vpackssdw_avx(auVar369,auVar343);
            auVar365._0_8_ = auVar197._16_8_ ^ 0x8000000000000000;
            auVar365._8_4_ = auVar197._24_4_;
            auVar365._12_4_ = auVar197._28_4_ ^ 0x80000000;
            auVar369 = vpcmpgtq_avx(auVar365,auVar153);
            auVar341._0_8_ = auVar197._0_8_ ^ 0x8000000000000000;
            auVar341._8_4_ = auVar197._8_4_;
            auVar341._12_4_ = auVar197._12_4_ ^ 0x80000000;
            auVar417 = vpcmpgtq_avx(auVar341,auVar258);
            auVar369 = vpackssdw_avx(auVar417,auVar369);
            auVar343 = vpackssdw_avx(auVar369 ^ auVar29,auVar343 ^ auVar29);
            auVar369 = vpmovsxwd_avx(auVar343);
            auVar343 = vpunpckhwd_avx(auVar343,auVar343);
            auVar329._16_16_ = auVar343;
            auVar329._0_16_ = auVar369;
            auVar197 = vmaskmovps_avx(auVar329,*(undefined1 (*) [32])(*pauVar23 + uVar25 * 4));
            auVar197 = vroundps_avx(auVar197,10);
            auVar197 = vmaskmovps_avx(auVar329,auVar197);
            *(undefined1 (*) [32])(*pauVar23 + uVar25 * 4) = auVar197;
            uVar25 = uVar25 + 8;
          } while ((uVar17 + 8 & 0x1fffffff8) != uVar25);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != iVar26);
    }
    break;
  case 4:
    iVar26 = bottom_top_blob->c;
    if (0 < (long)iVar26) {
      uVar24 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar22 = 0;
      auVar147._8_8_ = 0x8000000000000000;
      auVar147._0_8_ = 0x8000000000000000;
      auVar29 = vpcmpeqd_avx(auVar29,auVar29);
      do {
        pauVar23 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar22 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar24 < 8) {
          uVar19 = 0;
        }
        else {
          iVar16 = 7;
          do {
            auVar4._4_4_ = *(float *)(*pauVar23 + 4) * *(float *)(*pauVar23 + 4);
            auVar4._0_4_ = *(float *)*pauVar23 * *(float *)*pauVar23;
            auVar4._8_4_ = *(float *)(*pauVar23 + 8) * *(float *)(*pauVar23 + 8);
            auVar4._12_4_ = *(float *)(*pauVar23 + 0xc) * *(float *)(*pauVar23 + 0xc);
            auVar4._16_4_ = *(float *)(*pauVar23 + 0x10) * *(float *)(*pauVar23 + 0x10);
            auVar4._20_4_ = *(float *)(*pauVar23 + 0x14) * *(float *)(*pauVar23 + 0x14);
            auVar4._24_4_ = *(float *)(*pauVar23 + 0x18) * *(float *)(*pauVar23 + 0x18);
            auVar4._28_4_ = *(undefined4 *)(*pauVar23 + 0x1c);
            *pauVar23 = auVar4;
            pauVar23 = pauVar23 + 1;
            iVar16 = iVar16 + 8;
            uVar19 = uVar24 & 0xfffffff8;
          } while (iVar16 < (int)uVar24);
        }
        uVar18 = uVar19 | 3;
        while ((int)uVar18 < (int)uVar24) {
          auVar214._0_4_ = *(float *)*pauVar23 * *(float *)*pauVar23;
          auVar214._4_4_ = *(float *)(*pauVar23 + 4) * *(float *)(*pauVar23 + 4);
          auVar214._8_4_ = *(float *)(*pauVar23 + 8) * *(float *)(*pauVar23 + 8);
          auVar214._12_4_ = *(float *)(*pauVar23 + 0xc) * *(float *)(*pauVar23 + 0xc);
          *(undefined1 (*) [16])*pauVar23 = auVar214;
          pauVar23 = (undefined1 (*) [32])(*pauVar23 + 0x10);
          uVar18 = uVar19 + 7;
          uVar19 = uVar19 + 4;
        }
        if ((int)uVar19 < (int)uVar24) {
          uVar17 = CONCAT44(0,~uVar19 + uVar24);
          auVar215._8_8_ = 0;
          auVar215._0_8_ = uVar17;
          auVar258 = vpshufd_avx(auVar215,0x44);
          auVar153 = vorps_avx(auVar258,auVar147);
          auVar128 = vorps_avx(auVar258,auVar147);
          auVar258 = vorps_avx(auVar258,auVar147);
          uVar25 = 0;
          do {
            auVar306._8_8_ = 0;
            auVar306._0_8_ = uVar25;
            auVar343 = vpshufd_avx(auVar306,0x44);
            auVar323._16_16_ = auVar343;
            auVar323._0_16_ = auVar343;
            auVar197 = vorps_avx(auVar323,auVar140);
            auVar271 = vorps_avx(auVar323,auVar51);
            auVar356._0_8_ = auVar271._16_8_ ^ 0x8000000000000000;
            auVar356._8_4_ = auVar271._24_4_;
            auVar356._12_4_ = auVar271._28_4_ ^ 0x80000000;
            auVar343 = vpcmpgtq_avx(auVar356,auVar153);
            auVar307._0_8_ = auVar271._0_8_ ^ 0x8000000000000000;
            auVar307._8_4_ = auVar271._8_4_;
            auVar307._12_4_ = auVar271._12_4_ ^ 0x80000000;
            auVar369 = vpcmpgtq_avx(auVar307,auVar128);
            auVar343 = vpackssdw_avx(auVar369,auVar343);
            auVar357._0_8_ = auVar197._16_8_ ^ 0x8000000000000000;
            auVar357._8_4_ = auVar197._24_4_;
            auVar357._12_4_ = auVar197._28_4_ ^ 0x80000000;
            auVar369 = vpcmpgtq_avx(auVar357,auVar153);
            auVar338._0_8_ = auVar197._0_8_ ^ 0x8000000000000000;
            auVar338._8_4_ = auVar197._8_4_;
            auVar338._12_4_ = auVar197._12_4_ ^ 0x80000000;
            auVar417 = vpcmpgtq_avx(auVar338,auVar258);
            auVar369 = vpackssdw_avx(auVar417,auVar369);
            auVar343 = vpackssdw_avx(auVar369 ^ auVar29,auVar343 ^ auVar29);
            auVar369 = vpmovsxwd_avx(auVar343);
            auVar343 = vpunpckhwd_avx(auVar343,auVar343);
            auVar324._16_16_ = auVar343;
            auVar324._0_16_ = auVar369;
            auVar197 = vmaskmovps_avx(auVar324,*(undefined1 (*) [32])(*pauVar23 + uVar25 * 4));
            auVar5._4_4_ = auVar197._4_4_ * auVar197._4_4_;
            auVar5._0_4_ = auVar197._0_4_ * auVar197._0_4_;
            auVar5._8_4_ = auVar197._8_4_ * auVar197._8_4_;
            auVar5._12_4_ = auVar197._12_4_ * auVar197._12_4_;
            auVar5._16_4_ = auVar197._16_4_ * auVar197._16_4_;
            auVar5._20_4_ = auVar197._20_4_ * auVar197._20_4_;
            auVar5._24_4_ = auVar197._24_4_ * auVar197._24_4_;
            auVar5._28_4_ = auVar197._28_4_;
            auVar197 = vmaskmovps_avx(auVar324,auVar5);
            *(undefined1 (*) [32])(*pauVar23 + uVar25 * 4) = auVar197;
            uVar25 = uVar25 + 8;
          } while ((uVar17 + 8 & 0x1fffffff8) != uVar25);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != iVar26);
    }
    break;
  case 5:
    iVar26 = bottom_top_blob->c;
    if (0 < (long)iVar26) {
      uVar24 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar22 = 0;
      auVar69._8_4_ = 0xc0400000;
      auVar69._0_8_ = 0xc0400000c0400000;
      auVar69._12_4_ = 0xc0400000;
      auVar69._16_4_ = 0xc0400000;
      auVar69._20_4_ = 0xc0400000;
      auVar69._24_4_ = 0xc0400000;
      auVar69._28_4_ = 0xc0400000;
      auVar169._8_4_ = 0x7fffffff;
      auVar169._0_8_ = 0x7fffffff7fffffff;
      auVar169._12_4_ = 0x7fffffff;
      auVar169._16_4_ = 0x7fffffff;
      auVar169._20_4_ = 0x7fffffff;
      auVar169._24_4_ = 0x7fffffff;
      auVar169._28_4_ = 0x7fffffff;
      auVar199._8_4_ = 0x800000;
      auVar199._0_8_ = 0x80000000800000;
      auVar199._12_4_ = 0x800000;
      auVar199._16_4_ = 0x800000;
      auVar199._20_4_ = 0x800000;
      auVar199._24_4_ = 0x800000;
      auVar199._28_4_ = 0x800000;
      auVar315._8_4_ = 0x800000;
      auVar315._0_8_ = 0x80000000800000;
      auVar315._12_4_ = 0x800000;
      auVar397._8_8_ = 0x8000000000000000;
      auVar397._0_8_ = 0x8000000000000000;
      auVar29 = vpcmpeqd_avx(in_ZMM11._0_16_,in_ZMM11._0_16_);
      do {
        auVar476._8_4_ = 0xc0400000;
        auVar476._0_8_ = 0xc0400000c0400000;
        auVar476._12_4_ = 0xc0400000;
        pauVar23 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar22 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar24 < 8) {
          uVar19 = 0;
        }
        else {
          iVar16 = 7;
          do {
            auVar197 = *pauVar23;
            auVar271 = vrsqrtps_avx(auVar197);
            auVar469._0_4_ = auVar197._0_4_ * auVar271._0_4_;
            auVar469._4_4_ = auVar197._4_4_ * auVar271._4_4_;
            auVar469._8_4_ = auVar197._8_4_ * auVar271._8_4_;
            auVar469._12_4_ = auVar197._12_4_ * auVar271._12_4_;
            auVar469._16_4_ = auVar197._16_4_ * auVar271._16_4_;
            auVar469._20_4_ = auVar197._20_4_ * auVar271._20_4_;
            auVar469._28_36_ = in_ZMM14._28_36_;
            auVar469._24_4_ = auVar197._24_4_ * auVar271._24_4_;
            auVar153 = vfmadd213ps_fma(auVar271,auVar469._0_32_,auVar69);
            in_ZMM14 = ZEXT3264(CONCAT428(in_ZMM14._28_4_,
                                          CONCAT424(auVar469._24_4_ * -0.5,
                                                    CONCAT420(auVar469._20_4_ * -0.5,
                                                              CONCAT416(auVar469._16_4_ * -0.5,
                                                                        CONCAT412(auVar469._12_4_ *
                                                                                  -0.5,CONCAT48(
                                                  auVar469._8_4_ * -0.5,
                                                  CONCAT44(auVar469._4_4_ * -0.5,
                                                           auVar469._0_4_ * -0.5))))))));
            auVar454._0_4_ = auVar469._0_4_ * -0.5 * auVar153._0_4_;
            auVar454._4_4_ = auVar469._4_4_ * -0.5 * auVar153._4_4_;
            auVar454._8_4_ = auVar469._8_4_ * -0.5 * auVar153._8_4_;
            auVar454._12_4_ = auVar469._12_4_ * -0.5 * auVar153._12_4_;
            auVar454._16_4_ = auVar469._16_4_ * -0.5 * 0.0;
            auVar454._20_4_ = auVar469._20_4_ * -0.5 * 0.0;
            auVar454._24_4_ = auVar469._24_4_ * -0.5 * 0.0;
            auVar454._28_4_ = 0;
            auVar197 = vandps_avx(auVar197,auVar169);
            auVar197 = vcmpps_avx(auVar199,auVar197,2);
            auVar197 = vandps_avx(auVar197,auVar454);
            *pauVar23 = auVar197;
            pauVar23 = pauVar23 + 1;
            iVar16 = iVar16 + 8;
            uVar19 = uVar24 & 0xfffffff8;
          } while (iVar16 < (int)uVar24);
        }
        auVar446._8_4_ = 0x7fffffff;
        auVar446._0_8_ = 0x7fffffff7fffffff;
        auVar446._12_4_ = 0x7fffffff;
        uVar18 = uVar19 | 3;
        while ((int)uVar18 < (int)uVar24) {
          auVar153 = *(undefined1 (*) [16])*pauVar23;
          auVar128 = vrsqrtps_avx(auVar153);
          auVar286._0_4_ = auVar153._0_4_ * auVar128._0_4_;
          auVar286._4_4_ = auVar153._4_4_ * auVar128._4_4_;
          auVar286._8_4_ = auVar153._8_4_ * auVar128._8_4_;
          auVar286._12_4_ = auVar153._12_4_ * auVar128._12_4_;
          auVar128 = vfmadd213ps_fma(auVar128,auVar286,auVar476);
          in_ZMM6 = ZEXT1664(CONCAT412(auVar286._12_4_ * -0.5,
                                       CONCAT48(auVar286._8_4_ * -0.5,
                                                CONCAT44(auVar286._4_4_ * -0.5,auVar286._0_4_ * -0.5
                                                        ))));
          auVar263._0_4_ = auVar286._0_4_ * -0.5 * auVar128._0_4_;
          auVar263._4_4_ = auVar286._4_4_ * -0.5 * auVar128._4_4_;
          auVar263._8_4_ = auVar286._8_4_ * -0.5 * auVar128._8_4_;
          auVar263._12_4_ = auVar286._12_4_ * -0.5 * auVar128._12_4_;
          auVar153 = vandps_avx(auVar446,auVar153);
          auVar153 = vcmpps_avx(auVar315,auVar153,2);
          auVar153 = vandps_avx(auVar153,auVar263);
          *(undefined1 (*) [16])*pauVar23 = auVar153;
          pauVar23 = (undefined1 (*) [32])(*pauVar23 + 0x10);
          uVar18 = uVar19 + 7;
          uVar19 = uVar19 + 4;
        }
        if ((int)uVar19 < (int)uVar24) {
          uVar17 = CONCAT44(0,~uVar19 + uVar24);
          auVar431._8_8_ = 0;
          auVar431._0_8_ = uVar17;
          auVar258 = vpshufd_avx(auVar431,0x44);
          auVar153 = vorps_avx(auVar258,auVar397);
          auVar128 = vorps_avx(auVar258,auVar397);
          auVar258 = vorps_avx(auVar258,auVar397);
          in_ZMM14 = ZEXT1664(auVar258);
          uVar25 = 0;
          do {
            auVar477._8_8_ = 0;
            auVar477._0_8_ = uVar25;
            auVar343 = vpshufd_avx(auVar477,0x44);
            auVar486._16_16_ = auVar343;
            auVar486._0_16_ = auVar343;
            auVar197 = vorps_avx(auVar486,auVar140);
            auVar271 = vorps_avx(auVar486,auVar51);
            auVar264._0_8_ = auVar271._16_8_ ^ 0x8000000000000000;
            auVar264._8_4_ = auVar271._24_4_;
            auVar264._12_4_ = auVar271._28_4_ ^ 0x80000000;
            auVar343 = vpcmpgtq_avx(auVar264,auVar153);
            auVar478._8_4_ = auVar271._8_4_;
            auVar478._0_8_ = auVar271._0_8_ ^ 0x8000000000000000;
            auVar478._12_4_ = auVar271._12_4_ ^ 0x80000000;
            auVar369 = vpcmpgtq_avx(auVar478,auVar128);
            auVar343 = vpackssdw_avx(auVar369,auVar343);
            auVar479._8_4_ = auVar197._24_4_;
            auVar479._0_8_ = auVar197._16_8_ ^ 0x8000000000000000;
            auVar479._12_4_ = auVar197._28_4_ ^ 0x80000000;
            auVar369 = vpcmpgtq_avx(auVar479,auVar153);
            auVar230._0_8_ = auVar197._0_8_ ^ 0x8000000000000000;
            auVar230._8_4_ = auVar197._8_4_;
            auVar230._12_4_ = auVar197._12_4_ ^ 0x80000000;
            auVar417 = vpcmpgtq_avx(auVar230,auVar258);
            auVar369 = vpackssdw_avx(auVar417,auVar369);
            auVar343 = vpackssdw_avx(auVar29 ^ auVar369,auVar29 ^ auVar343);
            auVar369 = vpmovsxwd_avx(auVar343);
            auVar343 = vpunpckhwd_avx(auVar343,auVar343);
            auVar249._16_16_ = auVar343;
            auVar249._0_16_ = auVar369;
            auVar271 = vmaskmovps_avx(auVar249,*(undefined1 (*) [32])(*pauVar23 + uVar25 * 4));
            auVar197 = vrsqrtps_avx(auVar271);
            auVar302._0_4_ = auVar197._0_4_ * auVar271._0_4_;
            auVar302._4_4_ = auVar197._4_4_ * auVar271._4_4_;
            auVar302._8_4_ = auVar197._8_4_ * auVar271._8_4_;
            auVar302._12_4_ = auVar197._12_4_ * auVar271._12_4_;
            auVar302._16_4_ = auVar197._16_4_ * auVar271._16_4_;
            auVar302._20_4_ = auVar197._20_4_ * auVar271._20_4_;
            auVar302._28_36_ = in_ZMM6._28_36_;
            auVar302._24_4_ = auVar197._24_4_ * auVar271._24_4_;
            auVar343 = vfmadd213ps_fma(auVar197,auVar302._0_32_,auVar69);
            auVar11._4_4_ = auVar343._4_4_ * auVar302._4_4_ * -0.5;
            auVar11._0_4_ = auVar343._0_4_ * auVar302._0_4_ * -0.5;
            auVar11._8_4_ = auVar343._8_4_ * auVar302._8_4_ * -0.5;
            auVar11._12_4_ = auVar343._12_4_ * auVar302._12_4_ * -0.5;
            auVar11._16_4_ = auVar302._16_4_ * -0.5 * 0.0;
            auVar11._20_4_ = auVar302._20_4_ * -0.5 * 0.0;
            auVar11._24_4_ = auVar302._24_4_ * -0.5 * 0.0;
            auVar11._28_4_ = in_ZMM6._28_4_;
            in_ZMM6 = ZEXT3264(auVar11);
            auVar197 = vandps_avx(auVar271,auVar169);
            auVar197 = vcmpps_avx(auVar199,auVar197,2);
            auVar197 = vandps_avx(auVar197,auVar11);
            auVar197 = vmaskmovps_avx(auVar249,auVar197);
            *(undefined1 (*) [32])(*pauVar23 + uVar25 * 4) = auVar197;
            uVar25 = uVar25 + 8;
          } while ((uVar17 + 8 & 0x1fffffff8) != uVar25);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != iVar26);
    }
    break;
  case 6:
    iVar26 = bottom_top_blob->c;
    if (0 < (long)iVar26) {
      uVar24 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar22 = 0;
      auVar159._8_8_ = 0x8000000000000000;
      auVar159._0_8_ = 0x8000000000000000;
      auVar29 = vpcmpeqd_avx(auVar29,auVar29);
      auVar251._8_4_ = 0xc0400000;
      auVar251._0_8_ = 0xc0400000c0400000;
      auVar251._12_4_ = 0xc0400000;
      auVar251._16_4_ = 0xc0400000;
      auVar251._20_4_ = 0xc0400000;
      auVar251._24_4_ = 0xc0400000;
      auVar251._28_4_ = 0xc0400000;
      do {
        pauVar23 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar22 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar24 < 8) {
          uVar19 = 0;
        }
        else {
          iVar16 = 7;
          do {
            auVar197 = vrsqrtps_avx(*pauVar23);
            *pauVar23 = auVar197;
            pauVar23 = pauVar23 + 1;
            iVar16 = iVar16 + 8;
            uVar19 = uVar24 & 0xfffffff8;
          } while (iVar16 < (int)uVar24);
        }
        uVar18 = uVar19 | 3;
        while ((int)uVar18 < (int)uVar24) {
          auVar153 = vrsqrtps_avx(*(undefined1 (*) [16])*pauVar23);
          *(undefined1 (*) [16])*pauVar23 = auVar153;
          pauVar23 = (undefined1 (*) [32])(*pauVar23 + 0x10);
          uVar18 = uVar19 + 7;
          uVar19 = uVar19 + 4;
        }
        if ((int)uVar19 < (int)uVar24) {
          uVar17 = CONCAT44(0,~uVar19 + uVar24);
          auVar290._8_8_ = 0;
          auVar290._0_8_ = uVar17;
          auVar258 = vpshufd_avx(auVar290,0x44);
          auVar153 = vorps_avx(auVar258,auVar159);
          auVar128 = vorps_avx(auVar258,auVar159);
          auVar258 = vorps_avx(auVar258,auVar159);
          uVar25 = 0;
          do {
            auVar371._8_8_ = 0;
            auVar371._0_8_ = uVar25;
            auVar343 = vpshufd_avx(auVar371,0x44);
            auVar386._16_16_ = auVar343;
            auVar386._0_16_ = auVar343;
            auVar197 = vorps_avx(auVar386,auVar140);
            auVar271 = vorps_avx(auVar386,auVar51);
            auVar418._0_8_ = auVar271._16_8_ ^ 0x8000000000000000;
            auVar418._8_4_ = auVar271._24_4_;
            auVar418._12_4_ = auVar271._28_4_ ^ 0x80000000;
            auVar343 = vpcmpgtq_avx(auVar418,auVar153);
            auVar372._0_8_ = auVar271._0_8_ ^ 0x8000000000000000;
            auVar372._8_4_ = auVar271._8_4_;
            auVar372._12_4_ = auVar271._12_4_ ^ 0x80000000;
            auVar369 = vpcmpgtq_avx(auVar372,auVar128);
            auVar343 = vpackssdw_avx(auVar369,auVar343);
            auVar419._0_8_ = auVar197._16_8_ ^ 0x8000000000000000;
            auVar419._8_4_ = auVar197._24_4_;
            auVar419._12_4_ = auVar197._28_4_ ^ 0x80000000;
            auVar369 = vpcmpgtq_avx(auVar419,auVar153);
            auVar399._0_8_ = auVar197._0_8_ ^ 0x8000000000000000;
            auVar399._8_4_ = auVar197._8_4_;
            auVar399._12_4_ = auVar197._12_4_ ^ 0x80000000;
            auVar417 = vpcmpgtq_avx(auVar399,auVar258);
            auVar369 = vpackssdw_avx(auVar417,auVar369);
            auVar343 = vpackssdw_avx(auVar369 ^ auVar29,auVar343 ^ auVar29);
            auVar369 = vpmovsxwd_avx(auVar343);
            auVar343 = vpunpckhwd_avx(auVar343,auVar343);
            auVar387._16_16_ = auVar343;
            auVar387._0_16_ = auVar369;
            auVar271 = vmaskmovps_avx(auVar387,*(undefined1 (*) [32])(*pauVar23 + uVar25 * 4));
            auVar197 = vrsqrtps_avx(auVar271);
            auVar15._4_4_ = auVar271._4_4_ * auVar197._4_4_;
            auVar15._0_4_ = auVar271._0_4_ * auVar197._0_4_;
            auVar15._8_4_ = auVar271._8_4_ * auVar197._8_4_;
            auVar15._12_4_ = auVar271._12_4_ * auVar197._12_4_;
            auVar15._16_4_ = auVar271._16_4_ * auVar197._16_4_;
            auVar15._20_4_ = auVar271._20_4_ * auVar197._20_4_;
            auVar15._24_4_ = auVar271._24_4_ * auVar197._24_4_;
            auVar15._28_4_ = auVar271._28_4_;
            auVar343 = vfmadd213ps_fma(auVar15,auVar197,auVar251);
            auVar405._0_4_ = auVar197._0_4_ * -0.5 * auVar343._0_4_;
            auVar405._4_4_ = auVar197._4_4_ * -0.5 * auVar343._4_4_;
            auVar405._8_4_ = auVar197._8_4_ * -0.5 * auVar343._8_4_;
            auVar405._12_4_ = auVar197._12_4_ * -0.5 * auVar343._12_4_;
            auVar405._16_4_ = auVar197._16_4_ * -0.5 * 0.0;
            auVar405._20_4_ = auVar197._20_4_ * -0.5 * 0.0;
            auVar405._24_4_ = auVar197._24_4_ * -0.5 * 0.0;
            auVar405._28_4_ = 0;
            auVar197 = vmaskmovps_avx(auVar387,auVar405);
            *(undefined1 (*) [32])(*pauVar23 + uVar25 * 4) = auVar197;
            uVar25 = uVar25 + 8;
          } while ((uVar17 + 8 & 0x1fffffff8) != uVar25);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != iVar26);
    }
    break;
  case 7:
    local_138 = (long)bottom_top_blob->c;
    if (0 < local_138) {
      iVar26 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_130 = CONCAT44(local_130._4_4_,iVar26) & 0xfffffffffffffff8;
      lVar22 = 0;
      local_f0._8_8_ = 0x8000000000000000;
      local_f0._0_8_ = 0x8000000000000000;
      do {
        auVar484._8_4_ = 0x3e2aaaaa;
        auVar484._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar423._8_4_ = 0x395e8083;
        auVar423._0_8_ = 0x395e8083395e8083;
        auVar382._8_4_ = 0x3f318000;
        auVar382._0_8_ = 0x3f3180003f318000;
        auVar349._8_4_ = 0x3f800000;
        auVar349._0_8_ = 0x3f8000003f800000;
        auVar330._8_4_ = 0x3d2aa9c1;
        auVar330._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar298._8_4_ = 0x3f000000;
        auVar298._0_8_ = 0x3f0000003f000000;
        auVar270._8_4_ = 0x3c088908;
        auVar270._0_8_ = 0x3c0889083c088908;
        auVar242._8_4_ = 0x39506967;
        auVar242._0_8_ = 0x3950696739506967;
        auVar196._8_4_ = 0x3fb8aa3b;
        auVar196._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar166._8_4_ = 0xc2b0c0a5;
        auVar166._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar139._8_4_ = 0x42b0c0a5;
        auVar139._0_8_ = 0x42b0c0a542b0c0a5;
        auVar484._12_4_ = 0x3e2aaaaa;
        auVar423._12_4_ = 0x395e8083;
        auVar382._12_4_ = 0x3f318000;
        auVar349._12_4_ = 0x3f800000;
        auVar330._12_4_ = 0x3d2aa9c1;
        auVar298._12_4_ = 0x3f000000;
        auVar270._12_4_ = 0x3c088908;
        auVar242._12_4_ = 0x39506967;
        auVar196._12_4_ = 0x3fb8aa3b;
        auVar166._12_4_ = 0xc2b0c0a5;
        auVar139._12_4_ = 0x42b0c0a5;
        auVar484._16_4_ = 0x3e2aaaaa;
        auVar423._16_4_ = 0x395e8083;
        auVar382._16_4_ = 0x3f318000;
        auVar349._16_4_ = 0x3f800000;
        auVar330._16_4_ = 0x3d2aa9c1;
        auVar298._16_4_ = 0x3f000000;
        auVar270._16_4_ = 0x3c088908;
        auVar242._16_4_ = 0x39506967;
        auVar196._16_4_ = 0x3fb8aa3b;
        auVar166._16_4_ = 0xc2b0c0a5;
        auVar139._16_4_ = 0x42b0c0a5;
        auVar484._20_4_ = 0x3e2aaaaa;
        auVar423._20_4_ = 0x395e8083;
        auVar382._20_4_ = 0x3f318000;
        auVar349._20_4_ = 0x3f800000;
        auVar330._20_4_ = 0x3d2aa9c1;
        auVar298._20_4_ = 0x3f000000;
        auVar270._20_4_ = 0x3c088908;
        auVar242._20_4_ = 0x39506967;
        auVar196._20_4_ = 0x3fb8aa3b;
        auVar166._20_4_ = 0xc2b0c0a5;
        auVar139._20_4_ = 0x42b0c0a5;
        auVar484._24_4_ = 0x3e2aaaaa;
        auVar423._24_4_ = 0x395e8083;
        auVar382._24_4_ = 0x3f318000;
        auVar349._24_4_ = 0x3f800000;
        auVar330._24_4_ = 0x3d2aa9c1;
        auVar298._24_4_ = 0x3f000000;
        auVar270._24_4_ = 0x3c088908;
        auVar242._24_4_ = 0x39506967;
        auVar196._24_4_ = 0x3fb8aa3b;
        auVar166._24_4_ = 0xc2b0c0a5;
        auVar139._24_4_ = 0x42b0c0a5;
        auVar484._28_4_ = 0x3e2aaaaa;
        auVar423._28_4_ = 0x395e8083;
        auVar382._28_4_ = 0x3f318000;
        auVar349._28_4_ = 0x3f800000;
        auVar330._28_4_ = 0x3d2aa9c1;
        auVar298._28_4_ = 0x3f000000;
        auVar270._28_4_ = 0x3c088908;
        auVar242._28_4_ = 0x39506967;
        auVar196._28_4_ = 0x3fb8aa3b;
        auVar166._28_4_ = 0xc2b0c0a5;
        auVar139._28_4_ = 0x42b0c0a5;
        pauVar23 = (undefined1 (*) [32])
                   (local_128->cstep * lVar22 * local_128->elemsize + (long)local_128->data);
        if (iVar26 < 8) {
          uVar24 = 0;
        }
        else {
          iVar16 = 7;
          do {
            auVar140 = vminps_avx(auVar139,*pauVar23);
            auVar51 = vmaxps_avx(auVar140,auVar166);
            auVar29 = vfmadd213ps_fma(auVar196,auVar51,auVar298);
            auVar197 = vroundps_avx(ZEXT1632(auVar29),1);
            auVar140 = vcmpps_avx(ZEXT1632(auVar29),auVar197,1);
            auVar140 = vandps_avx(auVar349,auVar140);
            auVar140 = vsubps_avx(auVar197,auVar140);
            auVar29 = vfmsub231ps_fma(auVar51,auVar140,auVar382);
            auVar153 = vfmsub231ps_fma(ZEXT1632(auVar29),auVar140,auVar423);
            auVar51 = ZEXT1632(auVar153);
            auVar10._28_4_ = auVar197._28_4_;
            auVar10._0_28_ =
                 ZEXT1628(CONCAT412(auVar153._12_4_ * auVar153._12_4_,
                                    CONCAT48(auVar153._8_4_ * auVar153._8_4_,
                                             CONCAT44(auVar153._4_4_ * auVar153._4_4_,
                                                      auVar153._0_4_ * auVar153._0_4_))));
            auVar243._8_4_ = 0x3ab743ce;
            auVar243._0_8_ = 0x3ab743ce3ab743ce;
            auVar243._12_4_ = 0x3ab743ce;
            auVar243._16_4_ = 0x3ab743ce;
            auVar243._20_4_ = 0x3ab743ce;
            auVar243._24_4_ = 0x3ab743ce;
            auVar243._28_4_ = 0x3ab743ce;
            auVar29 = vfmadd213ps_fma(auVar242,auVar51,auVar243);
            auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar51,auVar270);
            auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar51,auVar330);
            auVar51 = ZEXT1632(auVar153);
            auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar51,auVar484);
            auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar51,auVar298);
            auVar128 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar10,auVar51);
            auVar36._0_4_ = (int)auVar140._0_4_;
            auVar36._4_4_ = (int)auVar140._4_4_;
            auVar36._8_4_ = (int)auVar140._8_4_;
            auVar36._12_4_ = (int)auVar140._12_4_;
            auVar61._16_4_ = (int)auVar140._16_4_;
            auVar61._0_16_ = auVar36;
            auVar61._20_4_ = (int)auVar140._20_4_;
            auVar61._24_4_ = (int)auVar140._24_4_;
            auVar61._28_4_ = (int)auVar140._28_4_;
            auVar153 = vpslld_avx(auVar36,0x17);
            auVar29 = vpslld_avx(auVar61._16_16_,0x17);
            auVar223._8_4_ = 0x3f800000;
            auVar223._0_8_ = 0x3f8000003f800000;
            auVar223._12_4_ = 0x3f800000;
            auVar29 = vpaddd_avx(auVar29,auVar223);
            auVar153 = vpaddd_avx(auVar153,auVar223);
            auVar62._16_16_ = auVar29;
            auVar62._0_16_ = auVar153;
            auVar29 = vfmadd213ps_fma(auVar62,ZEXT1632(auVar128),auVar62);
            *pauVar23 = ZEXT1632(auVar29);
            pauVar23 = pauVar23 + 1;
            iVar16 = iVar16 + 8;
          } while (iVar16 < iVar26);
          uVar24 = (uint)local_130;
        }
        auVar224._8_4_ = 0x3f800000;
        auVar224._0_8_ = 0x3f8000003f800000;
        auVar224._12_4_ = 0x3f800000;
        auVar262._8_4_ = 0x42b0c0a5;
        auVar262._0_8_ = 0x42b0c0a542b0c0a5;
        auVar262._12_4_ = 0x42b0c0a5;
        auVar283._8_4_ = 0xc2b0c0a5;
        auVar283._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar283._12_4_ = 0xc2b0c0a5;
        auVar314._8_4_ = 0x3fb8aa3b;
        auVar314._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar314._12_4_ = 0x3fb8aa3b;
        auVar342._8_4_ = 0x3f000000;
        auVar342._0_8_ = 0x3f0000003f000000;
        auVar342._12_4_ = 0x3f000000;
        auVar366._8_4_ = 0x3f318000;
        auVar366._0_8_ = 0x3f3180003f318000;
        auVar366._12_4_ = 0x3f318000;
        auVar395._8_4_ = 0x395e8083;
        auVar395._0_8_ = 0x395e8083395e8083;
        auVar395._12_4_ = 0x395e8083;
        auVar414._8_4_ = 0x3ab743ce;
        auVar414._0_8_ = 0x3ab743ce3ab743ce;
        auVar414._12_4_ = 0x3ab743ce;
        auVar429._8_4_ = 0x39506967;
        auVar429._0_8_ = 0x3950696739506967;
        auVar429._12_4_ = 0x39506967;
        auVar444._8_4_ = 0x3c088908;
        auVar444._0_8_ = 0x3c0889083c088908;
        auVar444._12_4_ = 0x3c088908;
        auVar461._8_4_ = 0x3d2aa9c1;
        auVar461._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar461._12_4_ = 0x3d2aa9c1;
        auVar474._8_4_ = 0x3e2aaaaa;
        auVar474._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar474._12_4_ = 0x3e2aaaaa;
        uVar19 = uVar24 | 3;
        while ((int)uVar19 < iVar26) {
          auVar29 = vminps_avx(auVar262,*(undefined1 (*) [16])*pauVar23);
          auVar128 = vmaxps_avx(auVar29,auVar283);
          auVar29 = vfmadd213ps_fma(auVar314,auVar128,auVar342);
          auVar151._0_4_ = (int)auVar29._0_4_;
          auVar151._4_4_ = (int)auVar29._4_4_;
          auVar151._8_4_ = (int)auVar29._8_4_;
          auVar151._12_4_ = (int)auVar29._12_4_;
          auVar153 = vcvtdq2ps_avx(auVar151);
          auVar29 = vcmpps_avx(auVar29,auVar153,1);
          auVar29 = vandps_avx(auVar29,auVar224);
          auVar29 = vsubps_avx(auVar153,auVar29);
          auVar153 = vfmsub231ps_fma(auVar128,auVar29,auVar366);
          auVar128 = vfmsub231ps_fma(auVar153,auVar29,auVar395);
          auVar152._0_4_ = auVar128._0_4_ * auVar128._0_4_;
          auVar152._4_4_ = auVar128._4_4_ * auVar128._4_4_;
          auVar152._8_4_ = auVar128._8_4_ * auVar128._8_4_;
          auVar152._12_4_ = auVar128._12_4_ * auVar128._12_4_;
          auVar153 = vfmadd213ps_fma(auVar429,auVar128,auVar414);
          auVar153 = vfmadd213ps_fma(auVar153,auVar128,auVar444);
          auVar153 = vfmadd213ps_fma(auVar153,auVar128,auVar461);
          auVar153 = vfmadd213ps_fma(auVar153,auVar128,auVar474);
          auVar153 = vfmadd213ps_fma(auVar153,auVar128,auVar342);
          auVar153 = vfmadd213ps_fma(auVar153,auVar152,auVar128);
          auVar37._0_4_ = (int)auVar29._0_4_;
          auVar37._4_4_ = (int)auVar29._4_4_;
          auVar37._8_4_ = (int)auVar29._8_4_;
          auVar37._12_4_ = (int)auVar29._12_4_;
          auVar29 = vpslld_avx(auVar37,0x17);
          auVar29 = vpaddd_avx(auVar29,auVar224);
          auVar29 = vfmadd213ps_fma(auVar29,auVar153,auVar29);
          *(undefined1 (*) [16])*pauVar23 = auVar29;
          pauVar23 = (undefined1 (*) [32])(*pauVar23 + 0x10);
          uVar19 = uVar24 + 7;
          uVar24 = uVar24 + 4;
        }
        auVar29 = vpcmpeqd_avx(auVar262,auVar262);
        if ((int)uVar24 < iVar26) {
          uVar17 = CONCAT44(0,~uVar24 + iVar26);
          auVar38._8_8_ = 0;
          auVar38._0_8_ = uVar17;
          local_a0._0_16_ = vpshufd_avx(auVar38,0x44);
          local_d0 = vorps_avx(local_a0._0_16_,local_f0);
          local_e0 = vorps_avx(local_a0._0_16_,local_f0);
          uVar25 = 0;
          auVar140 = _DAT_005550e0;
          local_a0._16_16_ = local_a0._0_16_;
          do {
            auVar39._8_8_ = 0;
            auVar39._0_8_ = uVar25;
            auVar153 = vpshufd_avx(auVar39,0x44);
            auVar63._16_16_ = auVar153;
            auVar63._0_16_ = auVar153;
            auVar51 = vorps_avx(auVar63,_DAT_005550c0);
            auVar140 = vorps_avx(auVar63,auVar140);
            auVar258 = vpor_avx(local_a0._16_16_,local_f0);
            auVar153 = vpcmpgtq_avx(auVar140._16_16_ ^ local_f0,auVar258);
            auVar128 = vpcmpgtq_avx(auVar140._0_16_ ^ local_f0,local_d0);
            auVar153 = vpackssdw_avx(auVar128,auVar153);
            auVar128 = vpcmpgtq_avx(auVar51._16_16_ ^ local_f0,auVar258);
            auVar127._0_4_ = auVar51._0_4_ ^ local_f0._0_4_;
            auVar127._4_4_ = auVar51._4_4_ ^ local_f0._4_4_;
            auVar127._8_4_ = auVar51._8_4_ ^ local_f0._8_4_;
            auVar127._12_4_ = auVar51._12_4_ ^ local_f0._12_4_;
            auVar258 = vpcmpgtq_avx(auVar127,local_e0);
            auVar128 = vpackssdw_avx(auVar258,auVar128);
            auVar153 = vpackssdw_avx(auVar128 ^ auVar29,auVar153 ^ auVar29);
            auVar128 = vpmovsxwd_avx(auVar153);
            auVar153 = vpunpckhwd_avx(auVar153,auVar153);
            local_c0._16_16_ = auVar153;
            local_c0._0_16_ = auVar128;
            local_120 = vmaskmovps_avx(local_c0,*(undefined1 (*) [32])(*pauVar23 + uVar25 * 4));
            local_150 = local_120._16_16_;
            local_160._0_4_ = expf(local_120._16_4_);
            local_160._4_4_ = extraout_XMM0_Db_03;
            local_160._8_4_ = extraout_XMM0_Dc_03;
            local_160._12_4_ = extraout_XMM0_Dd_03;
            auVar153 = vmovshdup_avx(local_150);
            auVar90._0_4_ = expf(auVar153._0_4_);
            auVar90._4_60_ = extraout_var_11;
            local_160 = vinsertps_avx(local_160,auVar90._0_16_,0x10);
            auVar153 = vpermilpd_avx(local_150,1);
            auVar91._0_4_ = expf(auVar153._0_4_);
            auVar91._4_60_ = extraout_var_12;
            local_160 = vinsertps_avx(local_160,auVar91._0_16_,0x20);
            auVar153 = vpermilps_avx(local_150,0xff);
            auVar92._0_4_ = expf(auVar153._0_4_);
            auVar92._4_60_ = extraout_var_13;
            local_150 = vinsertps_avx(local_160,auVar92._0_16_,0x30);
            local_160._0_4_ = expf((float)local_120._0_4_);
            local_160._4_4_ = extraout_XMM0_Db_04;
            local_160._8_4_ = extraout_XMM0_Dc_04;
            local_160._12_4_ = extraout_XMM0_Dd_04;
            auVar153 = vmovshdup_avx(local_120._0_16_);
            auVar93._0_4_ = expf(auVar153._0_4_);
            auVar93._4_60_ = extraout_var_14;
            local_160 = vinsertps_avx(local_160,auVar93._0_16_,0x10);
            auVar153 = vpermilpd_avx(local_120._0_16_,1);
            auVar94._0_4_ = expf(auVar153._0_4_);
            auVar94._4_60_ = extraout_var_15;
            local_160 = vinsertps_avx(local_160,auVar94._0_16_,0x20);
            auVar153 = vpermilps_avx(local_120._0_16_,0xff);
            auVar95._0_4_ = expf(auVar153._0_4_);
            auVar140 = _DAT_005550e0;
            auVar95._4_60_ = extraout_var_16;
            auVar29 = vpcmpeqd_avx(auVar29,auVar29);
            auVar153 = vinsertps_avx(local_160,auVar95._0_16_,0x30);
            auVar64._16_16_ = local_150;
            auVar64._0_16_ = auVar153;
            auVar51 = vmaskmovps_avx(local_c0,auVar64);
            *(undefined1 (*) [32])(*pauVar23 + uVar25 * 4) = auVar51;
            uVar25 = uVar25 + 8;
          } while ((uVar17 + 8 & 0x1fffffff8) != uVar25);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != local_138);
    }
    break;
  case 8:
    local_138 = (long)bottom_top_blob->c;
    if (0 < local_138) {
      iVar26 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_130 = CONCAT44(local_130._4_4_,iVar26) & 0xfffffffffffffff8;
      lVar22 = 0;
      local_f0._8_8_ = 0x8000000000000000;
      local_f0._0_8_ = 0x8000000000000000;
      do {
        auVar487._8_4_ = 0x3e11e9bf;
        auVar487._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar468._8_4_ = 0xbdfe5d4f;
        auVar468._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar456._8_4_ = 0x3def251a;
        auVar456._0_8_ = 0x3def251a3def251a;
        auVar439._8_4_ = 0x3d9021bb;
        auVar439._0_8_ = 0x3d9021bb3d9021bb;
        auVar426._8_4_ = 0xbdebd1b8;
        auVar426._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar388._8_4_ = 0x3f3504f3;
        auVar388._0_8_ = 0x3f3504f33f3504f3;
        auVar334._8_4_ = 0x3f000000;
        auVar334._0_8_ = 0x3f0000003f000000;
        auVar301._8_4_ = 0x807fffff;
        auVar301._0_8_ = 0x807fffff807fffff;
        auVar272._8_4_ = 0x800000;
        auVar272._0_8_ = 0x80000000800000;
        auVar487._12_4_ = 0x3e11e9bf;
        auVar468._12_4_ = 0xbdfe5d4f;
        auVar456._12_4_ = 0x3def251a;
        auVar439._12_4_ = 0x3d9021bb;
        auVar426._12_4_ = 0xbdebd1b8;
        auVar388._12_4_ = 0x3f3504f3;
        auVar334._12_4_ = 0x3f000000;
        auVar301._12_4_ = 0x807fffff;
        auVar272._12_4_ = 0x800000;
        auVar487._16_4_ = 0x3e11e9bf;
        auVar468._16_4_ = 0xbdfe5d4f;
        auVar456._16_4_ = 0x3def251a;
        auVar439._16_4_ = 0x3d9021bb;
        auVar426._16_4_ = 0xbdebd1b8;
        auVar388._16_4_ = 0x3f3504f3;
        auVar334._16_4_ = 0x3f000000;
        auVar301._16_4_ = 0x807fffff;
        auVar272._16_4_ = 0x800000;
        auVar487._20_4_ = 0x3e11e9bf;
        auVar468._20_4_ = 0xbdfe5d4f;
        auVar456._20_4_ = 0x3def251a;
        auVar439._20_4_ = 0x3d9021bb;
        auVar426._20_4_ = 0xbdebd1b8;
        auVar388._20_4_ = 0x3f3504f3;
        auVar334._20_4_ = 0x3f000000;
        auVar301._20_4_ = 0x807fffff;
        auVar272._20_4_ = 0x800000;
        auVar346._8_4_ = 0xffffff81;
        auVar346._0_8_ = 0xffffff81ffffff81;
        auVar487._24_4_ = 0x3e11e9bf;
        auVar468._24_4_ = 0xbdfe5d4f;
        auVar456._24_4_ = 0x3def251a;
        auVar439._24_4_ = 0x3d9021bb;
        auVar426._24_4_ = 0xbdebd1b8;
        auVar388._24_4_ = 0x3f3504f3;
        auVar334._24_4_ = 0x3f000000;
        auVar301._24_4_ = 0x807fffff;
        auVar272._24_4_ = 0x800000;
        auVar487._28_4_ = 0x3e11e9bf;
        auVar468._28_4_ = 0xbdfe5d4f;
        auVar456._28_4_ = 0x3def251a;
        auVar439._28_4_ = 0x3d9021bb;
        auVar426._28_4_ = 0xbdebd1b8;
        auVar388._28_4_ = 0x3f3504f3;
        auVar346._12_4_ = 0xffffff81;
        auVar334._28_4_ = 0x3f000000;
        auVar301._28_4_ = 0x807fffff;
        auVar272._28_4_ = 0x800000;
        pauVar23 = (undefined1 (*) [32])
                   (local_128->cstep * lVar22 * local_128->elemsize + (long)local_128->data);
        if (iVar26 < 8) {
          uVar24 = 0;
        }
        else {
          iVar16 = 7;
          do {
            auVar140 = vmaxps_avx(auVar272,*pauVar23);
            auVar153 = vpsrld_avx(auVar140._0_16_,0x17);
            auVar29 = vpsrld_avx(auVar140._16_16_,0x17);
            auVar140 = vandps_avx(auVar140,auVar301);
            auVar197 = vorps_avx(auVar140,auVar334);
            auVar51 = vcmpps_avx(auVar388,auVar197,2);
            auVar140 = vandnps_avx(auVar51,auVar197);
            auVar72._0_4_ = auVar197._0_4_ + -1.0 + auVar140._0_4_;
            auVar72._4_4_ = auVar197._4_4_ + -1.0 + auVar140._4_4_;
            auVar72._8_4_ = auVar197._8_4_ + -1.0 + auVar140._8_4_;
            auVar72._12_4_ = auVar197._12_4_ + -1.0 + auVar140._12_4_;
            auVar72._16_4_ = auVar197._16_4_ + -1.0 + auVar140._16_4_;
            auVar72._20_4_ = auVar197._20_4_ + -1.0 + auVar140._20_4_;
            auVar72._24_4_ = auVar197._24_4_ + -1.0 + auVar140._24_4_;
            auVar72._28_4_ = auVar197._28_4_ + -1.0 + auVar140._28_4_;
            auVar29 = vpsubd_avx(auVar29,auVar51._16_16_);
            auVar29 = vpaddd_avx(auVar346,auVar29);
            auVar153 = vpsubd_avx(auVar153,auVar51._0_16_);
            auVar153 = vpaddd_avx(auVar346,auVar153);
            auVar143._16_16_ = auVar29;
            auVar143._0_16_ = auVar153;
            auVar172._0_4_ = auVar72._0_4_ * auVar72._0_4_;
            auVar172._4_4_ = auVar72._4_4_ * auVar72._4_4_;
            auVar172._8_4_ = auVar72._8_4_ * auVar72._8_4_;
            auVar172._12_4_ = auVar72._12_4_ * auVar72._12_4_;
            auVar172._16_4_ = auVar72._16_4_ * auVar72._16_4_;
            auVar172._20_4_ = auVar72._20_4_ * auVar72._20_4_;
            auVar172._24_4_ = auVar72._24_4_ * auVar72._24_4_;
            auVar172._28_4_ = 0;
            auVar29 = vfmadd213ps_fma(auVar439,auVar72,auVar426);
            auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar72,auVar456);
            auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar72,auVar468);
            auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar72,auVar487);
            auVar252._8_4_ = 0xbe2aae50;
            auVar252._0_8_ = 0xbe2aae50be2aae50;
            auVar252._12_4_ = 0xbe2aae50;
            auVar252._16_4_ = 0xbe2aae50;
            auVar252._20_4_ = 0xbe2aae50;
            auVar252._24_4_ = 0xbe2aae50;
            auVar252._28_4_ = 0xbe2aae50;
            auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar72,auVar252);
            auVar253._8_4_ = 0x3e4cceac;
            auVar253._0_8_ = 0x3e4cceac3e4cceac;
            auVar253._12_4_ = 0x3e4cceac;
            auVar253._16_4_ = 0x3e4cceac;
            auVar253._20_4_ = 0x3e4cceac;
            auVar253._24_4_ = 0x3e4cceac;
            auVar253._28_4_ = 0x3e4cceac;
            auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar72,auVar253);
            auVar254._8_4_ = 0xbe7ffffc;
            auVar254._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar254._12_4_ = 0xbe7ffffc;
            auVar254._16_4_ = 0xbe7ffffc;
            auVar254._20_4_ = 0xbe7ffffc;
            auVar254._24_4_ = 0xbe7ffffc;
            auVar254._28_4_ = 0xbe7ffffc;
            auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar72,auVar254);
            auVar255._8_4_ = 0x3eaaaaaa;
            auVar255._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar255._12_4_ = 0x3eaaaaaa;
            auVar255._16_4_ = 0x3eaaaaaa;
            auVar255._20_4_ = 0x3eaaaaaa;
            auVar255._24_4_ = 0x3eaaaaaa;
            auVar255._28_4_ = 0x3eaaaaaa;
            auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar72,auVar255);
            auVar201._0_4_ = auVar172._0_4_ * auVar72._0_4_ * auVar29._0_4_;
            auVar201._4_4_ = auVar172._4_4_ * auVar72._4_4_ * auVar29._4_4_;
            auVar201._8_4_ = auVar172._8_4_ * auVar72._8_4_ * auVar29._8_4_;
            auVar201._12_4_ = auVar172._12_4_ * auVar72._12_4_ * auVar29._12_4_;
            auVar201._16_4_ = auVar172._16_4_ * auVar72._16_4_ * 0.0;
            auVar201._20_4_ = auVar172._20_4_ * auVar72._20_4_ * 0.0;
            auVar201._24_4_ = auVar172._24_4_ * auVar72._24_4_ * 0.0;
            auVar201._28_4_ = 0;
            auVar140 = vcvtdq2ps_avx(auVar143);
            auVar256._8_4_ = 0xb95e8083;
            auVar256._0_8_ = 0xb95e8083b95e8083;
            auVar256._12_4_ = 0xb95e8083;
            auVar256._16_4_ = 0xb95e8083;
            auVar256._20_4_ = 0xb95e8083;
            auVar256._24_4_ = 0xb95e8083;
            auVar256._28_4_ = 0xb95e8083;
            auVar29 = vfmadd231ps_fma(auVar201,auVar140,auVar256);
            auVar29 = vfmsub231ps_fma(ZEXT1632(auVar29),auVar334,auVar172);
            auVar51 = vsubps_avx(ZEXT1632(auVar29),auVar72);
            auVar173._8_4_ = 0x3f318000;
            auVar173._0_8_ = 0x3f3180003f318000;
            auVar173._12_4_ = 0x3f318000;
            auVar173._16_4_ = 0x3f318000;
            auVar173._20_4_ = 0x3f318000;
            auVar173._24_4_ = 0x3f318000;
            auVar173._28_4_ = 0x3f318000;
            auVar29 = vfmsub231ps_fma(auVar51,auVar173,auVar140);
            *pauVar23 = ZEXT1632(auVar29);
            pauVar23 = pauVar23 + 1;
            iVar16 = iVar16 + 8;
          } while (iVar16 < iVar26);
          uVar24 = (uint)local_130;
        }
        auVar268._8_4_ = 0x800000;
        auVar268._0_8_ = 0x80000000800000;
        auVar268._12_4_ = 0x800000;
        auVar317._8_4_ = 0x3f000000;
        auVar317._0_8_ = 0x3f0000003f000000;
        auVar317._12_4_ = 0x3f000000;
        auVar347._8_4_ = 0xffffff82;
        auVar347._0_8_ = 0xffffff82ffffff82;
        auVar347._12_4_ = 0xffffff82;
        auVar374._8_4_ = 0x3f3504f3;
        auVar374._0_8_ = 0x3f3504f33f3504f3;
        auVar374._12_4_ = 0x3f3504f3;
        auVar421._8_4_ = 0x3f800000;
        auVar421._0_8_ = 0x3f8000003f800000;
        auVar421._12_4_ = 0x3f800000;
        auVar434._8_4_ = 0xbdebd1b8;
        auVar434._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar434._12_4_ = 0xbdebd1b8;
        auVar449._8_4_ = 0x3d9021bb;
        auVar449._0_8_ = 0x3d9021bb3d9021bb;
        auVar449._12_4_ = 0x3d9021bb;
        auVar465._8_4_ = 0x3def251a;
        auVar465._0_8_ = 0x3def251a3def251a;
        auVar465._12_4_ = 0x3def251a;
        auVar482._8_4_ = 0xbdfe5d4f;
        auVar482._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar482._12_4_ = 0xbdfe5d4f;
        auVar292._8_4_ = 0x3e11e9bf;
        auVar292._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar292._12_4_ = 0x3e11e9bf;
        uVar19 = uVar24 | 3;
        while ((int)uVar19 < iVar26) {
          auVar29 = vmaxps_avx(auVar268,*(undefined1 (*) [16])*pauVar23);
          auVar153 = vpsrld_avx(auVar29,0x17);
          auVar153 = vpaddd_avx(auVar347,auVar153);
          auVar162._8_4_ = 0x807fffff;
          auVar162._0_8_ = 0x807fffff807fffff;
          auVar162._12_4_ = 0x807fffff;
          auVar29 = vandps_avx(auVar29,auVar162);
          auVar258 = vorps_avx(auVar29,auVar317);
          auVar128 = vcvtdq2ps_avx(auVar153);
          auVar153 = vcmpps_avx(auVar258,auVar374,1);
          auVar29 = vandps_avx(auVar153,auVar258);
          auVar46._0_4_ = auVar258._0_4_ + -1.0 + auVar29._0_4_;
          auVar46._4_4_ = auVar258._4_4_ + -1.0 + auVar29._4_4_;
          auVar46._8_4_ = auVar258._8_4_ + -1.0 + auVar29._8_4_;
          auVar46._12_4_ = auVar258._12_4_ + -1.0 + auVar29._12_4_;
          auVar29 = vandps_avx(auVar421,auVar153);
          auVar29 = vsubps_avx(auVar128,auVar29);
          auVar163._0_4_ = auVar46._0_4_ * auVar46._0_4_;
          auVar163._4_4_ = auVar46._4_4_ * auVar46._4_4_;
          auVar163._8_4_ = auVar46._8_4_ * auVar46._8_4_;
          auVar163._12_4_ = auVar46._12_4_ * auVar46._12_4_;
          auVar153 = vfmadd213ps_fma(auVar449,auVar46,auVar434);
          auVar153 = vfmadd213ps_fma(auVar153,auVar46,auVar465);
          auVar153 = vfmadd213ps_fma(auVar153,auVar46,auVar482);
          auVar153 = vfmadd213ps_fma(auVar153,auVar46,auVar292);
          auVar236._8_4_ = 0xbe2aae50;
          auVar236._0_8_ = 0xbe2aae50be2aae50;
          auVar236._12_4_ = 0xbe2aae50;
          auVar153 = vfmadd213ps_fma(auVar153,auVar46,auVar236);
          auVar237._8_4_ = 0x3e4cceac;
          auVar237._0_8_ = 0x3e4cceac3e4cceac;
          auVar237._12_4_ = 0x3e4cceac;
          auVar153 = vfmadd213ps_fma(auVar153,auVar46,auVar237);
          auVar238._8_4_ = 0xbe7ffffc;
          auVar238._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar238._12_4_ = 0xbe7ffffc;
          auVar153 = vfmadd213ps_fma(auVar153,auVar46,auVar238);
          auVar239._8_4_ = 0x3eaaaaaa;
          auVar239._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar239._12_4_ = 0x3eaaaaaa;
          auVar153 = vfmadd213ps_fma(auVar153,auVar46,auVar239);
          auVar191._0_4_ = auVar163._0_4_ * auVar46._0_4_ * auVar153._0_4_;
          auVar191._4_4_ = auVar163._4_4_ * auVar46._4_4_ * auVar153._4_4_;
          auVar191._8_4_ = auVar163._8_4_ * auVar46._8_4_ * auVar153._8_4_;
          auVar191._12_4_ = auVar163._12_4_ * auVar46._12_4_ * auVar153._12_4_;
          auVar240._8_4_ = 0xb95e8083;
          auVar240._0_8_ = 0xb95e8083b95e8083;
          auVar240._12_4_ = 0xb95e8083;
          auVar153 = vfmadd231ps_fma(auVar191,auVar29,auVar240);
          auVar153 = vfmsub231ps_fma(auVar153,auVar317,auVar163);
          auVar153 = vsubps_avx(auVar153,auVar46);
          auVar164._8_4_ = 0x3f318000;
          auVar164._0_8_ = 0x3f3180003f318000;
          auVar164._12_4_ = 0x3f318000;
          auVar29 = vfmsub231ps_fma(auVar153,auVar164,auVar29);
          *(undefined1 (*) [16])*pauVar23 = auVar29;
          pauVar23 = (undefined1 (*) [32])(*pauVar23 + 0x10);
          uVar19 = uVar24 + 7;
          uVar24 = uVar24 + 4;
        }
        auVar29 = vpcmpeqd_avx(auVar268,auVar268);
        if ((int)uVar24 < iVar26) {
          uVar17 = CONCAT44(0,~uVar24 + iVar26);
          auVar47._8_8_ = 0;
          auVar47._0_8_ = uVar17;
          local_a0._0_16_ = vpshufd_avx(auVar47,0x44);
          local_d0 = vpor_avx(local_a0._0_16_,local_f0);
          local_e0 = vpor_avx(local_a0._0_16_,local_f0);
          uVar25 = 0;
          auVar140 = _DAT_005550e0;
          local_a0._16_16_ = local_a0._0_16_;
          do {
            auVar48._8_8_ = 0;
            auVar48._0_8_ = uVar25;
            auVar153 = vpshufd_avx(auVar48,0x44);
            auVar73._16_16_ = auVar153;
            auVar73._0_16_ = auVar153;
            auVar51 = vorps_avx(auVar73,_DAT_005550c0);
            auVar140 = vorps_avx(auVar73,auVar140);
            auVar258 = vpor_avx(local_a0._16_16_,local_f0);
            auVar153 = vpcmpgtq_avx(auVar140._16_16_ ^ local_f0,auVar258);
            auVar128 = vpcmpgtq_avx(auVar140._0_16_ ^ local_f0,local_d0);
            auVar153 = vpackssdw_avx(auVar128,auVar153);
            auVar128 = vpcmpgtq_avx(auVar51._16_16_ ^ local_f0,auVar258);
            auVar134._0_4_ = auVar51._0_4_ ^ local_f0._0_4_;
            auVar134._4_4_ = auVar51._4_4_ ^ local_f0._4_4_;
            auVar134._8_4_ = auVar51._8_4_ ^ local_f0._8_4_;
            auVar134._12_4_ = auVar51._12_4_ ^ local_f0._12_4_;
            auVar258 = vpcmpgtq_avx(auVar134,local_e0);
            auVar128 = vpackssdw_avx(auVar258,auVar128);
            auVar153 = vpackssdw_avx(auVar128 ^ auVar29,auVar153 ^ auVar29);
            auVar128 = vpmovsxwd_avx(auVar153);
            auVar153 = vpunpckhwd_avx(auVar153,auVar153);
            local_c0._16_16_ = auVar153;
            local_c0._0_16_ = auVar128;
            local_120 = vmaskmovps_avx(local_c0,*(undefined1 (*) [32])(*pauVar23 + uVar25 * 4));
            local_150 = local_120._16_16_;
            local_160._0_4_ = logf(local_120._16_4_);
            local_160._4_4_ = extraout_XMM0_Db_09;
            local_160._8_4_ = extraout_XMM0_Dc_09;
            local_160._12_4_ = extraout_XMM0_Dd_09;
            auVar153 = vmovshdup_avx(local_150);
            auVar107._0_4_ = logf(auVar153._0_4_);
            auVar107._4_60_ = extraout_var_29;
            local_160 = vinsertps_avx(local_160,auVar107._0_16_,0x10);
            auVar153 = vpermilpd_avx(local_150,1);
            auVar108._0_4_ = logf(auVar153._0_4_);
            auVar108._4_60_ = extraout_var_30;
            local_160 = vinsertps_avx(local_160,auVar108._0_16_,0x20);
            auVar153 = vpermilps_avx(local_150,0xff);
            auVar109._0_4_ = logf(auVar153._0_4_);
            auVar109._4_60_ = extraout_var_31;
            local_150 = vinsertps_avx(local_160,auVar109._0_16_,0x30);
            local_160._0_4_ = logf((float)local_120._0_4_);
            local_160._4_4_ = extraout_XMM0_Db_10;
            local_160._8_4_ = extraout_XMM0_Dc_10;
            local_160._12_4_ = extraout_XMM0_Dd_10;
            auVar153 = vmovshdup_avx(local_120._0_16_);
            auVar110._0_4_ = logf(auVar153._0_4_);
            auVar110._4_60_ = extraout_var_32;
            local_160 = vinsertps_avx(local_160,auVar110._0_16_,0x10);
            auVar153 = vpermilpd_avx(local_120._0_16_,1);
            auVar111._0_4_ = logf(auVar153._0_4_);
            auVar111._4_60_ = extraout_var_33;
            local_160 = vinsertps_avx(local_160,auVar111._0_16_,0x20);
            auVar153 = vpermilps_avx(local_120._0_16_,0xff);
            auVar112._0_4_ = logf(auVar153._0_4_);
            auVar140 = _DAT_005550e0;
            auVar112._4_60_ = extraout_var_34;
            auVar29 = vpcmpeqd_avx(auVar29,auVar29);
            auVar153 = vinsertps_avx(local_160,auVar112._0_16_,0x30);
            auVar74._16_16_ = local_150;
            auVar74._0_16_ = auVar153;
            auVar51 = vmaskmovps_avx(local_c0,auVar74);
            *(undefined1 (*) [32])(*pauVar23 + uVar25 * 4) = auVar51;
            uVar25 = uVar25 + 8;
          } while ((uVar17 + 8 & 0x1fffffff8) != uVar25);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != local_138);
    }
    break;
  case 9:
    local_130 = (ulong)bottom_top_blob->c;
    if (0 < (long)local_130) {
      iVar26 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_138 = 0;
      local_f0._8_8_ = 0x8000000000000000;
      local_f0._0_8_ = 0x8000000000000000;
      do {
        auVar29 = in_ZMM8._0_16_;
        pfVar21 = (float *)(local_128->cstep * local_138 * local_128->elemsize +
                           (long)local_128->data);
        if (iVar26 < 8) {
          uVar24 = 0;
        }
        else {
          uVar19 = 0;
          do {
            local_80 = *(undefined1 (*) [32])pfVar21;
            afVar54 = (__m256)local_80;
            UnaryOp_x86_fma_functor::unary_op_sin::func_pack8
                      ((unary_op_sin *)&local_161,(__m256 *)local_80);
            auVar29 = in_ZMM8._0_16_;
            *(__m256 *)pfVar21 = afVar54;
            pfVar21 = pfVar21 + 8;
            uVar24 = uVar19 + 8;
            iVar16 = uVar19 + 0xf;
            uVar19 = uVar24;
          } while (iVar16 < iVar26);
        }
        uVar19 = uVar24 | 3;
        auVar29 = vpcmpeqd_avx(auVar29,auVar29);
        in_ZMM8 = ZEXT1664(auVar29);
        auVar393._8_4_ = 2;
        auVar393._0_8_ = 0x200000002;
        auVar393._12_4_ = 2;
        auVar443._8_4_ = 0xbf490000;
        auVar443._0_8_ = 0xbf490000bf490000;
        auVar443._12_4_ = 0xbf490000;
        auVar460._8_4_ = 0xb97da000;
        auVar460._0_8_ = 0xb97da000b97da000;
        auVar460._12_4_ = 0xb97da000;
        auVar473._8_4_ = 0xb3222169;
        auVar473._0_8_ = 0xb3222169b3222169;
        auVar473._12_4_ = 0xb3222169;
        auVar309._8_4_ = 0x37ccf5ce;
        auVar309._0_8_ = 0x37ccf5ce37ccf5ce;
        auVar309._12_4_ = 0x37ccf5ce;
        auVar411._8_4_ = 0x3d2aaaa5;
        auVar411._0_8_ = 0x3d2aaaa53d2aaaa5;
        auVar411._12_4_ = 0x3d2aaaa5;
        auVar359._8_4_ = 0x3f000000;
        auVar359._0_8_ = 0x3f0000003f000000;
        auVar359._12_4_ = 0x3f000000;
        while ((int)uVar19 < iVar26) {
          auVar122._8_4_ = 0x7fffffff;
          auVar122._0_8_ = 0x7fffffff7fffffff;
          auVar122._12_4_ = 0x7fffffff;
          auVar153 = vandps_avx(*(undefined1 (*) [16])pfVar21,auVar122);
          auVar123._0_4_ = (int)(auVar153._0_4_ * 1.2732395);
          auVar123._4_4_ = (int)(auVar153._4_4_ * 1.2732395);
          auVar123._8_4_ = (int)(auVar153._8_4_ * 1.2732395);
          auVar123._12_4_ = (int)(auVar153._12_4_ * 1.2732395);
          auVar258 = vpsubd_avx(auVar123,auVar29);
          auVar182._8_4_ = 0xfffffffe;
          auVar182._0_8_ = 0xfffffffefffffffe;
          auVar182._12_4_ = 0xfffffffe;
          auVar128 = vpand_avx(auVar258,auVar182);
          auVar128 = vcvtdq2ps_avx(auVar128);
          auVar153 = vfmadd231ps_fma(auVar153,auVar128,auVar443);
          auVar153 = vfmadd231ps_fma(auVar153,auVar128,auVar460);
          auVar128 = vfmadd231ps_fma(auVar153,auVar473,auVar128);
          auVar183._0_4_ = auVar128._0_4_ * auVar128._0_4_;
          auVar183._4_4_ = auVar128._4_4_ * auVar128._4_4_;
          auVar183._8_4_ = auVar128._8_4_ * auVar128._8_4_;
          auVar183._12_4_ = auVar128._12_4_ * auVar128._12_4_;
          auVar260._8_4_ = 0xbab6061a;
          auVar260._0_8_ = 0xbab6061abab6061a;
          auVar260._12_4_ = 0xbab6061a;
          auVar153 = vfmadd213ps_fma(auVar309,auVar183,auVar260);
          auVar153 = vfmadd213ps_fma(auVar153,auVar183,auVar411);
          auVar218._0_4_ = auVar183._0_4_ * auVar183._0_4_ * auVar153._0_4_;
          auVar218._4_4_ = auVar183._4_4_ * auVar183._4_4_ * auVar153._4_4_;
          auVar218._8_4_ = auVar183._8_4_ * auVar183._8_4_ * auVar153._8_4_;
          auVar218._12_4_ = auVar183._12_4_ * auVar183._12_4_ * auVar153._12_4_;
          auVar343 = vfnmadd231ps_fma(auVar218,auVar183,auVar359);
          auVar261._8_4_ = 0xb94ca1f9;
          auVar261._0_8_ = 0xb94ca1f9b94ca1f9;
          auVar261._12_4_ = 0xb94ca1f9;
          auVar280._8_4_ = 0x3c08839e;
          auVar280._0_8_ = 0x3c08839e3c08839e;
          auVar280._12_4_ = 0x3c08839e;
          auVar153 = vfmadd213ps_fma(auVar261,auVar183,auVar280);
          auVar281._8_4_ = 0xbe2aaaa3;
          auVar281._0_8_ = 0xbe2aaaa3be2aaaa3;
          auVar281._12_4_ = 0xbe2aaaa3;
          auVar153 = vfmadd213ps_fma(auVar153,auVar183,auVar281);
          auVar184._0_4_ = auVar153._0_4_ * auVar183._0_4_;
          auVar184._4_4_ = auVar153._4_4_ * auVar183._4_4_;
          auVar184._8_4_ = auVar153._8_4_ * auVar183._8_4_;
          auVar184._12_4_ = auVar153._12_4_ * auVar183._12_4_;
          auVar128 = vfmadd213ps_fma(auVar184,auVar128,auVar128);
          auVar153 = vpand_avx(auVar393,auVar258);
          auVar153 = vpcmpeqd_avx(auVar153,_DAT_00552030);
          auVar219._0_4_ = auVar343._0_4_ + 1.0;
          auVar219._4_4_ = auVar343._4_4_ + 1.0;
          auVar219._8_4_ = auVar343._8_4_ + 1.0;
          auVar219._12_4_ = auVar343._12_4_ + 1.0;
          auVar153 = vblendvps_avx(auVar219,auVar128,auVar153);
          auVar128 = vpslld_avx(auVar258,0x1d);
          auVar124._8_4_ = 0x80000000;
          auVar124._0_8_ = 0x8000000080000000;
          auVar124._12_4_ = 0x80000000;
          auVar128 = vpand_avx(auVar128 ^ *(undefined1 (*) [16])pfVar21,auVar124);
          *(undefined1 (*) [16])pfVar21 = auVar128 ^ auVar153;
          pfVar21 = pfVar21 + 4;
          uVar19 = uVar24 + 7;
          uVar24 = uVar24 + 4;
        }
        if ((int)uVar24 < iVar26) {
          uVar17 = CONCAT44(0,~uVar24 + iVar26);
          auVar34._8_8_ = 0;
          auVar34._0_8_ = uVar17;
          auVar29 = vpshufd_avx(auVar34,0x44);
          local_a0._16_16_ = auVar29;
          local_a0._0_16_ = auVar29;
          local_d0 = vpor_avx(auVar29,local_f0);
          local_e0 = vpor_avx(auVar29,local_f0);
          uVar25 = 0;
          auVar140 = _DAT_005550e0;
          do {
            auVar35._8_8_ = 0;
            auVar35._0_8_ = uVar25;
            auVar29 = vpshufd_avx(auVar35,0x44);
            auVar58._16_16_ = auVar29;
            auVar58._0_16_ = auVar29;
            auVar51 = vorps_avx(auVar58,_DAT_005550c0);
            auVar140 = vorps_avx(auVar58,auVar140);
            auVar128 = vpor_avx(local_a0._16_16_,local_f0);
            auVar29 = vpcmpgtq_avx(auVar140._16_16_ ^ local_f0,auVar128);
            auVar153 = vpcmpgtq_avx(auVar140._0_16_ ^ local_f0,local_d0);
            auVar29 = vpackssdw_avx(auVar153,auVar29);
            auVar258 = in_ZMM8._0_16_;
            auVar153 = vpcmpgtq_avx(auVar51._16_16_ ^ local_f0,auVar128);
            auVar125._0_4_ = auVar51._0_4_ ^ local_f0._0_4_;
            auVar125._4_4_ = auVar51._4_4_ ^ local_f0._4_4_;
            auVar125._8_4_ = auVar51._8_4_ ^ local_f0._8_4_;
            auVar125._12_4_ = auVar51._12_4_ ^ local_f0._12_4_;
            auVar128 = vpcmpgtq_avx(auVar125,local_e0);
            auVar153 = vpackssdw_avx(auVar128,auVar153);
            auVar29 = vpackssdw_avx(auVar258 ^ auVar153,auVar258 ^ auVar29);
            auVar153 = vpmovsxwd_avx(auVar29);
            auVar29 = vpunpckhwd_avx(auVar29,auVar29);
            local_c0._16_16_ = auVar29;
            local_c0._0_16_ = auVar153;
            local_120 = vmaskmovps_avx(local_c0,*(undefined1 (*) [32])(pfVar21 + uVar25));
            local_150 = local_120._16_16_;
            local_160._0_4_ = sinf(local_120._16_4_);
            local_160._4_4_ = extraout_XMM0_Db_01;
            local_160._8_4_ = extraout_XMM0_Dc_01;
            local_160._12_4_ = extraout_XMM0_Dd_01;
            auVar29 = vmovshdup_avx(local_150);
            auVar84._0_4_ = sinf(auVar29._0_4_);
            auVar84._4_60_ = extraout_var_05;
            local_160 = vinsertps_avx(local_160,auVar84._0_16_,0x10);
            auVar29 = vpermilpd_avx(local_150,1);
            auVar85._0_4_ = sinf(auVar29._0_4_);
            auVar85._4_60_ = extraout_var_06;
            local_160 = vinsertps_avx(local_160,auVar85._0_16_,0x20);
            auVar29 = vpermilps_avx(local_150,0xff);
            auVar86._0_4_ = sinf(auVar29._0_4_);
            auVar86._4_60_ = extraout_var_07;
            local_150 = vinsertps_avx(local_160,auVar86._0_16_,0x30);
            local_160._0_4_ = sinf((float)local_120._0_4_);
            local_160._4_4_ = extraout_XMM0_Db_02;
            local_160._8_4_ = extraout_XMM0_Dc_02;
            local_160._12_4_ = extraout_XMM0_Dd_02;
            auVar29 = vmovshdup_avx(local_120._0_16_);
            auVar87._0_4_ = sinf(auVar29._0_4_);
            auVar87._4_60_ = extraout_var_08;
            local_160 = vinsertps_avx(local_160,auVar87._0_16_,0x10);
            auVar29 = vpermilpd_avx(local_120._0_16_,1);
            auVar88._0_4_ = sinf(auVar29._0_4_);
            auVar88._4_60_ = extraout_var_09;
            local_160 = vinsertps_avx(local_160,auVar88._0_16_,0x20);
            auVar29 = vpermilps_avx(local_120._0_16_,0xff);
            auVar89._0_4_ = sinf(auVar29._0_4_);
            auVar140 = _DAT_005550e0;
            auVar89._4_60_ = extraout_var_10;
            auVar29 = vpcmpeqd_avx(auVar258,auVar258);
            in_ZMM8 = ZEXT1664(auVar29);
            auVar29 = vinsertps_avx(local_160,auVar89._0_16_,0x30);
            auVar59._16_16_ = local_150;
            auVar59._0_16_ = auVar29;
            auVar51 = vmaskmovps_avx(local_c0,auVar59);
            *(undefined1 (*) [32])(pfVar21 + uVar25) = auVar51;
            uVar25 = uVar25 + 8;
          } while ((uVar17 + 8 & 0x1fffffff8) != uVar25);
        }
        local_138 = local_138 + 1;
      } while (local_138 != local_130);
    }
    break;
  case 10:
    local_130 = (ulong)bottom_top_blob->c;
    if (0 < (long)local_130) {
      iVar26 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_138 = 0;
      local_f0._8_8_ = 0x8000000000000000;
      local_f0._0_8_ = 0x8000000000000000;
      do {
        auVar29 = in_ZMM7._0_16_;
        pfVar21 = (float *)(local_128->cstep * local_138 * local_128->elemsize +
                           (long)local_128->data);
        if (iVar26 < 8) {
          uVar24 = 0;
        }
        else {
          uVar19 = 0;
          do {
            local_80 = *(undefined1 (*) [32])pfVar21;
            afVar54 = (__m256)local_80;
            UnaryOp_x86_fma_functor::unary_op_cos::func_pack8
                      ((unary_op_cos *)&local_161,(__m256 *)local_80);
            auVar29 = in_ZMM7._0_16_;
            *(__m256 *)pfVar21 = afVar54;
            pfVar21 = pfVar21 + 8;
            uVar24 = uVar19 + 8;
            iVar16 = uVar19 + 0xf;
            uVar19 = uVar24;
          } while (iVar16 < iVar26);
        }
        uVar19 = uVar24 | 3;
        auVar29 = vpcmpeqd_avx(auVar29,auVar29);
        in_ZMM7 = ZEXT1664(auVar29);
        auVar345._8_4_ = 0xfffffffe;
        auVar345._0_8_ = 0xfffffffefffffffe;
        auVar345._12_4_ = 0xfffffffe;
        auVar373._8_4_ = 2;
        auVar373._0_8_ = 0x200000002;
        auVar373._12_4_ = 2;
        auVar433._8_4_ = 0xb97da000;
        auVar433._0_8_ = 0xb97da000b97da000;
        auVar433._12_4_ = 0xb97da000;
        auVar448._8_4_ = 0xb3222169;
        auVar448._0_8_ = 0xb3222169b3222169;
        auVar448._12_4_ = 0xb3222169;
        auVar464._8_4_ = 0xbab6061a;
        auVar464._0_8_ = 0xbab6061abab6061a;
        auVar464._12_4_ = 0xbab6061a;
        auVar481._8_4_ = 0x37ccf5ce;
        auVar481._0_8_ = 0x37ccf5ce37ccf5ce;
        auVar481._12_4_ = 0x37ccf5ce;
        auVar420._8_4_ = 0x3c08839e;
        auVar420._0_8_ = 0x3c08839e3c08839e;
        auVar420._12_4_ = 0x3c08839e;
        auVar267._8_4_ = 0x80000000;
        auVar267._0_8_ = 0x8000000080000000;
        auVar267._12_4_ = 0x80000000;
        while ((int)uVar19 < iVar26) {
          auVar43._8_4_ = 0x7fffffff;
          auVar43._0_8_ = 0x7fffffff7fffffff;
          auVar43._12_4_ = 0x7fffffff;
          auVar153 = vandps_avx(auVar43,*(undefined1 (*) [16])pfVar21);
          auVar132._0_4_ = (int)(auVar153._0_4_ * 1.2732395);
          auVar132._4_4_ = (int)(auVar153._4_4_ * 1.2732395);
          auVar132._8_4_ = (int)(auVar153._8_4_ * 1.2732395);
          auVar132._12_4_ = (int)(auVar153._12_4_ * 1.2732395);
          auVar128 = vpsubd_avx(auVar132,auVar29);
          auVar258 = vpand_avx(auVar345,auVar128);
          auVar128 = vcvtdq2ps_avx(auVar258);
          auVar188._8_4_ = 0xbf490000;
          auVar188._0_8_ = 0xbf490000bf490000;
          auVar188._12_4_ = 0xbf490000;
          auVar153 = vfmadd231ps_fma(auVar153,auVar128,auVar188);
          auVar153 = vfmadd231ps_fma(auVar153,auVar128,auVar433);
          auVar343 = vfmadd231ps_fma(auVar153,auVar448,auVar128);
          auVar160._0_4_ = auVar343._0_4_ * auVar343._0_4_;
          auVar160._4_4_ = auVar343._4_4_ * auVar343._4_4_;
          auVar160._8_4_ = auVar343._8_4_ * auVar343._8_4_;
          auVar160._12_4_ = auVar343._12_4_ * auVar343._12_4_;
          auVar153 = vfmadd213ps_fma(auVar481,auVar160,auVar464);
          auVar233._8_4_ = 0x3d2aaaa5;
          auVar233._0_8_ = 0x3d2aaaa53d2aaaa5;
          auVar233._12_4_ = 0x3d2aaaa5;
          auVar153 = vfmadd213ps_fma(auVar153,auVar160,auVar233);
          auVar189._0_4_ = auVar160._0_4_ * auVar160._0_4_ * auVar153._0_4_;
          auVar189._4_4_ = auVar160._4_4_ * auVar160._4_4_ * auVar153._4_4_;
          auVar189._8_4_ = auVar160._8_4_ * auVar160._8_4_ * auVar153._8_4_;
          auVar189._12_4_ = auVar160._12_4_ * auVar160._12_4_ * auVar153._12_4_;
          auVar234._8_4_ = 0x3f000000;
          auVar234._0_8_ = 0x3f0000003f000000;
          auVar234._12_4_ = 0x3f000000;
          auVar369 = vfnmadd231ps_fma(auVar189,auVar160,auVar234);
          auVar235._8_4_ = 0xb94ca1f9;
          auVar235._0_8_ = 0xb94ca1f9b94ca1f9;
          auVar235._12_4_ = 0xb94ca1f9;
          auVar153 = vfmadd213ps_fma(auVar235,auVar160,auVar420);
          auVar291._8_4_ = 0xbe2aaaa3;
          auVar291._0_8_ = 0xbe2aaaa3be2aaaa3;
          auVar291._12_4_ = 0xbe2aaaa3;
          auVar153 = vfmadd213ps_fma(auVar153,auVar160,auVar291);
          auVar161._0_4_ = auVar153._0_4_ * auVar160._0_4_;
          auVar161._4_4_ = auVar153._4_4_ * auVar160._4_4_;
          auVar161._8_4_ = auVar153._8_4_ * auVar160._8_4_;
          auVar161._12_4_ = auVar153._12_4_ * auVar160._12_4_;
          auVar128 = vpaddd_avx(auVar345,auVar258);
          auVar258 = vfmadd213ps_fma(auVar161,auVar343,auVar343);
          auVar153 = vpand_avx(auVar373,auVar128);
          auVar153 = vpcmpeqd_avx(auVar153,_DAT_00552030);
          auVar190._0_4_ = auVar369._0_4_ + 1.0;
          auVar190._4_4_ = auVar369._4_4_ + 1.0;
          auVar190._8_4_ = auVar369._8_4_ + 1.0;
          auVar190._12_4_ = auVar369._12_4_ + 1.0;
          auVar153 = vblendvps_avx(auVar190,auVar258,auVar153);
          auVar128 = vpslld_avx(auVar128,0x1d);
          auVar128 = vpand_avx(auVar128,auVar267);
          *(undefined1 (*) [16])pfVar21 = auVar128 ^ auVar267 ^ auVar153;
          pfVar21 = pfVar21 + 4;
          uVar19 = uVar24 + 7;
          uVar24 = uVar24 + 4;
        }
        if ((int)uVar24 < iVar26) {
          uVar17 = CONCAT44(0,~uVar24 + iVar26);
          auVar44._8_8_ = 0;
          auVar44._0_8_ = uVar17;
          auVar29 = vpshufd_avx(auVar44,0x44);
          local_a0._16_16_ = auVar29;
          local_a0._0_16_ = auVar29;
          local_d0 = vpor_avx(auVar29,local_f0);
          local_e0 = vpor_avx(auVar29,local_f0);
          uVar25 = 0;
          auVar140 = _DAT_005550e0;
          do {
            auVar45._8_8_ = 0;
            auVar45._0_8_ = uVar25;
            auVar29 = vpshufd_avx(auVar45,0x44);
            auVar70._16_16_ = auVar29;
            auVar70._0_16_ = auVar29;
            auVar51 = vorps_avx(auVar70,_DAT_005550c0);
            auVar140 = vorps_avx(auVar70,auVar140);
            auVar128 = vpor_avx(local_a0._16_16_,local_f0);
            auVar29 = vpcmpgtq_avx(auVar140._16_16_ ^ local_f0,auVar128);
            auVar153 = vpcmpgtq_avx(auVar140._0_16_ ^ local_f0,local_d0);
            auVar29 = vpackssdw_avx(auVar153,auVar29);
            auVar258 = in_ZMM7._0_16_;
            auVar153 = vpcmpgtq_avx(auVar51._16_16_ ^ local_f0,auVar128);
            auVar133._0_4_ = auVar51._0_4_ ^ local_f0._0_4_;
            auVar133._4_4_ = auVar51._4_4_ ^ local_f0._4_4_;
            auVar133._8_4_ = auVar51._8_4_ ^ local_f0._8_4_;
            auVar133._12_4_ = auVar51._12_4_ ^ local_f0._12_4_;
            auVar128 = vpcmpgtq_avx(auVar133,local_e0);
            auVar153 = vpackssdw_avx(auVar128,auVar153);
            auVar29 = vpackssdw_avx(auVar153 ^ auVar258,auVar29 ^ auVar258);
            auVar153 = vpmovsxwd_avx(auVar29);
            auVar29 = vpunpckhwd_avx(auVar29,auVar29);
            local_c0._16_16_ = auVar29;
            local_c0._0_16_ = auVar153;
            local_120 = vmaskmovps_avx(local_c0,*(undefined1 (*) [32])(pfVar21 + uVar25));
            local_150 = local_120._16_16_;
            local_160._0_4_ = cosf(local_120._16_4_);
            local_160._4_4_ = extraout_XMM0_Db_07;
            local_160._8_4_ = extraout_XMM0_Dc_07;
            local_160._12_4_ = extraout_XMM0_Dd_07;
            auVar29 = vmovshdup_avx(local_150);
            auVar101._0_4_ = cosf(auVar29._0_4_);
            auVar101._4_60_ = extraout_var_23;
            local_160 = vinsertps_avx(local_160,auVar101._0_16_,0x10);
            auVar29 = vpermilpd_avx(local_150,1);
            auVar102._0_4_ = cosf(auVar29._0_4_);
            auVar102._4_60_ = extraout_var_24;
            local_160 = vinsertps_avx(local_160,auVar102._0_16_,0x20);
            auVar29 = vpermilps_avx(local_150,0xff);
            auVar103._0_4_ = cosf(auVar29._0_4_);
            auVar103._4_60_ = extraout_var_25;
            local_150 = vinsertps_avx(local_160,auVar103._0_16_,0x30);
            local_160._0_4_ = cosf((float)local_120._0_4_);
            local_160._4_4_ = extraout_XMM0_Db_08;
            local_160._8_4_ = extraout_XMM0_Dc_08;
            local_160._12_4_ = extraout_XMM0_Dd_08;
            auVar29 = vmovshdup_avx(local_120._0_16_);
            auVar104._0_4_ = cosf(auVar29._0_4_);
            auVar104._4_60_ = extraout_var_26;
            local_160 = vinsertps_avx(local_160,auVar104._0_16_,0x10);
            auVar29 = vpermilpd_avx(local_120._0_16_,1);
            auVar105._0_4_ = cosf(auVar29._0_4_);
            auVar105._4_60_ = extraout_var_27;
            local_160 = vinsertps_avx(local_160,auVar105._0_16_,0x20);
            auVar29 = vpermilps_avx(local_120._0_16_,0xff);
            auVar106._0_4_ = cosf(auVar29._0_4_);
            auVar140 = _DAT_005550e0;
            auVar106._4_60_ = extraout_var_28;
            auVar29 = vpcmpeqd_avx(auVar258,auVar258);
            in_ZMM7 = ZEXT1664(auVar29);
            auVar29 = vinsertps_avx(local_160,auVar106._0_16_,0x30);
            auVar71._16_16_ = local_150;
            auVar71._0_16_ = auVar29;
            auVar51 = vmaskmovps_avx(local_c0,auVar71);
            *(undefined1 (*) [32])(pfVar21 + uVar25) = auVar51;
            uVar25 = uVar25 + 8;
          } while ((uVar17 + 8 & 0x1fffffff8) != uVar25);
        }
        local_138 = local_138 + 1;
      } while (local_138 != local_130);
    }
    break;
  case 0xb:
    local_60 = (long)bottom_top_blob->c;
    if (0 < local_60) {
      iVar26 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_130 = 0;
      local_f0._8_8_ = 0x8000000000000000;
      local_f0._0_8_ = 0x8000000000000000;
      local_138 = CONCAT44(local_138._4_4_,iVar26);
      do {
        pfVar21 = (float *)(local_128->cstep * local_130 * local_128->elemsize +
                           (long)local_128->data);
        iVar16 = (int)local_138;
        if (iVar26 < 8) {
          uVar24 = 0;
        }
        else {
          uVar19 = 0;
          do {
            local_80 = *(undefined1 (*) [32])pfVar21;
            afVar54 = (__m256)local_80;
            UnaryOp_x86_fma_functor::unary_op_tan::func_pack8(&local_161,(__m256 *)local_80);
            *(__m256 *)pfVar21 = afVar54;
            pfVar21 = pfVar21 + 8;
            uVar24 = uVar19 + 8;
            iVar26 = uVar19 + 0xf;
            uVar19 = uVar24;
          } while (iVar26 < iVar16);
        }
        auVar29 = in_ZMM5._0_16_;
        uVar19 = uVar24 | 3;
        while ((int)uVar19 < iVar16) {
          local_80._0_16_ = *(undefined1 (*) [16])pfVar21;
          auVar113 = ZEXT856(*(ulong *)(pfVar21 + 2));
          in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
          afVar488 = UnaryOp_x86_fma_functor::unary_op_tan::func_pack4
                               (&local_161,(__m128 *)local_80);
          auVar29 = in_ZMM5._0_16_;
          auVar77._0_8_ = afVar488._0_8_;
          auVar77._8_56_ = auVar113;
          *(undefined1 (*) [16])pfVar21 = auVar77._0_16_;
          pfVar21 = pfVar21 + 4;
          uVar19 = uVar24 + 7;
          uVar24 = uVar24 + 4;
        }
        auVar29 = vpcmpeqd_avx(auVar29,auVar29);
        in_ZMM5 = ZEXT1664(auVar29);
        if ((int)uVar24 < iVar16) {
          uVar17 = CONCAT44(0,~uVar24 + (int)local_138);
          auVar32._8_8_ = 0;
          auVar32._0_8_ = uVar17;
          auVar153 = vpshufd_avx(auVar32,0x44);
          auVar29 = vpor_avx(auVar153,local_f0);
          local_a0._0_16_ = auVar29;
          local_d0 = vpor_avx(auVar153,local_f0);
          local_e0 = vpor_avx(auVar153,local_f0);
          uVar25 = 0;
          auVar140 = _DAT_005550c0;
          auVar51 = _DAT_005550e0;
          do {
            auVar33._8_8_ = 0;
            auVar33._0_8_ = uVar25;
            auVar29 = vpshufd_avx(auVar33,0x44);
            auVar55._16_16_ = auVar29;
            auVar55._0_16_ = auVar29;
            auVar140 = vorps_avx(auVar55,auVar140);
            auVar51 = vorps_avx(auVar55,auVar51);
            auVar29 = vpcmpgtq_avx(auVar51._16_16_ ^ local_f0,local_a0._0_16_);
            auVar153 = vpcmpgtq_avx(auVar51._0_16_ ^ local_f0,local_d0);
            auVar29 = vpackssdw_avx(auVar153,auVar29);
            auVar258 = in_ZMM5._0_16_;
            auVar153 = vpcmpgtq_avx(auVar140._16_16_ ^ local_f0,local_a0._0_16_);
            auVar119._0_4_ = auVar140._0_4_ ^ local_f0._0_4_;
            auVar119._4_4_ = auVar140._4_4_ ^ local_f0._4_4_;
            auVar119._8_4_ = auVar140._8_4_ ^ local_f0._8_4_;
            auVar119._12_4_ = auVar140._12_4_ ^ local_f0._12_4_;
            auVar128 = vpcmpgtq_avx(auVar119,local_e0);
            auVar153 = vpackssdw_avx(auVar128,auVar153);
            auVar29 = vpackssdw_avx(auVar153 ^ auVar258,auVar29 ^ auVar258);
            auVar153 = vpmovsxwd_avx(auVar29);
            auVar29 = vpunpckhwd_avx(auVar29,auVar29);
            local_c0._16_16_ = auVar29;
            local_c0._0_16_ = auVar153;
            local_120 = vmaskmovps_avx(local_c0,*(undefined1 (*) [32])(pfVar21 + uVar25));
            local_150 = local_120._16_16_;
            local_160._0_4_ = tanf(local_120._16_4_);
            local_160._4_4_ = extraout_XMM0_Db;
            local_160._8_4_ = extraout_XMM0_Dc;
            local_160._12_4_ = extraout_XMM0_Dd;
            auVar29 = vmovshdup_avx(local_150);
            auVar78._0_4_ = tanf(auVar29._0_4_);
            auVar78._4_60_ = extraout_var;
            local_160 = vinsertps_avx(local_160,auVar78._0_16_,0x10);
            auVar29 = vpermilpd_avx(local_150,1);
            auVar79._0_4_ = tanf(auVar29._0_4_);
            auVar79._4_60_ = extraout_var_00;
            local_160 = vinsertps_avx(local_160,auVar79._0_16_,0x20);
            auVar29 = vpermilps_avx(local_150,0xff);
            auVar80._0_4_ = tanf(auVar29._0_4_);
            auVar80._4_60_ = extraout_var_01;
            local_150 = vinsertps_avx(local_160,auVar80._0_16_,0x30);
            local_160._0_4_ = tanf((float)local_120._0_4_);
            local_160._4_4_ = extraout_XMM0_Db_00;
            local_160._8_4_ = extraout_XMM0_Dc_00;
            local_160._12_4_ = extraout_XMM0_Dd_00;
            auVar29 = vmovshdup_avx(local_120._0_16_);
            auVar81._0_4_ = tanf(auVar29._0_4_);
            auVar81._4_60_ = extraout_var_02;
            local_160 = vinsertps_avx(local_160,auVar81._0_16_,0x10);
            auVar29 = vpermilpd_avx(local_120._0_16_,1);
            auVar82._0_4_ = tanf(auVar29._0_4_);
            auVar82._4_60_ = extraout_var_03;
            local_160 = vinsertps_avx(local_160,auVar82._0_16_,0x20);
            auVar29 = vpermilps_avx(local_120._0_16_,0xff);
            auVar83._0_4_ = tanf(auVar29._0_4_);
            auVar51 = _DAT_005550e0;
            auVar140 = _DAT_005550c0;
            auVar83._4_60_ = extraout_var_04;
            auVar29 = vpcmpeqd_avx(auVar258,auVar258);
            in_ZMM5 = ZEXT1664(auVar29);
            auVar29 = vinsertps_avx(local_160,auVar83._0_16_,0x30);
            auVar56._16_16_ = local_150;
            auVar56._0_16_ = auVar29;
            auVar197 = vmaskmovps_avx(local_c0,auVar56);
            *(undefined1 (*) [32])(pfVar21 + uVar25) = auVar197;
            uVar25 = uVar25 + 8;
          } while ((uVar17 + 8 & 0x1fffffff8) != uVar25);
        }
        local_130 = local_130 + 1;
        iVar26 = (int)local_138;
      } while (local_130 != local_60);
    }
    break;
  case 0xc:
    local_120._0_8_ = (long)bottom_top_blob->c;
    if (0 < (long)bottom_top_blob->c) {
      uVar24 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_150._0_4_ = uVar24 & 0xfffffff8;
      lVar22 = 0;
      do {
        auVar453._8_4_ = 0x3d2dbdcf;
        auVar453._0_8_ = 0x3d2dbdcf3d2dbdcf;
        auVar437._8_4_ = 0x80000000;
        auVar437._0_8_ = 0x8000000080000000;
        auVar422._8_4_ = 0xc0400000;
        auVar422._0_8_ = 0xc0400000c0400000;
        auVar401._8_4_ = 0x3f800000;
        auVar401._0_8_ = 0x3f8000003f800000;
        auVar379._8_4_ = 0x3f000000;
        auVar379._0_8_ = 0x3f0000003f000000;
        auVar348._8_4_ = 0x7fffffff;
        auVar348._0_8_ = 0x7fffffff7fffffff;
        auVar138._8_4_ = 0x3d3a73d8;
        auVar138._0_8_ = 0x3d3a73d83d3a73d8;
        auVar57._8_4_ = 0x800000;
        auVar57._0_8_ = 0x80000000800000;
        auVar453._12_4_ = 0x3d2dbdcf;
        auVar437._12_4_ = 0x80000000;
        auVar422._12_4_ = 0xc0400000;
        auVar401._12_4_ = 0x3f800000;
        auVar379._12_4_ = 0x3f000000;
        auVar348._12_4_ = 0x7fffffff;
        auVar138._12_4_ = 0x3d3a73d8;
        auVar57._12_4_ = 0x800000;
        auVar453._16_4_ = 0x3d2dbdcf;
        auVar437._16_4_ = 0x80000000;
        auVar422._16_4_ = 0xc0400000;
        auVar401._16_4_ = 0x3f800000;
        auVar379._16_4_ = 0x3f000000;
        auVar348._16_4_ = 0x7fffffff;
        auVar138._16_4_ = 0x3d3a73d8;
        auVar57._16_4_ = 0x800000;
        auVar453._20_4_ = 0x3d2dbdcf;
        auVar437._20_4_ = 0x80000000;
        auVar422._20_4_ = 0xc0400000;
        auVar401._20_4_ = 0x3f800000;
        auVar379._20_4_ = 0x3f000000;
        auVar348._20_4_ = 0x7fffffff;
        auVar138._20_4_ = 0x3d3a73d8;
        auVar57._20_4_ = 0x800000;
        auVar453._24_4_ = 0x3d2dbdcf;
        auVar437._24_4_ = 0x80000000;
        auVar422._24_4_ = 0xc0400000;
        auVar401._24_4_ = 0x3f800000;
        auVar379._24_4_ = 0x3f000000;
        auVar348._24_4_ = 0x7fffffff;
        auVar138._24_4_ = 0x3d3a73d8;
        auVar57._24_4_ = 0x800000;
        auVar453._28_4_ = 0x3d2dbdcf;
        auVar437._28_4_ = 0x80000000;
        auVar422._28_4_ = 0xc0400000;
        auVar401._28_4_ = 0x3f800000;
        auVar379._28_4_ = 0x3f000000;
        auVar348._28_4_ = 0x7fffffff;
        auVar138._28_4_ = 0x3d3a73d8;
        auVar57._28_4_ = 0x800000;
        pauVar23 = (undefined1 (*) [32])
                   (local_128->cstep * lVar22 * local_128->elemsize + (long)local_128->data);
        if ((int)uVar24 < 8) {
          uVar19 = 0;
        }
        else {
          iVar26 = 7;
          do {
            auVar296._8_4_ = 0x3e2aaaf8;
            auVar296._0_8_ = 0x3e2aaaf83e2aaaf8;
            auVar296._12_4_ = 0x3e2aaaf8;
            auVar296._16_4_ = 0x3e2aaaf8;
            auVar296._20_4_ = 0x3e2aaaf8;
            auVar296._24_4_ = 0x3e2aaaf8;
            auVar296._28_4_ = 0x3e2aaaf8;
            auVar140 = vandps_avx(auVar348,*pauVar23);
            auVar153 = vfnmadd213ps_fma(auVar379,auVar140,auVar379);
            auVar51 = vrsqrtps_avx(ZEXT1632(auVar153));
            auVar271 = vcmpps_avx(auVar379,auVar140,1);
            auVar274._0_4_ = auVar153._0_4_ * auVar51._0_4_;
            auVar274._4_4_ = auVar153._4_4_ * auVar51._4_4_;
            auVar274._8_4_ = auVar153._8_4_ * auVar51._8_4_;
            auVar274._12_4_ = auVar153._12_4_ * auVar51._12_4_;
            auVar274._16_4_ = auVar51._16_4_ * 0.0;
            auVar274._20_4_ = auVar51._20_4_ * 0.0;
            auVar274._28_36_ = in_ZMM5._28_36_;
            auVar274._24_4_ = auVar51._24_4_ * 0.0;
            auVar29 = vfmadd213ps_fma(auVar51,auVar274._0_32_,auVar422);
            auVar195._0_4_ = auVar274._0_4_ * -0.5 * auVar29._0_4_;
            auVar195._4_4_ = auVar274._4_4_ * -0.5 * auVar29._4_4_;
            auVar195._8_4_ = auVar274._8_4_ * -0.5 * auVar29._8_4_;
            auVar195._12_4_ = auVar274._12_4_ * -0.5 * auVar29._12_4_;
            auVar195._16_4_ = auVar274._16_4_ * -0.5 * 0.0;
            auVar195._20_4_ = auVar274._20_4_ * -0.5 * 0.0;
            auVar195._24_4_ = auVar274._24_4_ * -0.5 * 0.0;
            auVar195._28_4_ = 0;
            auVar51 = vandps_avx(auVar348,ZEXT1632(auVar153));
            auVar51 = vcmpps_avx(auVar57,auVar51,2);
            auVar51 = vandps_avx(auVar51,auVar195);
            auVar197 = vblendvps_avx(auVar140,auVar51,auVar271);
            fVar27 = auVar197._0_4_;
            fVar177 = fVar27 * fVar27;
            fVar202 = auVar197._4_4_;
            fVar203 = fVar202 * fVar202;
            auVar6._4_4_ = fVar203;
            auVar6._0_4_ = fVar177;
            fVar204 = auVar197._8_4_;
            fVar205 = fVar204 * fVar204;
            auVar6._8_4_ = fVar205;
            fVar206 = auVar197._12_4_;
            fVar207 = fVar206 * fVar206;
            auVar6._12_4_ = fVar207;
            fVar174 = auVar197._16_4_;
            fVar208 = fVar174 * fVar174;
            auVar6._16_4_ = fVar208;
            fVar175 = auVar197._20_4_;
            fVar209 = fVar175 * fVar175;
            auVar6._20_4_ = fVar209;
            fVar176 = auVar197._24_4_;
            fVar210 = fVar176 * fVar176;
            auVar6._24_4_ = fVar210;
            auVar6._28_4_ = auVar51._28_4_;
            auVar7._4_4_ = fVar203 * fVar203;
            auVar7._0_4_ = fVar177 * fVar177;
            auVar7._8_4_ = fVar205 * fVar205;
            auVar7._12_4_ = fVar207 * fVar207;
            auVar7._16_4_ = fVar208 * fVar208;
            auVar7._20_4_ = fVar209 * fVar209;
            auVar7._24_4_ = fVar210 * fVar210;
            auVar7._28_4_ = 0;
            auVar29 = vfmadd213ps_fma(auVar453,auVar7,auVar138);
            auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar7,auVar296);
            in_ZMM5 = ZEXT1664(auVar29);
            auVar297._8_4_ = 0x3cc48f19;
            auVar297._0_8_ = 0x3cc48f193cc48f19;
            auVar297._12_4_ = 0x3cc48f19;
            auVar297._16_4_ = 0x3cc48f19;
            auVar297._20_4_ = 0x3cc48f19;
            auVar297._24_4_ = 0x3cc48f19;
            auVar297._28_4_ = 0x3cc48f19;
            auVar325._8_4_ = 0x3d997dcc;
            auVar325._0_8_ = 0x3d997dcc3d997dcc;
            auVar325._12_4_ = 0x3d997dcc;
            auVar325._16_4_ = 0x3d997dcc;
            auVar325._20_4_ = 0x3d997dcc;
            auVar325._24_4_ = 0x3d997dcc;
            auVar325._28_4_ = 0x3d997dcc;
            auVar153 = vfmadd213ps_fma(auVar297,auVar7,auVar325);
            auVar153 = vfmadd213ps_fma(ZEXT1632(auVar153),auVar7,auVar401);
            auVar29 = vfmadd231ps_fma(ZEXT1632(auVar153),auVar6,ZEXT1632(auVar29));
            auVar140 = vandps_avx(auVar401,auVar271);
            auVar8._4_4_ = auVar29._4_4_ * fVar202;
            auVar8._0_4_ = auVar29._0_4_ * fVar27;
            auVar8._8_4_ = auVar29._8_4_ * fVar204;
            auVar8._12_4_ = auVar29._12_4_ * fVar206;
            auVar8._16_4_ = fVar174 * 0.0;
            auVar8._20_4_ = fVar175 * 0.0;
            auVar8._24_4_ = fVar176 * 0.0;
            auVar8._28_4_ = auVar197._28_4_;
            auVar29 = vfmadd213ps_fma(auVar422,auVar140,auVar401);
            auVar9._4_4_ = auVar140._4_4_ * 1.5707964;
            auVar9._0_4_ = auVar140._0_4_ * 1.5707964;
            auVar9._8_4_ = auVar140._8_4_ * 1.5707964;
            auVar9._12_4_ = auVar140._12_4_ * 1.5707964;
            auVar9._16_4_ = auVar140._16_4_ * 1.5707964;
            auVar9._20_4_ = auVar140._20_4_ * 1.5707964;
            auVar9._24_4_ = auVar140._24_4_ * 1.5707964;
            auVar9._28_4_ = auVar140._28_4_;
            auVar29 = vfmadd231ps_fma(auVar9,auVar8,ZEXT1632(auVar29));
            auVar140 = vandps_avx(auVar437,*pauVar23);
            auVar140 = vorps_avx(auVar140,ZEXT1632(auVar29));
            *pauVar23 = auVar140;
            pauVar23 = pauVar23 + 1;
            iVar26 = iVar26 + 8;
          } while (iVar26 < (int)uVar24);
          uVar19 = local_150._0_4_;
        }
        auVar339._8_4_ = 0x7fffffff;
        auVar339._0_8_ = 0x7fffffff7fffffff;
        auVar339._12_4_ = 0x7fffffff;
        auVar358._8_4_ = 0x3f000000;
        auVar358._0_8_ = 0x3f0000003f000000;
        auVar358._12_4_ = 0x3f000000;
        auVar392._8_4_ = 0x3f800000;
        auVar392._0_8_ = 0x3f8000003f800000;
        auVar392._12_4_ = 0x3f800000;
        auVar410._8_4_ = 0xc0400000;
        auVar410._0_8_ = 0xc0400000c0400000;
        auVar410._12_4_ = 0xc0400000;
        auVar442._8_4_ = 0x800000;
        auVar442._0_8_ = 0x80000000800000;
        auVar442._12_4_ = 0x800000;
        auVar459._8_4_ = 0x3d3a73d8;
        auVar459._0_8_ = 0x3d3a73d83d3a73d8;
        auVar459._12_4_ = 0x3d3a73d8;
        auVar472._8_4_ = 0x3d2dbdcf;
        auVar472._0_8_ = 0x3d2dbdcf3d2dbdcf;
        auVar472._12_4_ = 0x3d2dbdcf;
        uVar18 = uVar19 | 3;
        while ((int)uVar18 < (int)uVar24) {
          auVar29 = vandps_avx(auVar339,*(undefined1 (*) [16])*pauVar23);
          auVar128 = vcmpps_avx(auVar358,auVar29,1);
          auVar258 = vfnmadd213ps_fma(auVar358,auVar29,auVar358);
          auVar153 = vrsqrtps_avx(auVar258);
          auVar259._0_4_ = auVar258._0_4_ * auVar153._0_4_;
          auVar259._4_4_ = auVar258._4_4_ * auVar153._4_4_;
          auVar259._8_4_ = auVar258._8_4_ * auVar153._8_4_;
          auVar259._12_4_ = auVar258._12_4_ * auVar153._12_4_;
          auVar153 = vfmadd213ps_fma(auVar153,auVar259,auVar410);
          auVar216._0_4_ = auVar259._0_4_ * -0.5 * auVar153._0_4_;
          auVar216._4_4_ = auVar259._4_4_ * -0.5 * auVar153._4_4_;
          auVar216._8_4_ = auVar259._8_4_ * -0.5 * auVar153._8_4_;
          auVar216._12_4_ = auVar259._12_4_ * -0.5 * auVar153._12_4_;
          auVar153 = vandps_avx(auVar339,auVar258);
          auVar153 = vcmpps_avx(auVar442,auVar153,2);
          auVar153 = vandps_avx(auVar153,auVar216);
          auVar29 = vblendvps_avx(auVar29,auVar153,auVar128);
          fVar27 = auVar29._0_4_;
          auVar181._0_4_ = fVar27 * fVar27;
          fVar202 = auVar29._4_4_;
          auVar181._4_4_ = fVar202 * fVar202;
          fVar204 = auVar29._8_4_;
          auVar181._8_4_ = fVar204 * fVar204;
          fVar206 = auVar29._12_4_;
          auVar181._12_4_ = fVar206 * fVar206;
          auVar217._0_4_ = auVar181._0_4_ * auVar181._0_4_;
          auVar217._4_4_ = auVar181._4_4_ * auVar181._4_4_;
          auVar217._8_4_ = auVar181._8_4_ * auVar181._8_4_;
          auVar217._12_4_ = auVar181._12_4_ * auVar181._12_4_;
          auVar29 = vfmadd213ps_fma(auVar472,auVar217,auVar459);
          auVar278._8_4_ = 0x3e2aaaf8;
          auVar278._0_8_ = 0x3e2aaaf83e2aaaf8;
          auVar278._12_4_ = 0x3e2aaaf8;
          auVar29 = vfmadd213ps_fma(auVar29,auVar217,auVar278);
          in_ZMM5 = ZEXT1664(auVar29);
          auVar279._8_4_ = 0x3cc48f19;
          auVar279._0_8_ = 0x3cc48f193cc48f19;
          auVar279._12_4_ = 0x3cc48f19;
          auVar308._8_4_ = 0x3d997dcc;
          auVar308._0_8_ = 0x3d997dcc3d997dcc;
          auVar308._12_4_ = 0x3d997dcc;
          auVar153 = vfmadd213ps_fma(auVar279,auVar217,auVar308);
          auVar153 = vfmadd213ps_fma(auVar153,auVar217,auVar392);
          auVar153 = vfmadd231ps_fma(auVar153,auVar181,auVar29);
          auVar29 = vandps_avx(auVar392,auVar128);
          auVar120._0_4_ = auVar153._0_4_ * fVar27;
          auVar120._4_4_ = auVar153._4_4_ * fVar202;
          auVar120._8_4_ = auVar153._8_4_ * fVar204;
          auVar120._12_4_ = auVar153._12_4_ * fVar206;
          auVar153 = vfmadd213ps_fma(auVar410,auVar29,auVar392);
          auVar148._0_4_ = auVar29._0_4_ * 1.5707964;
          auVar148._4_4_ = auVar29._4_4_ * 1.5707964;
          auVar148._8_4_ = auVar29._8_4_ * 1.5707964;
          auVar148._12_4_ = auVar29._12_4_ * 1.5707964;
          auVar153 = vfmadd231ps_fma(auVar148,auVar120,auVar153);
          auVar121._8_4_ = 0x80000000;
          auVar121._0_8_ = 0x8000000080000000;
          auVar121._12_4_ = 0x80000000;
          auVar29 = vandps_avx(*(undefined1 (*) [16])*pauVar23,auVar121);
          auVar29 = vorps_avx(auVar29,auVar153);
          *(undefined1 (*) [16])*pauVar23 = auVar29;
          pauVar23 = (undefined1 (*) [32])(*pauVar23 + 0x10);
          uVar18 = uVar19 + 7;
          uVar19 = uVar19 + 4;
        }
        if (uVar24 - uVar19 != 0 && (int)uVar19 <= (int)uVar24) {
          lVar20 = 0;
          do {
            in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
            fVar27 = asinf(*(float *)(*pauVar23 + lVar20 * 4));
            *(float *)(*pauVar23 + lVar20 * 4) = fVar27;
            lVar20 = lVar20 + 1;
          } while (uVar24 - uVar19 != (int)lVar20);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != local_120._0_8_);
    }
    break;
  case 0xd:
    local_150._0_8_ = (long)bottom_top_blob->c;
    if (0 < (long)bottom_top_blob->c) {
      uVar24 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_c0._0_4_ = uVar24 & 0xfffffff8;
      lVar22 = 0;
      do {
        auVar467._8_4_ = 0x3d2dbdcf;
        auVar467._0_8_ = 0x3d2dbdcf3d2dbdcf;
        auVar455._8_4_ = 0x3e2aaaf8;
        auVar455._0_8_ = 0x3e2aaaf83e2aaaf8;
        auVar438._8_4_ = 0x800000;
        auVar438._0_8_ = 0x80000000800000;
        auVar425._8_4_ = 0x3d3a73d8;
        auVar425._0_8_ = 0x3d3a73d83d3a73d8;
        auVar403._8_4_ = 0xc0400000;
        auVar403._0_8_ = 0xc0400000c0400000;
        auVar385._8_4_ = 0x3f000000;
        auVar385._0_8_ = 0x3f0000003f000000;
        auVar351._8_4_ = 0x7fffffff;
        auVar351._0_8_ = 0x7fffffff7fffffff;
        auVar332._8_4_ = 0x80000000;
        auVar332._0_8_ = 0x8000000080000000;
        auVar467._12_4_ = 0x3d2dbdcf;
        auVar455._12_4_ = 0x3e2aaaf8;
        auVar438._12_4_ = 0x800000;
        auVar425._12_4_ = 0x3d3a73d8;
        auVar403._12_4_ = 0xc0400000;
        auVar385._12_4_ = 0x3f000000;
        auVar351._12_4_ = 0x7fffffff;
        auVar332._12_4_ = 0x80000000;
        auVar467._16_4_ = 0x3d2dbdcf;
        auVar455._16_4_ = 0x3e2aaaf8;
        auVar438._16_4_ = 0x800000;
        auVar425._16_4_ = 0x3d3a73d8;
        auVar403._16_4_ = 0xc0400000;
        auVar385._16_4_ = 0x3f000000;
        auVar351._16_4_ = 0x7fffffff;
        auVar332._16_4_ = 0x80000000;
        auVar467._20_4_ = 0x3d2dbdcf;
        auVar455._20_4_ = 0x3e2aaaf8;
        auVar438._20_4_ = 0x800000;
        auVar425._20_4_ = 0x3d3a73d8;
        auVar403._20_4_ = 0xc0400000;
        auVar385._20_4_ = 0x3f000000;
        auVar351._20_4_ = 0x7fffffff;
        auVar332._20_4_ = 0x80000000;
        auVar467._24_4_ = 0x3d2dbdcf;
        auVar455._24_4_ = 0x3e2aaaf8;
        auVar438._24_4_ = 0x800000;
        auVar425._24_4_ = 0x3d3a73d8;
        auVar403._24_4_ = 0xc0400000;
        auVar385._24_4_ = 0x3f000000;
        auVar351._24_4_ = 0x7fffffff;
        auVar332._24_4_ = 0x80000000;
        auVar467._28_4_ = 0x3d2dbdcf;
        auVar455._28_4_ = 0x3e2aaaf8;
        auVar438._28_4_ = 0x800000;
        auVar425._28_4_ = 0x3d3a73d8;
        auVar403._28_4_ = 0xc0400000;
        auVar385._28_4_ = 0x3f000000;
        auVar351._28_4_ = 0x7fffffff;
        auVar332._28_4_ = 0x80000000;
        pauVar23 = (undefined1 (*) [32])
                   (local_128->cstep * lVar22 * local_128->elemsize + (long)local_128->data);
        if ((int)uVar24 < 8) {
          uVar19 = 0;
        }
        else {
          iVar26 = 7;
          do {
            auVar140 = *pauVar23;
            auVar51 = vandps_avx(auVar351,auVar140);
            local_120 = vcmpps_avx(auVar385,auVar51,1);
            auVar153 = vfnmadd213ps_fma(auVar385,auVar51,auVar385);
            auVar197 = vrsqrtps_avx(ZEXT1632(auVar153));
            auVar275._0_4_ = auVar153._0_4_ * auVar197._0_4_;
            auVar275._4_4_ = auVar153._4_4_ * auVar197._4_4_;
            auVar275._8_4_ = auVar153._8_4_ * auVar197._8_4_;
            auVar275._12_4_ = auVar153._12_4_ * auVar197._12_4_;
            auVar275._16_4_ = auVar197._16_4_ * 0.0;
            auVar275._20_4_ = auVar197._20_4_ * 0.0;
            auVar275._28_36_ = in_ZMM5._28_36_;
            auVar275._24_4_ = auVar197._24_4_ * 0.0;
            auVar29 = vfmadd213ps_fma(auVar197,auVar275._0_32_,auVar403);
            auVar250._0_4_ = auVar275._0_4_ * -0.5 * auVar29._0_4_;
            auVar250._4_4_ = auVar275._4_4_ * -0.5 * auVar29._4_4_;
            auVar250._8_4_ = auVar275._8_4_ * -0.5 * auVar29._8_4_;
            auVar250._12_4_ = auVar275._12_4_ * -0.5 * auVar29._12_4_;
            auVar250._16_4_ = auVar275._16_4_ * -0.5 * 0.0;
            auVar250._20_4_ = auVar275._20_4_ * -0.5 * 0.0;
            auVar250._24_4_ = auVar275._24_4_ * -0.5 * 0.0;
            auVar250._28_4_ = 0;
            auVar197 = vandps_avx(auVar351,ZEXT1632(auVar153));
            auVar197 = vcmpps_avx(auVar438,auVar197,2);
            auVar197 = vandps_avx(auVar197,auVar250);
            auVar271 = vblendvps_avx(auVar51,auVar197,local_120);
            fVar27 = auVar271._0_4_;
            fVar177 = fVar27 * fVar27;
            fVar202 = auVar271._4_4_;
            fVar203 = fVar202 * fVar202;
            auVar12._4_4_ = fVar203;
            auVar12._0_4_ = fVar177;
            fVar204 = auVar271._8_4_;
            fVar205 = fVar204 * fVar204;
            auVar12._8_4_ = fVar205;
            fVar206 = auVar271._12_4_;
            fVar207 = fVar206 * fVar206;
            auVar12._12_4_ = fVar207;
            fVar174 = auVar271._16_4_;
            fVar208 = fVar174 * fVar174;
            auVar12._16_4_ = fVar208;
            fVar175 = auVar271._20_4_;
            fVar209 = fVar175 * fVar175;
            auVar12._20_4_ = fVar209;
            fVar176 = auVar271._24_4_;
            fVar210 = fVar176 * fVar176;
            auVar12._24_4_ = fVar210;
            auVar12._28_4_ = auVar197._28_4_;
            auVar13._4_4_ = fVar203 * fVar203;
            auVar13._0_4_ = fVar177 * fVar177;
            auVar13._8_4_ = fVar205 * fVar205;
            auVar13._12_4_ = fVar207 * fVar207;
            auVar13._16_4_ = fVar208 * fVar208;
            auVar13._20_4_ = fVar209 * fVar209;
            auVar13._24_4_ = fVar210 * fVar210;
            auVar13._28_4_ = 0;
            auVar29 = vfmadd213ps_fma(auVar467,auVar13,auVar425);
            auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar13,auVar455);
            auVar300._8_4_ = 0x3cc48f19;
            auVar300._0_8_ = 0x3cc48f193cc48f19;
            auVar300._12_4_ = 0x3cc48f19;
            auVar300._16_4_ = 0x3cc48f19;
            auVar300._20_4_ = 0x3cc48f19;
            auVar300._24_4_ = 0x3cc48f19;
            auVar300._28_4_ = 0x3cc48f19;
            auVar333._8_4_ = 0x3d997dcc;
            auVar333._0_8_ = 0x3d997dcc3d997dcc;
            auVar333._12_4_ = 0x3d997dcc;
            auVar333._16_4_ = 0x3d997dcc;
            auVar333._20_4_ = 0x3d997dcc;
            auVar333._24_4_ = 0x3d997dcc;
            auVar333._28_4_ = 0x3d997dcc;
            auVar153 = vfmadd213ps_fma(auVar300,auVar13,auVar333);
            auVar404._8_4_ = 0x3f800000;
            auVar404._0_8_ = 0x3f8000003f800000;
            auVar404._12_4_ = 0x3f800000;
            auVar404._16_4_ = 0x3f800000;
            auVar404._20_4_ = 0x3f800000;
            auVar404._24_4_ = 0x3f800000;
            auVar404._28_4_ = 0x3f800000;
            auVar153 = vfmadd213ps_fma(ZEXT1632(auVar153),auVar13,auVar404);
            auVar29 = vfmadd231ps_fma(ZEXT1632(auVar153),auVar12,ZEXT1632(auVar29));
            in_ZMM5 = ZEXT864(0) << 0x20;
            auVar51 = vandps_avx(auVar140,auVar332);
            fVar27 = auVar29._0_4_ * fVar27;
            fVar202 = auVar29._4_4_ * fVar202;
            auVar14._4_4_ = fVar202;
            auVar14._0_4_ = fVar27;
            fVar204 = auVar29._8_4_ * fVar204;
            auVar14._8_4_ = fVar204;
            fVar206 = auVar29._12_4_ * fVar206;
            auVar14._12_4_ = fVar206;
            fVar174 = fVar174 * 0.0;
            auVar14._16_4_ = fVar174;
            fVar175 = fVar175 * 0.0;
            auVar14._20_4_ = fVar175;
            fVar177 = auVar271._28_4_;
            fVar176 = fVar176 * 0.0;
            auVar14._24_4_ = fVar176;
            auVar14._28_4_ = fVar177;
            auVar197 = vorps_avx(auVar51,auVar14);
            auVar170._0_4_ = fVar27 + fVar27;
            auVar170._4_4_ = fVar202 + fVar202;
            auVar170._8_4_ = fVar204 + fVar204;
            auVar170._12_4_ = fVar206 + fVar206;
            auVar170._16_4_ = fVar174 + fVar174;
            auVar170._20_4_ = fVar175 + fVar175;
            auVar170._24_4_ = fVar176 + fVar176;
            auVar170._28_4_ = fVar177 + fVar177;
            auVar51 = vorps_avx(auVar51,auVar170);
            auVar140 = vcmpps_avx(auVar140,ZEXT832(0) << 0x20,1);
            auVar200._8_4_ = 0x40490fdb;
            auVar200._0_8_ = 0x40490fdb40490fdb;
            auVar200._12_4_ = 0x40490fdb;
            auVar200._16_4_ = 0x40490fdb;
            auVar200._20_4_ = 0x40490fdb;
            auVar200._24_4_ = 0x40490fdb;
            auVar200._28_4_ = 0x40490fdb;
            auVar140 = vandps_avx(auVar140,auVar200);
            auVar142._0_4_ = auVar140._0_4_ + auVar51._0_4_;
            auVar142._4_4_ = auVar140._4_4_ + auVar51._4_4_;
            auVar142._8_4_ = auVar140._8_4_ + auVar51._8_4_;
            auVar142._12_4_ = auVar140._12_4_ + auVar51._12_4_;
            auVar142._16_4_ = auVar140._16_4_ + auVar51._16_4_;
            auVar142._20_4_ = auVar140._20_4_ + auVar51._20_4_;
            auVar142._24_4_ = auVar140._24_4_ + auVar51._24_4_;
            auVar142._28_4_ = auVar140._28_4_ + auVar51._28_4_;
            auVar171._8_4_ = 0x3fc90fdb;
            auVar171._0_8_ = 0x3fc90fdb3fc90fdb;
            auVar171._12_4_ = 0x3fc90fdb;
            auVar171._16_4_ = 0x3fc90fdb;
            auVar171._20_4_ = 0x3fc90fdb;
            auVar171._24_4_ = 0x3fc90fdb;
            auVar171._28_4_ = 0x3fc90fdb;
            auVar140 = vsubps_avx(auVar171,auVar197);
            auVar140 = vblendvps_avx(auVar140,auVar142,local_120);
            *pauVar23 = auVar140;
            pauVar23 = pauVar23 + 1;
            iVar26 = iVar26 + 8;
          } while (iVar26 < (int)uVar24);
          uVar19 = local_c0._0_4_;
        }
        auVar344._8_4_ = 0x7fffffff;
        auVar344._0_8_ = 0x7fffffff7fffffff;
        auVar344._12_4_ = 0x7fffffff;
        auVar370._8_4_ = 0x3f000000;
        auVar370._0_8_ = 0x3f0000003f000000;
        auVar370._12_4_ = 0x3f000000;
        auVar463._8_4_ = 0x3d2dbdcf;
        auVar463._0_8_ = 0x3d2dbdcf3d2dbdcf;
        auVar463._12_4_ = 0x3d2dbdcf;
        auVar480._8_4_ = 0x3e2aaaf8;
        auVar480._0_8_ = 0x3e2aaaf83e2aaaf8;
        auVar480._12_4_ = 0x3e2aaaf8;
        auVar316._8_4_ = 0x3f800000;
        auVar316._0_8_ = 0x3f8000003f800000;
        auVar316._12_4_ = 0x3f800000;
        auVar398._8_4_ = 0x3fc90fdb;
        auVar398._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar398._12_4_ = 0x3fc90fdb;
        auVar432._8_4_ = 0x40490fdb;
        auVar432._0_8_ = 0x40490fdb40490fdb;
        auVar432._12_4_ = 0x40490fdb;
        uVar18 = uVar19 | 3;
        while ((int)uVar18 < (int)uVar24) {
          auVar29 = *(undefined1 (*) [16])*pauVar23;
          auVar153 = vandps_avx(auVar344,auVar29);
          auVar258 = vcmpps_avx(auVar370,auVar153,1);
          auVar343 = vfnmadd213ps_fma(auVar370,auVar153,auVar370);
          auVar128 = vrsqrtps_avx(auVar343);
          auVar265._0_4_ = auVar343._0_4_ * auVar128._0_4_;
          auVar265._4_4_ = auVar343._4_4_ * auVar128._4_4_;
          auVar265._8_4_ = auVar343._8_4_ * auVar128._8_4_;
          auVar265._12_4_ = auVar343._12_4_ * auVar128._12_4_;
          auVar287._8_4_ = 0xc0400000;
          auVar287._0_8_ = 0xc0400000c0400000;
          auVar287._12_4_ = 0xc0400000;
          auVar128 = vfmadd213ps_fma(auVar128,auVar265,auVar287);
          auVar231._0_4_ = auVar265._0_4_ * -0.5 * auVar128._0_4_;
          auVar231._4_4_ = auVar265._4_4_ * -0.5 * auVar128._4_4_;
          auVar231._8_4_ = auVar265._8_4_ * -0.5 * auVar128._8_4_;
          auVar231._12_4_ = auVar265._12_4_ * -0.5 * auVar128._12_4_;
          auVar128 = vandps_avx(auVar344,auVar343);
          auVar266._8_4_ = 0x800000;
          auVar266._0_8_ = 0x80000000800000;
          auVar266._12_4_ = 0x800000;
          auVar128 = vcmpps_avx(auVar266,auVar128,2);
          auVar128 = vandps_avx(auVar128,auVar231);
          auVar153 = vblendvps_avx(auVar153,auVar128,auVar258);
          fVar27 = auVar153._0_4_;
          auVar186._0_4_ = fVar27 * fVar27;
          fVar202 = auVar153._4_4_;
          auVar186._4_4_ = fVar202 * fVar202;
          fVar204 = auVar153._8_4_;
          auVar186._8_4_ = fVar204 * fVar204;
          fVar206 = auVar153._12_4_;
          auVar186._12_4_ = fVar206 * fVar206;
          auVar232._0_4_ = auVar186._0_4_ * auVar186._0_4_;
          auVar232._4_4_ = auVar186._4_4_ * auVar186._4_4_;
          auVar232._8_4_ = auVar186._8_4_ * auVar186._8_4_;
          auVar232._12_4_ = auVar186._12_4_ * auVar186._12_4_;
          auVar288._8_4_ = 0x3d3a73d8;
          auVar288._0_8_ = 0x3d3a73d83d3a73d8;
          auVar288._12_4_ = 0x3d3a73d8;
          auVar153 = vfmadd213ps_fma(auVar463,auVar232,auVar288);
          auVar153 = vfmadd213ps_fma(auVar153,auVar232,auVar480);
          in_ZMM5 = ZEXT1664(auVar153);
          auVar289._8_4_ = 0x3cc48f19;
          auVar289._0_8_ = 0x3cc48f193cc48f19;
          auVar289._12_4_ = 0x3cc48f19;
          auVar447._8_4_ = 0x3d997dcc;
          auVar447._0_8_ = 0x3d997dcc3d997dcc;
          auVar447._12_4_ = 0x3d997dcc;
          auVar128 = vfmadd213ps_fma(auVar289,auVar232,auVar447);
          auVar128 = vfmadd213ps_fma(auVar128,auVar232,auVar316);
          auVar128 = vfmadd231ps_fma(auVar128,auVar186,auVar153);
          auVar187._8_4_ = 0x80000000;
          auVar187._0_8_ = 0x8000000080000000;
          auVar187._12_4_ = 0x80000000;
          auVar153 = vandps_avx(auVar29,auVar187);
          auVar157._0_4_ = auVar128._0_4_ * fVar27;
          auVar157._4_4_ = auVar128._4_4_ * fVar202;
          auVar157._8_4_ = auVar128._8_4_ * fVar204;
          auVar157._12_4_ = auVar128._12_4_ * fVar206;
          auVar128 = vorps_avx(auVar153,auVar157);
          auVar158._0_4_ = auVar157._0_4_ + auVar157._0_4_;
          auVar158._4_4_ = auVar157._4_4_ + auVar157._4_4_;
          auVar158._8_4_ = auVar157._8_4_ + auVar157._8_4_;
          auVar158._12_4_ = auVar157._12_4_ + auVar157._12_4_;
          auVar153 = vorps_avx(auVar153,auVar158);
          auVar29 = vcmpps_avx(auVar29,ZEXT816(0) << 0x40,1);
          auVar29 = vandps_avx(auVar432,auVar29);
          auVar131._0_4_ = auVar29._0_4_ + auVar153._0_4_;
          auVar131._4_4_ = auVar29._4_4_ + auVar153._4_4_;
          auVar131._8_4_ = auVar29._8_4_ + auVar153._8_4_;
          auVar131._12_4_ = auVar29._12_4_ + auVar153._12_4_;
          auVar29 = vsubps_avx(auVar398,auVar128);
          auVar29 = vblendvps_avx(auVar29,auVar131,auVar258);
          *(undefined1 (*) [16])*pauVar23 = auVar29;
          pauVar23 = (undefined1 (*) [32])(*pauVar23 + 0x10);
          uVar18 = uVar19 + 7;
          uVar19 = uVar19 + 4;
        }
        if (uVar24 - uVar19 != 0 && (int)uVar19 <= (int)uVar24) {
          lVar20 = 0;
          do {
            in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
            fVar27 = acosf(*(float *)(*pauVar23 + lVar20 * 4));
            *(float *)(*pauVar23 + lVar20 * 4) = fVar27;
            lVar20 = lVar20 + 1;
          } while (uVar24 - uVar19 != (int)lVar20);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != local_150._0_8_);
    }
    break;
  case 0xe:
    local_120._0_8_ = (long)bottom_top_blob->c;
    if (0 < (long)bottom_top_blob->c) {
      uVar24 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_150._0_4_ = uVar24 & 0xfffffff8;
      lVar22 = 0;
      do {
        auVar483._8_4_ = 0xbeaaaa53;
        auVar483._0_8_ = 0xbeaaaa53beaaaa53;
        auVar452._8_4_ = 0xbe117200;
        auVar452._0_8_ = 0xbe117200be117200;
        auVar436._8_4_ = 0xbc83a25c;
        auVar436._0_8_ = 0xbc83a25cbc83a25c;
        auVar378._8_4_ = 0x3f800000;
        auVar378._0_8_ = 0x3f8000003f800000;
        auVar319._8_4_ = 0x80000000;
        auVar319._0_8_ = 0x8000000080000000;
        auVar294._8_4_ = 0xbd99b01e;
        auVar294._0_8_ = 0xbd99b01ebd99b01e;
        auVar193._8_4_ = 0xbf800000;
        auVar193._0_8_ = 0xbf800000bf800000;
        auVar137._8_4_ = 0x7fffffff;
        auVar137._0_8_ = 0x7fffffff7fffffff;
        auVar483._12_4_ = 0xbeaaaa53;
        auVar452._12_4_ = 0xbe117200;
        auVar436._12_4_ = 0xbc83a25c;
        auVar378._12_4_ = 0x3f800000;
        auVar319._12_4_ = 0x80000000;
        auVar294._12_4_ = 0xbd99b01e;
        auVar193._12_4_ = 0xbf800000;
        auVar137._12_4_ = 0x7fffffff;
        auVar483._16_4_ = 0xbeaaaa53;
        auVar452._16_4_ = 0xbe117200;
        auVar436._16_4_ = 0xbc83a25c;
        auVar378._16_4_ = 0x3f800000;
        auVar319._16_4_ = 0x80000000;
        auVar294._16_4_ = 0xbd99b01e;
        auVar193._16_4_ = 0xbf800000;
        auVar137._16_4_ = 0x7fffffff;
        auVar483._20_4_ = 0xbeaaaa53;
        auVar452._20_4_ = 0xbe117200;
        auVar436._20_4_ = 0xbc83a25c;
        auVar378._20_4_ = 0x3f800000;
        auVar319._20_4_ = 0x80000000;
        auVar294._20_4_ = 0xbd99b01e;
        auVar193._20_4_ = 0xbf800000;
        auVar137._20_4_ = 0x7fffffff;
        auVar483._24_4_ = 0xbeaaaa53;
        auVar452._24_4_ = 0xbe117200;
        auVar436._24_4_ = 0xbc83a25c;
        auVar378._24_4_ = 0x3f800000;
        auVar319._24_4_ = 0x80000000;
        auVar294._24_4_ = 0xbd99b01e;
        auVar193._24_4_ = 0xbf800000;
        auVar137._24_4_ = 0x7fffffff;
        auVar483._28_4_ = 0xbeaaaa53;
        auVar452._28_4_ = 0xbe117200;
        auVar436._28_4_ = 0xbc83a25c;
        auVar378._28_4_ = 0x3f800000;
        auVar319._28_4_ = 0x80000000;
        auVar294._28_4_ = 0xbd99b01e;
        auVar193._28_4_ = 0xbf800000;
        auVar137._28_4_ = 0x7fffffff;
        pauVar23 = (undefined1 (*) [32])
                   (local_128->cstep * lVar22 * local_128->elemsize + (long)local_128->data);
        if ((int)uVar24 < 8) {
          uVar19 = 0;
        }
        else {
          iVar26 = 7;
          do {
            auVar140 = vandps_avx(*pauVar23,auVar137);
            auVar197 = vcmpps_avx(auVar378,auVar140,1);
            auVar51 = vblendvps_avx(auVar140,auVar193,auVar197);
            auVar140 = vmaxps_avx(auVar378,auVar140);
            auVar271 = vrcpps_avx(auVar140);
            auVar273._0_4_ = auVar51._0_4_ * auVar271._0_4_;
            auVar273._4_4_ = auVar51._4_4_ * auVar271._4_4_;
            auVar273._8_4_ = auVar51._8_4_ * auVar271._8_4_;
            auVar273._12_4_ = auVar51._12_4_ * auVar271._12_4_;
            auVar273._16_4_ = auVar51._16_4_ * auVar271._16_4_;
            auVar273._20_4_ = auVar51._20_4_ * auVar271._20_4_;
            auVar273._28_36_ = in_ZMM5._28_36_;
            auVar273._24_4_ = auVar51._24_4_ * auVar271._24_4_;
            auVar29 = vfmsub213ps_fma(auVar140,auVar273._0_32_,auVar51);
            auVar128 = vfnmadd213ps_fma(ZEXT1632(auVar29),auVar271,auVar273._0_32_);
            fVar27 = auVar128._0_4_ * auVar128._0_4_;
            fVar202 = auVar128._4_4_ * auVar128._4_4_;
            fVar204 = auVar128._8_4_ * auVar128._8_4_;
            fVar206 = auVar128._12_4_ * auVar128._12_4_;
            auVar2._28_4_ = auVar51._28_4_;
            auVar2._0_28_ = ZEXT1628(CONCAT412(fVar206,CONCAT48(fVar204,CONCAT44(fVar202,fVar27))));
            auVar3._28_4_ = auVar271._28_4_;
            auVar3._0_28_ =
                 ZEXT1628(CONCAT412(fVar206 * fVar206,
                                    CONCAT48(fVar204 * fVar204,
                                             CONCAT44(fVar202 * fVar202,fVar27 * fVar27))));
            auVar29 = vfmadd213ps_fma(auVar436,auVar3,auVar294);
            auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar3,auVar452);
            auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar3,auVar483);
            in_ZMM5 = ZEXT1664(auVar29);
            auVar295._8_4_ = 0x3b3ac537;
            auVar295._0_8_ = 0x3b3ac5373b3ac537;
            auVar295._12_4_ = 0x3b3ac537;
            auVar295._16_4_ = 0x3b3ac537;
            auVar295._20_4_ = 0x3b3ac537;
            auVar295._24_4_ = 0x3b3ac537;
            auVar295._28_4_ = 0x3b3ac537;
            auVar320._8_4_ = 0x3d2edd4e;
            auVar320._0_8_ = 0x3d2edd4e3d2edd4e;
            auVar320._12_4_ = 0x3d2edd4e;
            auVar320._16_4_ = 0x3d2edd4e;
            auVar320._20_4_ = 0x3d2edd4e;
            auVar320._24_4_ = 0x3d2edd4e;
            auVar320._28_4_ = 0x3d2edd4e;
            auVar153 = vfmadd213ps_fma(auVar295,auVar3,auVar320);
            auVar321._8_4_ = 0x3dd9ed24;
            auVar321._0_8_ = 0x3dd9ed243dd9ed24;
            auVar321._12_4_ = 0x3dd9ed24;
            auVar321._16_4_ = 0x3dd9ed24;
            auVar321._20_4_ = 0x3dd9ed24;
            auVar321._24_4_ = 0x3dd9ed24;
            auVar321._28_4_ = 0x3dd9ed24;
            auVar153 = vfmadd213ps_fma(ZEXT1632(auVar153),auVar3,auVar321);
            auVar322._8_4_ = 0x3e4cb974;
            auVar322._0_8_ = 0x3e4cb9743e4cb974;
            auVar322._12_4_ = 0x3e4cb974;
            auVar322._16_4_ = 0x3e4cb974;
            auVar322._20_4_ = 0x3e4cb974;
            auVar322._24_4_ = 0x3e4cb974;
            auVar322._28_4_ = 0x3e4cb974;
            auVar153 = vfmadd213ps_fma(ZEXT1632(auVar153),auVar3,auVar322);
            auVar153 = vfmadd213ps_fma(ZEXT1632(auVar153),auVar3,auVar378);
            auVar29 = vfmadd231ps_fma(ZEXT1632(auVar153),auVar2,ZEXT1632(auVar29));
            auVar194._8_4_ = 0x3fc90fdb;
            auVar194._0_8_ = 0x3fc90fdb3fc90fdb;
            auVar194._12_4_ = 0x3fc90fdb;
            auVar194._16_4_ = 0x3fc90fdb;
            auVar194._20_4_ = 0x3fc90fdb;
            auVar194._24_4_ = 0x3fc90fdb;
            auVar194._28_4_ = 0x3fc90fdb;
            auVar140 = vandps_avx(auVar197,auVar194);
            auVar29 = vfmadd231ps_fma(auVar140,ZEXT1632(auVar128),ZEXT1632(auVar29));
            auVar140 = vandps_avx(auVar319,*pauVar23);
            auVar140 = vorps_avx(auVar140,ZEXT1632(auVar29));
            *pauVar23 = auVar140;
            pauVar23 = pauVar23 + 1;
            iVar26 = iVar26 + 8;
          } while (iVar26 < (int)uVar24);
          uVar19 = local_150._0_4_;
        }
        auVar355._8_4_ = 0x3f800000;
        auVar355._0_8_ = 0x3f8000003f800000;
        auVar355._12_4_ = 0x3f800000;
        auVar391._8_4_ = 0xbf800000;
        auVar391._0_8_ = 0xbf800000bf800000;
        auVar391._12_4_ = 0xbf800000;
        auVar409._8_4_ = 0xbd99b01e;
        auVar409._0_8_ = 0xbd99b01ebd99b01e;
        auVar409._12_4_ = 0xbd99b01e;
        auVar428._8_4_ = 0xbc83a25c;
        auVar428._0_8_ = 0xbc83a25cbc83a25c;
        auVar428._12_4_ = 0xbc83a25c;
        auVar441._8_4_ = 0xbe117200;
        auVar441._0_8_ = 0xbe117200be117200;
        auVar441._12_4_ = 0xbe117200;
        auVar458._8_4_ = 0xbeaaaa53;
        auVar458._0_8_ = 0xbeaaaa53beaaaa53;
        auVar458._12_4_ = 0xbeaaaa53;
        auVar471._8_4_ = 0x3d2edd4e;
        auVar471._0_8_ = 0x3d2edd4e3d2edd4e;
        auVar471._12_4_ = 0x3d2edd4e;
        auVar337._8_4_ = 0x3b3ac537;
        auVar337._0_8_ = 0x3b3ac5373b3ac537;
        auVar337._12_4_ = 0x3b3ac537;
        uVar18 = uVar19 | 3;
        while ((int)uVar18 < (int)uVar24) {
          auVar117._8_4_ = 0x7fffffff;
          auVar117._0_8_ = 0x7fffffff7fffffff;
          auVar117._12_4_ = 0x7fffffff;
          auVar29 = vandps_avx(*(undefined1 (*) [16])*pauVar23,auVar117);
          auVar128 = vcmpps_avx(auVar355,auVar29,1);
          auVar153 = vblendvps_avx(auVar29,auVar391,auVar128);
          auVar29 = vmaxps_avx(auVar355,auVar29);
          auVar258 = vrcpps_avx(auVar29);
          auVar257._0_4_ = auVar153._0_4_ * auVar258._0_4_;
          auVar257._4_4_ = auVar153._4_4_ * auVar258._4_4_;
          auVar257._8_4_ = auVar153._8_4_ * auVar258._8_4_;
          auVar257._12_4_ = auVar153._12_4_ * auVar258._12_4_;
          auVar29 = vfmsub213ps_fma(auVar29,auVar257,auVar153);
          auVar258 = vfnmadd213ps_fma(auVar29,auVar258,auVar257);
          auVar179._0_4_ = auVar258._0_4_ * auVar258._0_4_;
          auVar179._4_4_ = auVar258._4_4_ * auVar258._4_4_;
          auVar179._8_4_ = auVar258._8_4_ * auVar258._8_4_;
          auVar179._12_4_ = auVar258._12_4_ * auVar258._12_4_;
          auVar213._0_4_ = auVar179._0_4_ * auVar179._0_4_;
          auVar213._4_4_ = auVar179._4_4_ * auVar179._4_4_;
          auVar213._8_4_ = auVar179._8_4_ * auVar179._8_4_;
          auVar213._12_4_ = auVar179._12_4_ * auVar179._12_4_;
          auVar29 = vfmadd213ps_fma(auVar428,auVar213,auVar409);
          auVar29 = vfmadd213ps_fma(auVar29,auVar213,auVar441);
          auVar29 = vfmadd213ps_fma(auVar29,auVar213,auVar458);
          in_ZMM5 = ZEXT1664(auVar29);
          auVar153 = vfmadd213ps_fma(auVar337,auVar213,auVar471);
          auVar304._8_4_ = 0x3dd9ed24;
          auVar304._0_8_ = 0x3dd9ed243dd9ed24;
          auVar304._12_4_ = 0x3dd9ed24;
          auVar153 = vfmadd213ps_fma(auVar153,auVar213,auVar304);
          auVar305._8_4_ = 0x3e4cb974;
          auVar305._0_8_ = 0x3e4cb9743e4cb974;
          auVar305._12_4_ = 0x3e4cb974;
          auVar153 = vfmadd213ps_fma(auVar153,auVar213,auVar305);
          auVar153 = vfmadd213ps_fma(auVar153,auVar213,auVar355);
          auVar153 = vfmadd231ps_fma(auVar153,auVar179,auVar29);
          auVar180._8_4_ = 0x3fc90fdb;
          auVar180._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar180._12_4_ = 0x3fc90fdb;
          auVar29 = vandps_avx(auVar128,auVar180);
          auVar153 = vfmadd231ps_fma(auVar29,auVar258,auVar153);
          auVar118._8_4_ = 0x80000000;
          auVar118._0_8_ = 0x8000000080000000;
          auVar118._12_4_ = 0x80000000;
          auVar29 = vandps_avx(*(undefined1 (*) [16])*pauVar23,auVar118);
          auVar29 = vorps_avx(auVar29,auVar153);
          *(undefined1 (*) [16])*pauVar23 = auVar29;
          pauVar23 = (undefined1 (*) [32])(*pauVar23 + 0x10);
          uVar18 = uVar19 + 7;
          uVar19 = uVar19 + 4;
        }
        if (uVar24 - uVar19 != 0 && (int)uVar19 <= (int)uVar24) {
          lVar20 = 0;
          do {
            in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
            fVar27 = atanf(*(float *)(*pauVar23 + lVar20 * 4));
            *(float *)(*pauVar23 + lVar20 * 4) = fVar27;
            lVar20 = lVar20 + 1;
          } while (uVar24 - uVar19 != (int)lVar20);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != local_120._0_8_);
    }
    break;
  case 0xf:
    iVar26 = bottom_top_blob->c;
    if (0 < (long)iVar26) {
      uVar24 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar22 = 0;
      auVar60._8_4_ = 0x3f800000;
      auVar60._0_8_ = 0x3f8000003f800000;
      auVar60._12_4_ = 0x3f800000;
      auVar60._16_4_ = 0x3f800000;
      auVar60._20_4_ = 0x3f800000;
      auVar60._24_4_ = 0x3f800000;
      auVar60._28_4_ = 0x3f800000;
      auVar126._8_4_ = 0x3f800000;
      auVar126._0_8_ = 0x3f8000003f800000;
      auVar126._12_4_ = 0x3f800000;
      auVar221._8_8_ = 0x8000000000000000;
      auVar221._0_8_ = 0x8000000000000000;
      auVar29 = vpcmpeqd_avx(auVar153,auVar153);
      do {
        pauVar23 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar22 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar24 < 8) {
          uVar19 = 0;
        }
        else {
          iVar16 = 7;
          do {
            auVar197 = vrcpps_avx(*pauVar23);
            auVar153 = vfmsub213ps_fma(*pauVar23,auVar197,auVar60);
            auVar153 = vfnmadd132ps_fma(ZEXT1632(auVar153),auVar197,auVar197);
            *pauVar23 = ZEXT1632(auVar153);
            pauVar23 = pauVar23 + 1;
            iVar16 = iVar16 + 8;
            uVar19 = uVar24 & 0xfffffff8;
          } while (iVar16 < (int)uVar24);
        }
        uVar18 = uVar19 | 3;
        while ((int)uVar18 < (int)uVar24) {
          auVar153 = vrcpps_avx(*(undefined1 (*) [16])*pauVar23);
          auVar128 = vfmsub213ps_fma(*(undefined1 (*) [16])*pauVar23,auVar153,auVar126);
          auVar153 = vfnmadd132ps_fma(auVar128,auVar153,auVar153);
          *(undefined1 (*) [16])*pauVar23 = auVar153;
          pauVar23 = (undefined1 (*) [32])(*pauVar23 + 0x10);
          uVar18 = uVar19 + 7;
          uVar19 = uVar19 + 4;
        }
        if ((int)uVar19 < (int)uVar24) {
          uVar17 = CONCAT44(0,~uVar19 + uVar24);
          auVar282._8_8_ = 0;
          auVar282._0_8_ = uVar17;
          auVar258 = vpshufd_avx(auVar282,0x44);
          auVar153 = vorps_avx(auVar258,auVar221);
          auVar128 = vorps_avx(auVar258,auVar221);
          auVar258 = vorps_avx(auVar258,auVar221);
          uVar25 = 0;
          do {
            auVar362._8_8_ = 0;
            auVar362._0_8_ = uVar25;
            auVar343 = vpshufd_avx(auVar362,0x44);
            auVar380._16_16_ = auVar343;
            auVar380._0_16_ = auVar343;
            auVar197 = vorps_avx(auVar380,auVar140);
            auVar271 = vorps_avx(auVar380,auVar51);
            auVar412._0_8_ = auVar271._16_8_ ^ 0x8000000000000000;
            auVar412._8_4_ = auVar271._24_4_;
            auVar412._12_4_ = auVar271._28_4_ ^ 0x80000000;
            auVar343 = vpcmpgtq_avx(auVar412,auVar153);
            auVar363._0_8_ = auVar271._0_8_ ^ 0x8000000000000000;
            auVar363._8_4_ = auVar271._8_4_;
            auVar363._12_4_ = auVar271._12_4_ ^ 0x80000000;
            auVar369 = vpcmpgtq_avx(auVar363,auVar128);
            auVar343 = vpackssdw_avx(auVar369,auVar343);
            auVar413._0_8_ = auVar197._16_8_ ^ 0x8000000000000000;
            auVar413._8_4_ = auVar197._24_4_;
            auVar413._12_4_ = auVar197._28_4_ ^ 0x80000000;
            auVar369 = vpcmpgtq_avx(auVar413,auVar153);
            auVar394._0_8_ = auVar197._0_8_ ^ 0x8000000000000000;
            auVar394._8_4_ = auVar197._8_4_;
            auVar394._12_4_ = auVar197._12_4_ ^ 0x80000000;
            auVar417 = vpcmpgtq_avx(auVar394,auVar258);
            auVar369 = vpackssdw_avx(auVar417,auVar369);
            auVar343 = vpackssdw_avx(auVar369 ^ auVar29,auVar343 ^ auVar29);
            auVar369 = vpmovsxwd_avx(auVar343);
            auVar343 = vpunpckhwd_avx(auVar343,auVar343);
            auVar381._16_16_ = auVar343;
            auVar381._0_16_ = auVar369;
            auVar271 = vmaskmovps_avx(auVar381,*(undefined1 (*) [32])(*pauVar23 + uVar25 * 4));
            auVar197 = vrcpps_avx(auVar271);
            auVar343 = vfmsub213ps_fma(auVar271,auVar197,auVar60);
            auVar343 = vfnmadd132ps_fma(ZEXT1632(auVar343),auVar197,auVar197);
            auVar197 = vmaskmovps_avx(auVar381,ZEXT1632(auVar343));
            *(undefined1 (*) [32])(*pauVar23 + uVar25 * 4) = auVar197;
            uVar25 = uVar25 + 8;
          } while ((uVar17 + 8 & 0x1fffffff8) != uVar25);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != iVar26);
    }
    break;
  case 0x10:
    local_120._0_8_ = (long)bottom_top_blob->c;
    if (0 < (long)bottom_top_blob->c) {
      uVar24 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_150._0_4_ = uVar24 & 0xfffffff8;
      lVar22 = 0;
      do {
        auVar435._8_4_ = 0x395e8083;
        auVar435._0_8_ = 0x395e8083395e8083;
        auVar400._8_4_ = 0x3f318000;
        auVar400._0_8_ = 0x3f3180003f318000;
        auVar377._8_4_ = 0x3f800000;
        auVar377._0_8_ = 0x3f8000003f800000;
        auVar318._8_4_ = 0x3f000000;
        auVar318._0_8_ = 0x3f0000003f000000;
        auVar293._8_4_ = 0x3d2aa9c1;
        auVar293._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar269._8_4_ = 0x3c088908;
        auVar269._0_8_ = 0x3c0889083c088908;
        auVar241._8_4_ = 0xc0000000;
        auVar241._0_8_ = 0xc0000000c0000000;
        auVar192._8_4_ = 0x3fb8aa3b;
        auVar192._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar165._8_4_ = 0xc2b0c0a5;
        auVar165._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar135._8_4_ = 0x42b0c0a5;
        auVar135._0_8_ = 0x42b0c0a542b0c0a5;
        auVar50._8_4_ = 0x39506967;
        auVar50._0_8_ = 0x3950696739506967;
        auVar435._12_4_ = 0x395e8083;
        auVar400._12_4_ = 0x3f318000;
        auVar377._12_4_ = 0x3f800000;
        auVar318._12_4_ = 0x3f000000;
        auVar293._12_4_ = 0x3d2aa9c1;
        auVar269._12_4_ = 0x3c088908;
        auVar241._12_4_ = 0xc0000000;
        auVar192._12_4_ = 0x3fb8aa3b;
        auVar165._12_4_ = 0xc2b0c0a5;
        auVar135._12_4_ = 0x42b0c0a5;
        auVar50._12_4_ = 0x39506967;
        auVar435._16_4_ = 0x395e8083;
        auVar400._16_4_ = 0x3f318000;
        auVar377._16_4_ = 0x3f800000;
        auVar318._16_4_ = 0x3f000000;
        auVar293._16_4_ = 0x3d2aa9c1;
        auVar269._16_4_ = 0x3c088908;
        auVar241._16_4_ = 0xc0000000;
        auVar192._16_4_ = 0x3fb8aa3b;
        auVar165._16_4_ = 0xc2b0c0a5;
        auVar135._16_4_ = 0x42b0c0a5;
        auVar50._16_4_ = 0x39506967;
        auVar435._20_4_ = 0x395e8083;
        auVar400._20_4_ = 0x3f318000;
        auVar377._20_4_ = 0x3f800000;
        auVar318._20_4_ = 0x3f000000;
        auVar293._20_4_ = 0x3d2aa9c1;
        auVar269._20_4_ = 0x3c088908;
        auVar241._20_4_ = 0xc0000000;
        auVar192._20_4_ = 0x3fb8aa3b;
        auVar165._20_4_ = 0xc2b0c0a5;
        auVar135._20_4_ = 0x42b0c0a5;
        auVar50._20_4_ = 0x39506967;
        auVar435._24_4_ = 0x395e8083;
        auVar400._24_4_ = 0x3f318000;
        auVar377._24_4_ = 0x3f800000;
        auVar318._24_4_ = 0x3f000000;
        auVar293._24_4_ = 0x3d2aa9c1;
        auVar269._24_4_ = 0x3c088908;
        auVar241._24_4_ = 0xc0000000;
        auVar192._24_4_ = 0x3fb8aa3b;
        auVar165._24_4_ = 0xc2b0c0a5;
        auVar135._24_4_ = 0x42b0c0a5;
        auVar50._24_4_ = 0x39506967;
        auVar435._28_4_ = 0x395e8083;
        auVar400._28_4_ = 0x3f318000;
        auVar377._28_4_ = 0x3f800000;
        auVar318._28_4_ = 0x3f000000;
        auVar293._28_4_ = 0x3d2aa9c1;
        auVar269._28_4_ = 0x3c088908;
        auVar241._28_4_ = 0xc0000000;
        auVar192._28_4_ = 0x3fb8aa3b;
        auVar165._28_4_ = 0xc2b0c0a5;
        auVar135._28_4_ = 0x42b0c0a5;
        auVar50._28_4_ = 0x39506967;
        auVar75 = ZEXT3264(auVar50);
        pauVar23 = (undefined1 (*) [32])
                   (local_128->cstep * lVar22 * local_128->elemsize + (long)local_128->data);
        if ((int)uVar24 < 8) {
          uVar19 = 0;
        }
        else {
          iVar26 = 7;
          do {
            auVar76._0_4_ = *(float *)*pauVar23 * -2.0;
            auVar76._4_4_ = *(float *)((long)*pauVar23 + 4) * -2.0;
            auVar76._8_4_ = *(float *)((long)*pauVar23 + 8) * -2.0;
            auVar76._12_4_ = *(float *)((long)*pauVar23 + 0xc) * -2.0;
            auVar76._16_4_ = *(float *)((long)*pauVar23 + 0x10) * -2.0;
            auVar76._20_4_ = *(float *)((long)*pauVar23 + 0x14) * -2.0;
            auVar76._28_36_ = auVar75._28_36_;
            auVar76._24_4_ = *(float *)((long)*pauVar23 + 0x18) * -2.0;
            auVar140 = vminps_avx(auVar76._0_32_,auVar135);
            auVar51 = vmaxps_avx(auVar140,auVar165);
            auVar29 = vfmadd213ps_fma(auVar192,auVar51,auVar318);
            auVar197 = vroundps_avx(ZEXT1632(auVar29),1);
            auVar140 = vcmpps_avx(ZEXT1632(auVar29),auVar197,1);
            auVar140 = vandps_avx(auVar377,auVar140);
            auVar140 = vsubps_avx(auVar197,auVar140);
            auVar29 = vfmsub231ps_fma(auVar51,auVar140,auVar400);
            auVar153 = vfmsub231ps_fma(ZEXT1632(auVar29),auVar140,auVar435);
            auVar51 = ZEXT1632(auVar153);
            auVar1._28_4_ = auVar197._28_4_;
            auVar1._0_28_ =
                 ZEXT1628(CONCAT412(auVar153._12_4_ * auVar153._12_4_,
                                    CONCAT48(auVar153._8_4_ * auVar153._8_4_,
                                             CONCAT44(auVar153._4_4_ * auVar153._4_4_,
                                                      auVar153._0_4_ * auVar153._0_4_))));
            auVar450._8_4_ = 0x3ab743ce;
            auVar450._0_8_ = 0x3ab743ce3ab743ce;
            auVar450._12_4_ = 0x3ab743ce;
            auVar450._16_4_ = 0x3ab743ce;
            auVar450._20_4_ = 0x3ab743ce;
            auVar450._24_4_ = 0x3ab743ce;
            auVar450._28_4_ = 0x3ab743ce;
            auVar29 = vfmadd213ps_fma(auVar50,auVar51,auVar450);
            auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar51,auVar269);
            auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar51,auVar293);
            auVar451._8_4_ = 0x3e2aaaaa;
            auVar451._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar451._12_4_ = 0x3e2aaaaa;
            auVar451._16_4_ = 0x3e2aaaaa;
            auVar451._20_4_ = 0x3e2aaaaa;
            auVar451._24_4_ = 0x3e2aaaaa;
            auVar451._28_4_ = 0x3e2aaaaa;
            auVar51 = ZEXT1632(auVar153);
            auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar51,auVar451);
            auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar51,auVar318);
            auVar128 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar1,auVar51);
            auVar28._0_4_ = (int)auVar140._0_4_;
            auVar28._4_4_ = (int)auVar140._4_4_;
            auVar28._8_4_ = (int)auVar140._8_4_;
            auVar28._12_4_ = (int)auVar140._12_4_;
            auVar52._16_4_ = (int)auVar140._16_4_;
            auVar52._0_16_ = auVar28;
            auVar52._20_4_ = (int)auVar140._20_4_;
            auVar52._24_4_ = (int)auVar140._24_4_;
            auVar52._28_4_ = (int)auVar140._28_4_;
            auVar153 = vpslld_avx(auVar28,0x17);
            auVar29 = vpslld_avx(auVar52._16_16_,0x17);
            auVar335._8_4_ = 0x3f800000;
            auVar335._0_8_ = 0x3f8000003f800000;
            auVar335._12_4_ = 0x3f800000;
            auVar29 = vpaddd_avx(auVar335,auVar29);
            auVar153 = vpaddd_avx(auVar335,auVar153);
            auVar53._16_16_ = auVar29;
            auVar53._0_16_ = auVar153;
            auVar136._0_4_ = auVar128._0_4_ + 1.0;
            auVar136._4_4_ = auVar128._4_4_ + 1.0;
            auVar136._8_4_ = auVar128._8_4_ + 1.0;
            auVar136._12_4_ = auVar128._12_4_ + 1.0;
            auVar136._16_4_ = 0x3f800000;
            auVar136._20_4_ = 0x3f800000;
            auVar136._24_4_ = 0x3f800000;
            auVar136._28_4_ = 0x3f800000;
            auVar29 = vfmadd213ps_fma(auVar53,auVar136,auVar377);
            auVar140 = vrcpps_avx(ZEXT1632(auVar29));
            auVar29 = vfmsub213ps_fma(ZEXT1632(auVar29),auVar140,auVar377);
            auVar29 = vfnmadd132ps_fma(ZEXT1632(auVar29),auVar140,auVar140);
            auVar29 = vfnmsub213ps_fma(ZEXT1632(auVar29),auVar241,auVar377);
            auVar75 = ZEXT1664(auVar29);
            *pauVar23 = ZEXT1632(auVar29);
            pauVar23 = pauVar23 + 1;
            iVar26 = iVar26 + 8;
          } while (iVar26 < (int)uVar24);
          uVar19 = local_150._0_4_;
        }
        auVar212._8_4_ = 0x3f800000;
        auVar212._0_8_ = 0x3f8000003f800000;
        auVar212._12_4_ = 0x3f800000;
        auVar303._8_4_ = 0xc2b0c0a5;
        auVar303._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar303._12_4_ = 0xc2b0c0a5;
        auVar336._8_4_ = 0x3fb8aa3b;
        auVar336._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar336._12_4_ = 0x3fb8aa3b;
        auVar354._8_4_ = 0x3f000000;
        auVar354._0_8_ = 0x3f0000003f000000;
        auVar354._12_4_ = 0x3f000000;
        auVar390._8_4_ = 0x3f318000;
        auVar390._0_8_ = 0x3f3180003f318000;
        auVar390._12_4_ = 0x3f318000;
        auVar408._8_4_ = 0x395e8083;
        auVar408._0_8_ = 0x395e8083395e8083;
        auVar408._12_4_ = 0x395e8083;
        auVar427._8_4_ = 0x3ab743ce;
        auVar427._0_8_ = 0x3ab743ce3ab743ce;
        auVar427._12_4_ = 0x3ab743ce;
        auVar440._8_4_ = 0x39506967;
        auVar440._0_8_ = 0x3950696739506967;
        auVar440._12_4_ = 0x39506967;
        auVar457._8_4_ = 0x3c088908;
        auVar457._0_8_ = 0x3c0889083c088908;
        auVar457._12_4_ = 0x3c088908;
        auVar470._8_4_ = 0x3d2aa9c1;
        auVar470._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar470._12_4_ = 0x3d2aa9c1;
        uVar18 = uVar19 | 3;
        while ((int)uVar18 < (int)uVar24) {
          auVar30._0_4_ = *(float *)*pauVar23 * -2.0;
          auVar30._4_4_ = *(float *)((long)*pauVar23 + 4) * -2.0;
          auVar30._8_4_ = *(float *)((long)*pauVar23 + 8) * -2.0;
          auVar30._12_4_ = *(float *)((long)*pauVar23 + 0xc) * -2.0;
          auVar115._8_4_ = 0x42b0c0a5;
          auVar115._0_8_ = 0x42b0c0a542b0c0a5;
          auVar115._12_4_ = 0x42b0c0a5;
          auVar29 = vminps_avx(auVar30,auVar115);
          auVar128 = vmaxps_avx(auVar29,auVar303);
          auVar29 = vfmadd213ps_fma(auVar336,auVar128,auVar354);
          auVar144._0_4_ = (int)auVar29._0_4_;
          auVar144._4_4_ = (int)auVar29._4_4_;
          auVar144._8_4_ = (int)auVar29._8_4_;
          auVar144._12_4_ = (int)auVar29._12_4_;
          auVar153 = vcvtdq2ps_avx(auVar144);
          auVar29 = vcmpps_avx(auVar29,auVar153,1);
          auVar29 = vandps_avx(auVar29,auVar212);
          auVar29 = vsubps_avx(auVar153,auVar29);
          auVar153 = vfmsub231ps_fma(auVar128,auVar29,auVar390);
          auVar128 = vfmsub231ps_fma(auVar153,auVar29,auVar408);
          auVar145._0_4_ = auVar128._0_4_ * auVar128._0_4_;
          auVar145._4_4_ = auVar128._4_4_ * auVar128._4_4_;
          auVar145._8_4_ = auVar128._8_4_ * auVar128._8_4_;
          auVar145._12_4_ = auVar128._12_4_ * auVar128._12_4_;
          auVar153 = vfmadd213ps_fma(auVar440,auVar128,auVar427);
          auVar153 = vfmadd213ps_fma(auVar153,auVar128,auVar457);
          auVar153 = vfmadd213ps_fma(auVar153,auVar128,auVar470);
          auVar277._8_4_ = 0x3e2aaaaa;
          auVar277._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar277._12_4_ = 0x3e2aaaaa;
          auVar153 = vfmadd213ps_fma(auVar153,auVar128,auVar277);
          auVar153 = vfmadd213ps_fma(auVar153,auVar128,auVar354);
          auVar153 = vfmadd213ps_fma(auVar153,auVar145,auVar128);
          auVar31._0_4_ = auVar153._0_4_ + 1.0;
          auVar31._4_4_ = auVar153._4_4_ + 1.0;
          auVar31._8_4_ = auVar153._8_4_ + 1.0;
          auVar31._12_4_ = auVar153._12_4_ + 1.0;
          auVar116._0_4_ = (int)auVar29._0_4_;
          auVar116._4_4_ = (int)auVar29._4_4_;
          auVar116._8_4_ = (int)auVar29._8_4_;
          auVar116._12_4_ = (int)auVar29._12_4_;
          auVar29 = vpslld_avx(auVar116,0x17);
          auVar29 = vpaddd_avx(auVar29,auVar212);
          auVar153 = vfmadd213ps_fma(auVar29,auVar31,auVar212);
          auVar29 = vrcpps_avx(auVar153);
          auVar146._0_4_ = auVar29._0_4_ + auVar29._0_4_;
          auVar146._4_4_ = auVar29._4_4_ + auVar29._4_4_;
          auVar146._8_4_ = auVar29._8_4_ + auVar29._8_4_;
          auVar146._12_4_ = auVar29._12_4_ + auVar29._12_4_;
          auVar178._8_4_ = 0x40000000;
          auVar178._0_8_ = 0x4000000040000000;
          auVar178._12_4_ = 0x40000000;
          auVar153 = vfmsub213ps_fma(auVar153,auVar146,auVar178);
          auVar29 = vfnmadd213ps_fma(auVar153,auVar29,auVar146);
          *(float *)*pauVar23 = auVar29._0_4_ + -1.0;
          *(float *)((long)*pauVar23 + 4) = auVar29._4_4_ + -1.0;
          *(float *)((long)*pauVar23 + 8) = auVar29._8_4_ + -1.0;
          *(float *)((long)*pauVar23 + 0xc) = auVar29._12_4_ + -1.0;
          pauVar23 = (undefined1 (*) [32])((long)*pauVar23 + 0x10);
          uVar18 = uVar19 + 7;
          uVar19 = uVar19 + 4;
        }
        if (uVar24 - uVar19 != 0 && (int)uVar19 <= (int)uVar24) {
          lVar20 = 0;
          do {
            fVar27 = tanhf(*(float *)((long)*pauVar23 + lVar20 * 4));
            *(float *)((long)*pauVar23 + lVar20 * 4) = fVar27;
            lVar20 = lVar20 + 1;
          } while (uVar24 - uVar19 != (int)lVar20);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != local_120._0_8_);
    }
    break;
  case 0x11:
    local_138 = (long)bottom_top_blob->c;
    if (0 < local_138) {
      iVar26 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_130 = CONCAT44(local_130._4_4_,iVar26) & 0xfffffffffffffff8;
      lVar22 = 0;
      local_f0._8_8_ = 0x8000000000000000;
      local_f0._0_8_ = 0x8000000000000000;
      do {
        auVar485._8_4_ = 0xbe2aae50;
        auVar485._0_8_ = 0xbe2aae50be2aae50;
        auVar466._8_4_ = 0xbdfe5d4f;
        auVar466._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar424._8_4_ = 0x3d9021bb;
        auVar424._0_8_ = 0x3d9021bb3d9021bb;
        auVar350._8_4_ = 0x3f3504f3;
        auVar350._0_8_ = 0x3f3504f33f3504f3;
        auVar331._8_4_ = 0x3f000000;
        auVar331._0_8_ = 0x3f0000003f000000;
        auVar271._8_4_ = 0x3def251a;
        auVar271._0_8_ = 0x3def251a3def251a;
        auVar197._8_4_ = 0x807fffff;
        auVar197._0_8_ = 0x807fffff807fffff;
        auVar51._8_4_ = 0xbdebd1b8;
        auVar51._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar140._8_4_ = 0x800000;
        auVar140._0_8_ = 0x80000000800000;
        auVar485._12_4_ = 0xbe2aae50;
        auVar466._12_4_ = 0xbdfe5d4f;
        auVar424._12_4_ = 0x3d9021bb;
        auVar350._12_4_ = 0x3f3504f3;
        auVar331._12_4_ = 0x3f000000;
        auVar271._12_4_ = 0x3def251a;
        auVar197._12_4_ = 0x807fffff;
        auVar51._12_4_ = 0xbdebd1b8;
        auVar140._12_4_ = 0x800000;
        auVar485._16_4_ = 0xbe2aae50;
        auVar466._16_4_ = 0xbdfe5d4f;
        auVar424._16_4_ = 0x3d9021bb;
        auVar350._16_4_ = 0x3f3504f3;
        auVar331._16_4_ = 0x3f000000;
        auVar271._16_4_ = 0x3def251a;
        auVar197._16_4_ = 0x807fffff;
        auVar51._16_4_ = 0xbdebd1b8;
        auVar140._16_4_ = 0x800000;
        auVar485._20_4_ = 0xbe2aae50;
        auVar466._20_4_ = 0xbdfe5d4f;
        auVar424._20_4_ = 0x3d9021bb;
        auVar350._20_4_ = 0x3f3504f3;
        auVar331._20_4_ = 0x3f000000;
        auVar271._20_4_ = 0x3def251a;
        auVar197._20_4_ = 0x807fffff;
        auVar51._20_4_ = 0xbdebd1b8;
        auVar140._20_4_ = 0x800000;
        auVar485._24_4_ = 0xbe2aae50;
        auVar466._24_4_ = 0xbdfe5d4f;
        auVar424._24_4_ = 0x3d9021bb;
        auVar350._24_4_ = 0x3f3504f3;
        auVar331._24_4_ = 0x3f000000;
        auVar271._24_4_ = 0x3def251a;
        auVar197._24_4_ = 0x807fffff;
        auVar51._24_4_ = 0xbdebd1b8;
        auVar140._24_4_ = 0x800000;
        auVar485._28_4_ = 0xbe2aae50;
        auVar466._28_4_ = 0xbdfe5d4f;
        auVar424._28_4_ = 0x3d9021bb;
        auVar350._28_4_ = 0x3f3504f3;
        auVar331._28_4_ = 0x3f000000;
        auVar271._28_4_ = 0x3def251a;
        auVar197._28_4_ = 0x807fffff;
        auVar51._28_4_ = 0xbdebd1b8;
        auVar140._28_4_ = 0x800000;
        pauVar23 = (undefined1 (*) [32])
                   (local_128->cstep * lVar22 * local_128->elemsize + (long)local_128->data);
        if (iVar26 < 8) {
          uVar24 = 0;
        }
        else {
          iVar16 = 7;
          auVar29._8_4_ = 0xffffff81;
          auVar29._0_8_ = 0xffffff81ffffff81;
          auVar29._12_4_ = 0xffffff81;
          do {
            auVar66 = vmaxps_avx(auVar140,*pauVar23);
            auVar128 = vpsrld_avx(auVar66._0_16_,0x17);
            auVar153 = vpsrld_avx(auVar66._16_16_,0x17);
            auVar66 = vandps_avx(auVar66,auVar197);
            auVar167 = vorps_avx(auVar66,auVar331);
            auVar141 = vcmpps_avx(auVar350,auVar167,2);
            auVar66 = vandnps_avx(auVar141,auVar167);
            auVar65._0_4_ = auVar167._0_4_ + -1.0 + auVar66._0_4_;
            auVar65._4_4_ = auVar167._4_4_ + -1.0 + auVar66._4_4_;
            auVar65._8_4_ = auVar167._8_4_ + -1.0 + auVar66._8_4_;
            auVar65._12_4_ = auVar167._12_4_ + -1.0 + auVar66._12_4_;
            auVar65._16_4_ = auVar167._16_4_ + -1.0 + auVar66._16_4_;
            auVar65._20_4_ = auVar167._20_4_ + -1.0 + auVar66._20_4_;
            auVar65._24_4_ = auVar167._24_4_ + -1.0 + auVar66._24_4_;
            auVar65._28_4_ = auVar167._28_4_ + -1.0 + auVar66._28_4_;
            auVar153 = vpsubd_avx(auVar153,auVar141._16_16_);
            auVar153 = vpaddd_avx(auVar153,auVar29);
            auVar128 = vpsubd_avx(auVar128,auVar141._0_16_);
            auVar128 = vpaddd_avx(auVar128,auVar29);
            auVar141._16_16_ = auVar153;
            auVar141._0_16_ = auVar128;
            auVar167._0_4_ = auVar65._0_4_ * auVar65._0_4_;
            auVar167._4_4_ = auVar65._4_4_ * auVar65._4_4_;
            auVar167._8_4_ = auVar65._8_4_ * auVar65._8_4_;
            auVar167._12_4_ = auVar65._12_4_ * auVar65._12_4_;
            auVar167._16_4_ = auVar65._16_4_ * auVar65._16_4_;
            auVar167._20_4_ = auVar65._20_4_ * auVar65._20_4_;
            auVar167._24_4_ = auVar65._24_4_ * auVar65._24_4_;
            auVar167._28_4_ = 0;
            auVar153 = vfmadd213ps_fma(auVar424,auVar65,auVar51);
            auVar153 = vfmadd213ps_fma(ZEXT1632(auVar153),auVar65,auVar271);
            auVar153 = vfmadd213ps_fma(ZEXT1632(auVar153),auVar65,auVar466);
            auVar244._8_4_ = 0x3e11e9bf;
            auVar244._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar244._12_4_ = 0x3e11e9bf;
            auVar244._16_4_ = 0x3e11e9bf;
            auVar244._20_4_ = 0x3e11e9bf;
            auVar244._24_4_ = 0x3e11e9bf;
            auVar244._28_4_ = 0x3e11e9bf;
            auVar153 = vfmadd213ps_fma(ZEXT1632(auVar153),auVar65,auVar244);
            auVar153 = vfmadd213ps_fma(ZEXT1632(auVar153),auVar65,auVar485);
            auVar245._8_4_ = 0x3e4cceac;
            auVar245._0_8_ = 0x3e4cceac3e4cceac;
            auVar245._12_4_ = 0x3e4cceac;
            auVar245._16_4_ = 0x3e4cceac;
            auVar245._20_4_ = 0x3e4cceac;
            auVar245._24_4_ = 0x3e4cceac;
            auVar245._28_4_ = 0x3e4cceac;
            auVar153 = vfmadd213ps_fma(ZEXT1632(auVar153),auVar65,auVar245);
            auVar246._8_4_ = 0xbe7ffffc;
            auVar246._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar246._12_4_ = 0xbe7ffffc;
            auVar246._16_4_ = 0xbe7ffffc;
            auVar246._20_4_ = 0xbe7ffffc;
            auVar246._24_4_ = 0xbe7ffffc;
            auVar246._28_4_ = 0xbe7ffffc;
            auVar153 = vfmadd213ps_fma(ZEXT1632(auVar153),auVar65,auVar246);
            auVar247._8_4_ = 0x3eaaaaaa;
            auVar247._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar247._12_4_ = 0x3eaaaaaa;
            auVar247._16_4_ = 0x3eaaaaaa;
            auVar247._20_4_ = 0x3eaaaaaa;
            auVar247._24_4_ = 0x3eaaaaaa;
            auVar247._28_4_ = 0x3eaaaaaa;
            auVar153 = vfmadd213ps_fma(ZEXT1632(auVar153),auVar65,auVar247);
            auVar198._0_4_ = auVar167._0_4_ * auVar65._0_4_ * auVar153._0_4_;
            auVar198._4_4_ = auVar167._4_4_ * auVar65._4_4_ * auVar153._4_4_;
            auVar198._8_4_ = auVar167._8_4_ * auVar65._8_4_ * auVar153._8_4_;
            auVar198._12_4_ = auVar167._12_4_ * auVar65._12_4_ * auVar153._12_4_;
            auVar198._16_4_ = auVar167._16_4_ * auVar65._16_4_ * 0.0;
            auVar198._20_4_ = auVar167._20_4_ * auVar65._20_4_ * 0.0;
            auVar198._24_4_ = auVar167._24_4_ * auVar65._24_4_ * 0.0;
            auVar198._28_4_ = 0;
            auVar66 = vcvtdq2ps_avx(auVar141);
            auVar248._8_4_ = 0xb95e8083;
            auVar248._0_8_ = 0xb95e8083b95e8083;
            auVar248._12_4_ = 0xb95e8083;
            auVar248._16_4_ = 0xb95e8083;
            auVar248._20_4_ = 0xb95e8083;
            auVar248._24_4_ = 0xb95e8083;
            auVar248._28_4_ = 0xb95e8083;
            auVar153 = vfmadd231ps_fma(auVar198,auVar66,auVar248);
            auVar153 = vfmsub231ps_fma(ZEXT1632(auVar153),auVar331,auVar167);
            auVar141 = vsubps_avx(ZEXT1632(auVar153),auVar65);
            auVar168._8_4_ = 0x3f318000;
            auVar168._0_8_ = 0x3f3180003f318000;
            auVar168._12_4_ = 0x3f318000;
            auVar168._16_4_ = 0x3f318000;
            auVar168._20_4_ = 0x3f318000;
            auVar168._24_4_ = 0x3f318000;
            auVar168._28_4_ = 0x3f318000;
            auVar153 = vfnmadd231ps_fma(auVar141,auVar168,auVar66);
            auVar66._0_4_ = auVar153._0_4_ * -0.4342945;
            auVar66._4_4_ = auVar153._4_4_ * -0.4342945;
            auVar66._8_4_ = auVar153._8_4_ * -0.4342945;
            auVar66._12_4_ = auVar153._12_4_ * -0.4342945;
            auVar66._16_4_ = 0x80000000;
            auVar66._20_4_ = 0x80000000;
            auVar66._24_4_ = 0x80000000;
            auVar66._28_4_ = 0;
            *pauVar23 = auVar66;
            pauVar23 = pauVar23 + 1;
            iVar16 = iVar16 + 8;
          } while (iVar16 < iVar26);
          uVar24 = (uint)local_130;
        }
        auVar153._8_4_ = 0x800000;
        auVar153._0_8_ = 0x80000000800000;
        auVar153._12_4_ = 0x800000;
        auVar258._8_4_ = 0x3f000000;
        auVar258._0_8_ = 0x3f0000003f000000;
        auVar258._12_4_ = 0x3f000000;
        auVar343._8_4_ = 0xffffff82;
        auVar343._0_8_ = 0xffffff82ffffff82;
        auVar343._12_4_ = 0xffffff82;
        auVar369._8_4_ = 0x3f3504f3;
        auVar369._0_8_ = 0x3f3504f33f3504f3;
        auVar369._12_4_ = 0x3f3504f3;
        auVar417._8_4_ = 0x3f800000;
        auVar417._0_8_ = 0x3f8000003f800000;
        auVar417._12_4_ = 0x3f800000;
        auVar430._8_4_ = 0xbdebd1b8;
        auVar430._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar430._12_4_ = 0xbdebd1b8;
        auVar445._8_4_ = 0x3d9021bb;
        auVar445._0_8_ = 0x3d9021bb3d9021bb;
        auVar445._12_4_ = 0x3d9021bb;
        auVar462._8_4_ = 0x3def251a;
        auVar462._0_8_ = 0x3def251a3def251a;
        auVar462._12_4_ = 0x3def251a;
        auVar475._8_4_ = 0xbdfe5d4f;
        auVar475._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar475._12_4_ = 0xbdfe5d4f;
        auVar128._8_4_ = 0x3e11e9bf;
        auVar128._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar128._12_4_ = 0x3e11e9bf;
        uVar19 = uVar24 | 3;
        while ((int)uVar19 < iVar26) {
          auVar29 = vmaxps_avx(auVar153,*(undefined1 (*) [16])*pauVar23);
          auVar129 = vpsrld_avx(auVar29,0x17);
          auVar129 = vpaddd_avx(auVar343,auVar129);
          auVar154._8_4_ = 0x807fffff;
          auVar154._0_8_ = 0x807fffff807fffff;
          auVar154._12_4_ = 0x807fffff;
          auVar29 = vandps_avx(auVar29,auVar154);
          auVar155 = vorps_avx(auVar29,auVar258);
          auVar154 = vcvtdq2ps_avx(auVar129);
          auVar129 = vcmpps_avx(auVar155,auVar369,1);
          auVar29 = vandps_avx(auVar129,auVar155);
          auVar40._0_4_ = auVar155._0_4_ + -1.0 + auVar29._0_4_;
          auVar40._4_4_ = auVar155._4_4_ + -1.0 + auVar29._4_4_;
          auVar40._8_4_ = auVar155._8_4_ + -1.0 + auVar29._8_4_;
          auVar40._12_4_ = auVar155._12_4_ + -1.0 + auVar29._12_4_;
          auVar29 = vandps_avx(auVar417,auVar129);
          auVar29 = vsubps_avx(auVar154,auVar29);
          auVar155._0_4_ = auVar40._0_4_ * auVar40._0_4_;
          auVar155._4_4_ = auVar40._4_4_ * auVar40._4_4_;
          auVar155._8_4_ = auVar40._8_4_ * auVar40._8_4_;
          auVar155._12_4_ = auVar40._12_4_ * auVar40._12_4_;
          auVar129 = vfmadd213ps_fma(auVar445,auVar40,auVar430);
          auVar129 = vfmadd213ps_fma(auVar129,auVar40,auVar462);
          auVar129 = vfmadd213ps_fma(auVar129,auVar40,auVar475);
          auVar129 = vfmadd213ps_fma(auVar129,auVar40,auVar128);
          auVar226._8_4_ = 0xbe2aae50;
          auVar226._0_8_ = 0xbe2aae50be2aae50;
          auVar226._12_4_ = 0xbe2aae50;
          auVar129 = vfmadd213ps_fma(auVar129,auVar40,auVar226);
          auVar227._8_4_ = 0x3e4cceac;
          auVar227._0_8_ = 0x3e4cceac3e4cceac;
          auVar227._12_4_ = 0x3e4cceac;
          auVar129 = vfmadd213ps_fma(auVar129,auVar40,auVar227);
          auVar228._8_4_ = 0xbe7ffffc;
          auVar228._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar228._12_4_ = 0xbe7ffffc;
          auVar129 = vfmadd213ps_fma(auVar129,auVar40,auVar228);
          auVar229._8_4_ = 0x3eaaaaaa;
          auVar229._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar229._12_4_ = 0x3eaaaaaa;
          auVar129 = vfmadd213ps_fma(auVar129,auVar40,auVar229);
          auVar185._0_4_ = auVar155._0_4_ * auVar40._0_4_ * auVar129._0_4_;
          auVar185._4_4_ = auVar155._4_4_ * auVar40._4_4_ * auVar129._4_4_;
          auVar185._8_4_ = auVar155._8_4_ * auVar40._8_4_ * auVar129._8_4_;
          auVar185._12_4_ = auVar155._12_4_ * auVar40._12_4_ * auVar129._12_4_;
          auVar129._8_4_ = 0xb95e8083;
          auVar129._0_8_ = 0xb95e8083b95e8083;
          auVar129._12_4_ = 0xb95e8083;
          auVar129 = vfmadd231ps_fma(auVar185,auVar29,auVar129);
          auVar129 = vfmsub231ps_fma(auVar129,auVar258,auVar155);
          auVar129 = vsubps_avx(auVar129,auVar40);
          auVar156._8_4_ = 0x3f318000;
          auVar156._0_8_ = 0x3f3180003f318000;
          auVar156._12_4_ = 0x3f318000;
          auVar29 = vfnmadd231ps_fma(auVar129,auVar156,auVar29);
          *(float *)*pauVar23 = auVar29._0_4_ * -0.4342945;
          *(float *)(*pauVar23 + 4) = auVar29._4_4_ * -0.4342945;
          *(float *)(*pauVar23 + 8) = auVar29._8_4_ * -0.4342945;
          *(float *)(*pauVar23 + 0xc) = auVar29._12_4_ * -0.4342945;
          pauVar23 = (undefined1 (*) [32])(*pauVar23 + 0x10);
          uVar19 = uVar24 + 7;
          uVar24 = uVar24 + 4;
        }
        auVar29 = vpcmpeqd_avx(auVar153,auVar153);
        if ((int)uVar24 < iVar26) {
          uVar17 = CONCAT44(0,~uVar24 + iVar26);
          auVar41._8_8_ = 0;
          auVar41._0_8_ = uVar17;
          local_a0._0_16_ = vpshufd_avx(auVar41,0x44);
          local_d0 = vpor_avx(local_a0._0_16_,local_f0);
          local_e0 = vpor_avx(local_a0._0_16_,local_f0);
          uVar25 = 0;
          auVar140 = _DAT_005550e0;
          local_a0._16_16_ = local_a0._0_16_;
          do {
            auVar42._8_8_ = 0;
            auVar42._0_8_ = uVar25;
            auVar153 = vpshufd_avx(auVar42,0x44);
            auVar67._16_16_ = auVar153;
            auVar67._0_16_ = auVar153;
            auVar51 = vorps_avx(auVar67,_DAT_005550c0);
            auVar140 = vorps_avx(auVar67,auVar140);
            auVar258 = vpor_avx(local_a0._16_16_,local_f0);
            auVar153 = vpcmpgtq_avx(auVar140._16_16_ ^ local_f0,auVar258);
            auVar128 = vpcmpgtq_avx(auVar140._0_16_ ^ local_f0,local_d0);
            auVar153 = vpackssdw_avx(auVar128,auVar153);
            auVar128 = vpcmpgtq_avx(auVar51._16_16_ ^ local_f0,auVar258);
            auVar130._0_4_ = auVar51._0_4_ ^ local_f0._0_4_;
            auVar130._4_4_ = auVar51._4_4_ ^ local_f0._4_4_;
            auVar130._8_4_ = auVar51._8_4_ ^ local_f0._8_4_;
            auVar130._12_4_ = auVar51._12_4_ ^ local_f0._12_4_;
            auVar258 = vpcmpgtq_avx(auVar130,local_e0);
            auVar128 = vpackssdw_avx(auVar258,auVar128);
            auVar153 = vpackssdw_avx(auVar128 ^ auVar29,auVar153 ^ auVar29);
            auVar128 = vpmovsxwd_avx(auVar153);
            auVar153 = vpunpckhwd_avx(auVar153,auVar153);
            local_c0._16_16_ = auVar153;
            local_c0._0_16_ = auVar128;
            local_120 = vmaskmovps_avx(local_c0,*(undefined1 (*) [32])(*pauVar23 + uVar25 * 4));
            local_150 = local_120._16_16_;
            local_160._0_4_ = log10f(local_120._16_4_);
            local_160._4_4_ = extraout_XMM0_Db_05;
            local_160._8_4_ = extraout_XMM0_Dc_05;
            local_160._12_4_ = extraout_XMM0_Dd_05;
            auVar153 = vmovshdup_avx(local_150);
            auVar75._0_4_ = log10f(auVar153._0_4_);
            auVar75._4_60_ = extraout_var_17;
            local_160 = vinsertps_avx(local_160,auVar75._0_16_,0x10);
            auVar153 = vpermilpd_avx(local_150,1);
            auVar96._0_4_ = log10f(auVar153._0_4_);
            auVar96._4_60_ = extraout_var_18;
            local_160 = vinsertps_avx(local_160,auVar96._0_16_,0x20);
            auVar153 = vpermilps_avx(local_150,0xff);
            auVar97._0_4_ = log10f(auVar153._0_4_);
            auVar97._4_60_ = extraout_var_19;
            local_150 = vinsertps_avx(local_160,auVar97._0_16_,0x30);
            local_160._0_4_ = log10f((float)local_120._0_4_);
            local_160._4_4_ = extraout_XMM0_Db_06;
            local_160._8_4_ = extraout_XMM0_Dc_06;
            local_160._12_4_ = extraout_XMM0_Dd_06;
            auVar153 = vmovshdup_avx(local_120._0_16_);
            auVar98._0_4_ = log10f(auVar153._0_4_);
            auVar98._4_60_ = extraout_var_20;
            local_160 = vinsertps_avx(local_160,auVar98._0_16_,0x10);
            auVar153 = vpermilpd_avx(local_120._0_16_,1);
            auVar99._0_4_ = log10f(auVar153._0_4_);
            auVar99._4_60_ = extraout_var_21;
            local_160 = vinsertps_avx(local_160,auVar99._0_16_,0x20);
            auVar153 = vpermilps_avx(local_120._0_16_,0xff);
            auVar100._0_4_ = log10f(auVar153._0_4_);
            auVar140 = _DAT_005550e0;
            auVar100._4_60_ = extraout_var_22;
            auVar29 = vpcmpeqd_avx(auVar29,auVar29);
            auVar153 = vinsertps_avx(local_160,auVar100._0_16_,0x30);
            auVar68._16_16_ = local_150;
            auVar68._0_16_ = auVar153;
            auVar51 = vmaskmovps_avx(local_c0,auVar68);
            *(undefined1 (*) [32])(*pauVar23 + uVar25 * 4) = auVar51;
            uVar25 = uVar25 + 8;
          } while ((uVar17 + 8 & 0x1fffffff8) != uVar25);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != local_138);
    }
  }
  return 0;
}

Assistant:

int UnaryOp_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    using namespace UnaryOp_x86_fma_functor;
    if (op_type == Operation_ABS)
        return unary_op_inplace<unary_op_abs>(bottom_top_blob, opt);

    if (op_type == Operation_NEG)
        return unary_op_inplace<unary_op_neg>(bottom_top_blob, opt);

    if (op_type == Operation_FLOOR)
        return unary_op_inplace<unary_op_floor>(bottom_top_blob, opt);

    if (op_type == Operation_CEIL)
        return unary_op_inplace<unary_op_ceil>(bottom_top_blob, opt);

    if (op_type == Operation_SQUARE)
        return unary_op_inplace<unary_op_square>(bottom_top_blob, opt);

    if (op_type == Operation_SQRT)
        return unary_op_inplace<unary_op_sqrt>(bottom_top_blob, opt);

    if (op_type == Operation_RSQRT)
        return unary_op_inplace<unary_op_rsqrt>(bottom_top_blob, opt);

    if (op_type == Operation_EXP)
        return unary_op_inplace<unary_op_exp>(bottom_top_blob, opt);

    if (op_type == Operation_LOG)
        return unary_op_inplace<unary_op_log>(bottom_top_blob, opt);

    if (op_type == Operation_SIN)
        return unary_op_inplace<unary_op_sin>(bottom_top_blob, opt);

    if (op_type == Operation_COS)
        return unary_op_inplace<unary_op_cos>(bottom_top_blob, opt);

    if (op_type == Operation_TAN)
        return unary_op_inplace<unary_op_tan>(bottom_top_blob, opt);

    if (op_type == Operation_ASIN)
        return unary_op_inplace<unary_op_asin>(bottom_top_blob, opt);

    if (op_type == Operation_ACOS)
        return unary_op_inplace<unary_op_acos>(bottom_top_blob, opt);

    if (op_type == Operation_ATAN)
        return unary_op_inplace<unary_op_atan>(bottom_top_blob, opt);

    if (op_type == Operation_RECIPROCAL)
        return unary_op_inplace<unary_op_reciprocal>(bottom_top_blob, opt);

    if (op_type == Operation_TANH)
        return unary_op_inplace<unary_op_tanh>(bottom_top_blob, opt);

    if (op_type == Operation_LOG10)
        return unary_op_inplace<unary_op_log10>(bottom_top_blob, opt);

    return 0;
}